

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Primitive PVar32;
  uint uVar33;
  uint uVar34;
  undefined4 uVar35;
  __int_type_conflict _Var36;
  RTCFilterFunctionN p_Var37;
  uint uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [28];
  undefined1 auVar146 [28];
  undefined1 auVar147 [28];
  undefined1 auVar148 [28];
  undefined1 auVar149 [24];
  uint uVar150;
  uint uVar151;
  ulong uVar152;
  uint uVar153;
  ulong uVar154;
  long lVar155;
  long lVar156;
  long lVar157;
  Geometry *pGVar158;
  long lVar159;
  undefined1 auVar162 [16];
  float fVar160;
  float fVar181;
  float fVar183;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar184;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar163 [16];
  float fVar161;
  float fVar182;
  float fVar185;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  float fVar186;
  float fVar187;
  float fVar204;
  float fVar206;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar210;
  float fVar212;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar208;
  float fVar213;
  float fVar214;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar205;
  float fVar207;
  float fVar209;
  float fVar215;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar211;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar216;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar228;
  float fVar230;
  undefined1 auVar224 [32];
  float fVar234;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar227 [32];
  float fVar235;
  float fVar251;
  undefined1 auVar236 [16];
  undefined1 auVar238 [16];
  float fVar249;
  float fVar253;
  float fVar255;
  float fVar258;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar237 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar254;
  float fVar256;
  float fVar259;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar250;
  float fVar252;
  float fVar257;
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  float fVar260;
  float fVar272;
  float fVar275;
  float fVar277;
  undefined1 auVar263 [16];
  float fVar261;
  float fVar262;
  undefined1 auVar266 [16];
  float fVar273;
  undefined1 auVar265 [16];
  float fVar274;
  float fVar276;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar282;
  undefined1 auVar271 [32];
  float fVar283;
  float fVar291;
  float fVar293;
  undefined1 auVar285 [16];
  float fVar284;
  undefined1 auVar286 [16];
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar287 [32];
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar300;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar301;
  undefined1 auVar290 [32];
  float fVar302;
  undefined1 auVar303 [16];
  float fVar310;
  float fVar311;
  float fVar313;
  float fVar314;
  undefined1 auVar304 [32];
  float fVar315;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar316;
  undefined1 auVar308 [32];
  float fVar312;
  undefined1 auVar309 [64];
  undefined1 auVar318 [16];
  float fVar317;
  float fVar328;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  undefined1 auVar329 [16];
  float fVar338;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar348;
  float fVar349;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar350;
  float fVar363;
  float fVar365;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar371;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar351;
  undefined1 auVar357 [32];
  float fVar364;
  float fVar366;
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  float fVar352;
  float fVar370;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [64];
  float fVar372;
  float fVar379;
  float fVar380;
  float fVar381;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  float fVar382;
  float fVar393;
  float in_register_0000151c;
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  float fVar394;
  float fVar399;
  float fVar400;
  float fVar401;
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar409;
  float fVar412;
  float fVar414;
  float in_register_0000159c;
  undefined1 auVar406 [32];
  float fVar410;
  float fVar411;
  float fVar413;
  float fVar415;
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  float fVar416;
  float fVar417;
  float fVar421;
  float fVar422;
  float in_register_000015dc;
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [8];
  float fStack_868;
  undefined8 uStack_848;
  undefined1 local_840 [16];
  Precalculations *local_828;
  uint local_820;
  undefined4 uStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  undefined1 local_7b0 [8];
  undefined8 uStack_7a8;
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  RTCFilterFunctionNArguments local_790;
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 (*local_728) [16];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 auStack_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  LinearSpace3fa *local_570;
  Primitive *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  RTCHitN local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar264 [16];
  undefined1 auVar383 [16];
  undefined1 auVar405 [16];
  undefined1 auVar418 [16];
  
  PVar32 = prim[1];
  uVar152 = (ulong)(byte)PVar32;
  lVar155 = uVar152 * 0x25;
  auVar286 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar286 = vinsertps_avx(auVar286,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar220 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar220 = vinsertps_avx(auVar220,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar286 = vsubps_avx(auVar286,*(undefined1 (*) [16])(prim + lVar155 + 6));
  fVar235 = *(float *)(prim + lVar155 + 0x12);
  auVar188._0_4_ = fVar235 * auVar286._0_4_;
  auVar188._4_4_ = fVar235 * auVar286._4_4_;
  auVar188._8_4_ = fVar235 * auVar286._8_4_;
  auVar188._12_4_ = fVar235 * auVar286._12_4_;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 4 + 6)));
  auVar285._0_4_ = fVar235 * auVar220._0_4_;
  auVar285._4_4_ = fVar235 * auVar220._4_4_;
  auVar285._8_4_ = fVar235 * auVar220._8_4_;
  auVar285._12_4_ = fVar235 * auVar220._12_4_;
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 4 + 10)));
  auVar164._16_16_ = auVar220;
  auVar164._0_16_ = auVar286;
  auVar164 = vcvtdq2ps_avx(auVar164);
  lVar159 = uVar152 * 5;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar159 + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar159 + 10)));
  auVar224._16_16_ = auVar220;
  auVar224._0_16_ = auVar286;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 6 + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 6 + 10)));
  auVar178 = vcvtdq2ps_avx(auVar224);
  auVar239._16_16_ = auVar220;
  auVar239._0_16_ = auVar286;
  auVar345 = vcvtdq2ps_avx(auVar239);
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 0xf + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 0xf + 10)));
  auVar240._16_16_ = auVar220;
  auVar240._0_16_ = auVar286;
  auVar172 = vcvtdq2ps_avx(auVar240);
  lVar156 = (ulong)(byte)PVar32 * 0x10;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar156 + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar156 + 10)));
  auVar304._16_16_ = auVar220;
  auVar304._0_16_ = auVar286;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar156 + uVar152 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar304);
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar156 + uVar152 + 10)));
  auVar319._16_16_ = auVar220;
  auVar319._0_16_ = auVar286;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 0x1a + 6)));
  auVar41 = vcvtdq2ps_avx(auVar319);
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 0x1a + 10)));
  auVar320._16_16_ = auVar220;
  auVar320._0_16_ = auVar286;
  auVar42 = vcvtdq2ps_avx(auVar320);
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 0x1b + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 0x1b + 10)));
  auVar339._16_16_ = auVar220;
  auVar339._0_16_ = auVar286;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 0x1c + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar152 * 0x1c + 10)));
  auVar43 = vcvtdq2ps_avx(auVar339);
  auVar353._16_16_ = auVar220;
  auVar353._0_16_ = auVar286;
  auVar44 = vcvtdq2ps_avx(auVar353);
  auVar286 = vshufps_avx(auVar285,auVar285,0);
  auVar220 = vshufps_avx(auVar285,auVar285,0x55);
  auVar266 = vshufps_avx(auVar285,auVar285,0xaa);
  fVar235 = auVar266._0_4_;
  fVar250 = auVar266._4_4_;
  fVar249 = auVar266._8_4_;
  fVar252 = auVar266._12_4_;
  fVar234 = auVar220._0_4_;
  fVar257 = auVar220._4_4_;
  fVar251 = auVar220._8_4_;
  fVar211 = auVar220._12_4_;
  fVar253 = auVar286._0_4_;
  fVar255 = auVar286._4_4_;
  fVar258 = auVar286._8_4_;
  fVar260 = auVar286._12_4_;
  auVar384._0_4_ = fVar253 * auVar164._0_4_ + fVar234 * auVar178._0_4_ + fVar235 * auVar345._0_4_;
  auVar384._4_4_ = fVar255 * auVar164._4_4_ + fVar257 * auVar178._4_4_ + fVar250 * auVar345._4_4_;
  auVar384._8_4_ = fVar258 * auVar164._8_4_ + fVar251 * auVar178._8_4_ + fVar249 * auVar345._8_4_;
  auVar384._12_4_ =
       fVar260 * auVar164._12_4_ + fVar211 * auVar178._12_4_ + fVar252 * auVar345._12_4_;
  auVar384._16_4_ =
       fVar253 * auVar164._16_4_ + fVar234 * auVar178._16_4_ + fVar235 * auVar345._16_4_;
  auVar384._20_4_ =
       fVar255 * auVar164._20_4_ + fVar257 * auVar178._20_4_ + fVar250 * auVar345._20_4_;
  auVar384._24_4_ =
       fVar258 * auVar164._24_4_ + fVar251 * auVar178._24_4_ + fVar249 * auVar345._24_4_;
  auVar384._28_4_ = fVar211 + in_register_000015dc + in_register_0000151c;
  auVar373._0_4_ = fVar253 * auVar172._0_4_ + fVar234 * auVar40._0_4_ + auVar41._0_4_ * fVar235;
  auVar373._4_4_ = fVar255 * auVar172._4_4_ + fVar257 * auVar40._4_4_ + auVar41._4_4_ * fVar250;
  auVar373._8_4_ = fVar258 * auVar172._8_4_ + fVar251 * auVar40._8_4_ + auVar41._8_4_ * fVar249;
  auVar373._12_4_ = fVar260 * auVar172._12_4_ + fVar211 * auVar40._12_4_ + auVar41._12_4_ * fVar252;
  auVar373._16_4_ = fVar253 * auVar172._16_4_ + fVar234 * auVar40._16_4_ + auVar41._16_4_ * fVar235;
  auVar373._20_4_ = fVar255 * auVar172._20_4_ + fVar257 * auVar40._20_4_ + auVar41._20_4_ * fVar250;
  auVar373._24_4_ = fVar258 * auVar172._24_4_ + fVar251 * auVar40._24_4_ + auVar41._24_4_ * fVar249;
  auVar373._28_4_ = fVar211 + in_register_000015dc + in_register_0000159c;
  auVar287._0_4_ = fVar253 * auVar42._0_4_ + fVar234 * auVar43._0_4_ + auVar44._0_4_ * fVar235;
  auVar287._4_4_ = fVar255 * auVar42._4_4_ + fVar257 * auVar43._4_4_ + auVar44._4_4_ * fVar250;
  auVar287._8_4_ = fVar258 * auVar42._8_4_ + fVar251 * auVar43._8_4_ + auVar44._8_4_ * fVar249;
  auVar287._12_4_ = fVar260 * auVar42._12_4_ + fVar211 * auVar43._12_4_ + auVar44._12_4_ * fVar252;
  auVar287._16_4_ = fVar253 * auVar42._16_4_ + fVar234 * auVar43._16_4_ + auVar44._16_4_ * fVar235;
  auVar287._20_4_ = fVar255 * auVar42._20_4_ + fVar257 * auVar43._20_4_ + auVar44._20_4_ * fVar250;
  auVar287._24_4_ = fVar258 * auVar42._24_4_ + fVar251 * auVar43._24_4_ + auVar44._24_4_ * fVar249;
  auVar287._28_4_ = fVar260 + fVar211 + fVar252;
  auVar286 = vshufps_avx(auVar188,auVar188,0);
  auVar220 = vshufps_avx(auVar188,auVar188,0x55);
  auVar266 = vshufps_avx(auVar188,auVar188,0xaa);
  fVar235 = auVar266._0_4_;
  fVar250 = auVar266._4_4_;
  fVar249 = auVar266._8_4_;
  fVar252 = auVar266._12_4_;
  fVar255 = auVar220._0_4_;
  fVar258 = auVar220._4_4_;
  fVar260 = auVar220._8_4_;
  fVar272 = auVar220._12_4_;
  fVar234 = auVar178._28_4_ + auVar345._28_4_;
  fVar257 = auVar286._0_4_;
  fVar251 = auVar286._4_4_;
  fVar211 = auVar286._8_4_;
  fVar253 = auVar286._12_4_;
  auVar193._0_4_ = fVar257 * auVar164._0_4_ + fVar255 * auVar178._0_4_ + fVar235 * auVar345._0_4_;
  auVar193._4_4_ = fVar251 * auVar164._4_4_ + fVar258 * auVar178._4_4_ + fVar250 * auVar345._4_4_;
  auVar193._8_4_ = fVar211 * auVar164._8_4_ + fVar260 * auVar178._8_4_ + fVar249 * auVar345._8_4_;
  auVar193._12_4_ =
       fVar253 * auVar164._12_4_ + fVar272 * auVar178._12_4_ + fVar252 * auVar345._12_4_;
  auVar193._16_4_ =
       fVar257 * auVar164._16_4_ + fVar255 * auVar178._16_4_ + fVar235 * auVar345._16_4_;
  auVar193._20_4_ =
       fVar251 * auVar164._20_4_ + fVar258 * auVar178._20_4_ + fVar250 * auVar345._20_4_;
  auVar193._24_4_ =
       fVar211 * auVar164._24_4_ + fVar260 * auVar178._24_4_ + fVar249 * auVar345._24_4_;
  auVar193._28_4_ = auVar164._28_4_ + fVar234;
  auVar165._0_4_ = fVar257 * auVar172._0_4_ + auVar41._0_4_ * fVar235 + fVar255 * auVar40._0_4_;
  auVar165._4_4_ = fVar251 * auVar172._4_4_ + auVar41._4_4_ * fVar250 + fVar258 * auVar40._4_4_;
  auVar165._8_4_ = fVar211 * auVar172._8_4_ + auVar41._8_4_ * fVar249 + fVar260 * auVar40._8_4_;
  auVar165._12_4_ = fVar253 * auVar172._12_4_ + auVar41._12_4_ * fVar252 + fVar272 * auVar40._12_4_;
  auVar165._16_4_ = fVar257 * auVar172._16_4_ + auVar41._16_4_ * fVar235 + fVar255 * auVar40._16_4_;
  auVar165._20_4_ = fVar251 * auVar172._20_4_ + auVar41._20_4_ * fVar250 + fVar258 * auVar40._20_4_;
  auVar165._24_4_ = fVar211 * auVar172._24_4_ + auVar41._24_4_ * fVar249 + fVar260 * auVar40._24_4_;
  auVar165._28_4_ = auVar164._28_4_ + auVar41._28_4_ + auVar345._28_4_;
  auVar330._8_4_ = 0x7fffffff;
  auVar330._0_8_ = 0x7fffffff7fffffff;
  auVar330._12_4_ = 0x7fffffff;
  auVar330._16_4_ = 0x7fffffff;
  auVar330._20_4_ = 0x7fffffff;
  auVar330._24_4_ = 0x7fffffff;
  auVar330._28_4_ = 0x7fffffff;
  auVar241._8_4_ = 0x219392ef;
  auVar241._0_8_ = 0x219392ef219392ef;
  auVar241._12_4_ = 0x219392ef;
  auVar241._16_4_ = 0x219392ef;
  auVar241._20_4_ = 0x219392ef;
  auVar241._24_4_ = 0x219392ef;
  auVar241._28_4_ = 0x219392ef;
  auVar164 = vandps_avx(auVar384,auVar330);
  auVar164 = vcmpps_avx(auVar164,auVar241,1);
  auVar178 = vblendvps_avx(auVar384,auVar241,auVar164);
  auVar164 = vandps_avx(auVar373,auVar330);
  auVar164 = vcmpps_avx(auVar164,auVar241,1);
  auVar345 = vblendvps_avx(auVar373,auVar241,auVar164);
  auVar164 = vandps_avx(auVar330,auVar287);
  auVar164 = vcmpps_avx(auVar164,auVar241,1);
  auVar164 = vblendvps_avx(auVar287,auVar241,auVar164);
  auVar225._0_4_ = fVar257 * auVar42._0_4_ + fVar255 * auVar43._0_4_ + auVar44._0_4_ * fVar235;
  auVar225._4_4_ = fVar251 * auVar42._4_4_ + fVar258 * auVar43._4_4_ + auVar44._4_4_ * fVar250;
  auVar225._8_4_ = fVar211 * auVar42._8_4_ + fVar260 * auVar43._8_4_ + auVar44._8_4_ * fVar249;
  auVar225._12_4_ = fVar253 * auVar42._12_4_ + fVar272 * auVar43._12_4_ + auVar44._12_4_ * fVar252;
  auVar225._16_4_ = fVar257 * auVar42._16_4_ + fVar255 * auVar43._16_4_ + auVar44._16_4_ * fVar235;
  auVar225._20_4_ = fVar251 * auVar42._20_4_ + fVar258 * auVar43._20_4_ + auVar44._20_4_ * fVar250;
  auVar225._24_4_ = fVar211 * auVar42._24_4_ + fVar260 * auVar43._24_4_ + auVar44._24_4_ * fVar249;
  auVar225._28_4_ = fVar234 + auVar40._28_4_ + fVar252;
  auVar172 = vrcpps_avx(auVar178);
  fVar235 = auVar172._0_4_;
  fVar249 = auVar172._4_4_;
  auVar40._4_4_ = auVar178._4_4_ * fVar249;
  auVar40._0_4_ = auVar178._0_4_ * fVar235;
  fVar234 = auVar172._8_4_;
  auVar40._8_4_ = auVar178._8_4_ * fVar234;
  fVar251 = auVar172._12_4_;
  auVar40._12_4_ = auVar178._12_4_ * fVar251;
  fVar253 = auVar172._16_4_;
  auVar40._16_4_ = auVar178._16_4_ * fVar253;
  fVar255 = auVar172._20_4_;
  auVar40._20_4_ = auVar178._20_4_ * fVar255;
  fVar258 = auVar172._24_4_;
  auVar40._24_4_ = auVar178._24_4_ * fVar258;
  auVar40._28_4_ = auVar178._28_4_;
  auVar331._8_4_ = 0x3f800000;
  auVar331._0_8_ = 0x3f8000003f800000;
  auVar331._12_4_ = 0x3f800000;
  auVar331._16_4_ = 0x3f800000;
  auVar331._20_4_ = 0x3f800000;
  auVar331._24_4_ = 0x3f800000;
  auVar331._28_4_ = 0x3f800000;
  auVar41 = vsubps_avx(auVar331,auVar40);
  auVar40 = vrcpps_avx(auVar345);
  fVar235 = fVar235 + fVar235 * auVar41._0_4_;
  fVar249 = fVar249 + fVar249 * auVar41._4_4_;
  fVar234 = fVar234 + fVar234 * auVar41._8_4_;
  fVar251 = fVar251 + fVar251 * auVar41._12_4_;
  fVar253 = fVar253 + fVar253 * auVar41._16_4_;
  fVar255 = fVar255 + fVar255 * auVar41._20_4_;
  fVar258 = fVar258 + fVar258 * auVar41._24_4_;
  fVar260 = auVar40._0_4_;
  fVar272 = auVar40._4_4_;
  auVar178._4_4_ = fVar272 * auVar345._4_4_;
  auVar178._0_4_ = fVar260 * auVar345._0_4_;
  fVar275 = auVar40._8_4_;
  auVar178._8_4_ = fVar275 * auVar345._8_4_;
  fVar277 = auVar40._12_4_;
  auVar178._12_4_ = fVar277 * auVar345._12_4_;
  fVar279 = auVar40._16_4_;
  auVar178._16_4_ = fVar279 * auVar345._16_4_;
  fVar280 = auVar40._20_4_;
  auVar178._20_4_ = fVar280 * auVar345._20_4_;
  fVar281 = auVar40._24_4_;
  auVar178._24_4_ = fVar281 * auVar345._24_4_;
  auVar178._28_4_ = auVar41._28_4_;
  auVar345 = vsubps_avx(auVar331,auVar178);
  fVar260 = fVar260 + fVar260 * auVar345._0_4_;
  fVar272 = fVar272 + fVar272 * auVar345._4_4_;
  fVar275 = fVar275 + fVar275 * auVar345._8_4_;
  fVar277 = fVar277 + fVar277 * auVar345._12_4_;
  fVar279 = fVar279 + fVar279 * auVar345._16_4_;
  fVar280 = fVar280 + fVar280 * auVar345._20_4_;
  fVar281 = fVar281 + fVar281 * auVar345._24_4_;
  auVar178 = vrcpps_avx(auVar164);
  fVar283 = auVar178._0_4_;
  fVar291 = auVar178._4_4_;
  auVar42._4_4_ = fVar291 * auVar164._4_4_;
  auVar42._0_4_ = fVar283 * auVar164._0_4_;
  fVar293 = auVar178._8_4_;
  auVar42._8_4_ = fVar293 * auVar164._8_4_;
  fVar295 = auVar178._12_4_;
  auVar42._12_4_ = fVar295 * auVar164._12_4_;
  fVar297 = auVar178._16_4_;
  auVar42._16_4_ = fVar297 * auVar164._16_4_;
  fVar298 = auVar178._20_4_;
  auVar42._20_4_ = fVar298 * auVar164._20_4_;
  fVar299 = auVar178._24_4_;
  auVar42._24_4_ = fVar299 * auVar164._24_4_;
  auVar42._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar331,auVar42);
  fVar283 = fVar283 + fVar283 * auVar164._0_4_;
  fVar291 = fVar291 + fVar291 * auVar164._4_4_;
  fVar293 = fVar293 + fVar293 * auVar164._8_4_;
  fVar295 = fVar295 + fVar295 * auVar164._12_4_;
  fVar297 = fVar297 + fVar297 * auVar164._16_4_;
  fVar298 = fVar298 + fVar298 * auVar164._20_4_;
  fVar299 = fVar299 + fVar299 * auVar164._24_4_;
  auVar286 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar155 + 0x16)) *
                           *(float *)(prim + lVar155 + 0x1a)));
  auVar45 = vshufps_avx(auVar286,auVar286,0);
  auVar286._8_8_ = 0;
  auVar286._0_8_ = *(ulong *)(prim + uVar152 * 7 + 6);
  auVar286 = vpmovsxwd_avx(auVar286);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar152 * 7 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar220);
  auVar321._16_16_ = auVar220;
  auVar321._0_16_ = auVar286;
  auVar164 = vcvtdq2ps_avx(auVar321);
  auVar266._8_8_ = 0;
  auVar266._0_8_ = *(ulong *)(prim + uVar152 * 0xb + 6);
  auVar286 = vpmovsxwd_avx(auVar266);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar152 * 0xb + 0xe);
  auVar220 = vpmovsxwd_avx(auVar238);
  auVar332._16_16_ = auVar220;
  auVar332._0_16_ = auVar286;
  auVar178 = vcvtdq2ps_avx(auVar332);
  auVar178 = vsubps_avx(auVar178,auVar164);
  fVar250 = auVar45._0_4_;
  fVar252 = auVar45._4_4_;
  fVar257 = auVar45._8_4_;
  fVar211 = auVar45._12_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar152 * 9 + 6);
  auVar286 = vpmovsxwd_avx(auVar45);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar152 * 9 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar13);
  auVar322._0_4_ = auVar178._0_4_ * fVar250 + auVar164._0_4_;
  auVar322._4_4_ = auVar178._4_4_ * fVar252 + auVar164._4_4_;
  auVar322._8_4_ = auVar178._8_4_ * fVar257 + auVar164._8_4_;
  auVar322._12_4_ = auVar178._12_4_ * fVar211 + auVar164._12_4_;
  auVar322._16_4_ = auVar178._16_4_ * fVar250 + auVar164._16_4_;
  auVar322._20_4_ = auVar178._20_4_ * fVar252 + auVar164._20_4_;
  auVar322._24_4_ = auVar178._24_4_ * fVar257 + auVar164._24_4_;
  auVar322._28_4_ = auVar178._28_4_ + auVar164._28_4_;
  auVar333._16_16_ = auVar220;
  auVar333._0_16_ = auVar286;
  auVar164 = vcvtdq2ps_avx(auVar333);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar152 * 0xd + 6);
  auVar286 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar152 * 0xd + 0xe);
  auVar220 = vpmovsxwd_avx(auVar15);
  auVar340._16_16_ = auVar220;
  auVar340._0_16_ = auVar286;
  auVar178 = vcvtdq2ps_avx(auVar340);
  auVar178 = vsubps_avx(auVar178,auVar164);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar152 * 0x12 + 6);
  auVar286 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar152 * 0x12 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar17);
  auVar334._0_4_ = auVar164._0_4_ + auVar178._0_4_ * fVar250;
  auVar334._4_4_ = auVar164._4_4_ + auVar178._4_4_ * fVar252;
  auVar334._8_4_ = auVar164._8_4_ + auVar178._8_4_ * fVar257;
  auVar334._12_4_ = auVar164._12_4_ + auVar178._12_4_ * fVar211;
  auVar334._16_4_ = auVar164._16_4_ + auVar178._16_4_ * fVar250;
  auVar334._20_4_ = auVar164._20_4_ + auVar178._20_4_ * fVar252;
  auVar334._24_4_ = auVar164._24_4_ + auVar178._24_4_ * fVar257;
  auVar334._28_4_ = auVar164._28_4_ + auVar178._28_4_;
  auVar341._16_16_ = auVar220;
  auVar341._0_16_ = auVar286;
  auVar164 = vcvtdq2ps_avx(auVar341);
  uVar154 = (ulong)(uint)((int)lVar159 << 2);
  lVar155 = uVar152 * 2 + uVar154;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar155 + 6);
  auVar286 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar155 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar19);
  auVar354._16_16_ = auVar220;
  auVar354._0_16_ = auVar286;
  auVar178 = vcvtdq2ps_avx(auVar354);
  auVar178 = vsubps_avx(auVar178,auVar164);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar154 + 6);
  auVar286 = vpmovsxwd_avx(auVar20);
  auVar342._0_4_ = auVar164._0_4_ + auVar178._0_4_ * fVar250;
  auVar342._4_4_ = auVar164._4_4_ + auVar178._4_4_ * fVar252;
  auVar342._8_4_ = auVar164._8_4_ + auVar178._8_4_ * fVar257;
  auVar342._12_4_ = auVar164._12_4_ + auVar178._12_4_ * fVar211;
  auVar342._16_4_ = auVar164._16_4_ + auVar178._16_4_ * fVar250;
  auVar342._20_4_ = auVar164._20_4_ + auVar178._20_4_ * fVar252;
  auVar342._24_4_ = auVar164._24_4_ + auVar178._24_4_ * fVar257;
  auVar342._28_4_ = auVar164._28_4_ + auVar178._28_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar154 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar21);
  auVar355._16_16_ = auVar220;
  auVar355._0_16_ = auVar286;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar152 * 0x18 + 6);
  auVar286 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar152 * 0x18 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar23);
  auVar164 = vcvtdq2ps_avx(auVar355);
  auVar374._16_16_ = auVar220;
  auVar374._0_16_ = auVar286;
  auVar178 = vcvtdq2ps_avx(auVar374);
  auVar178 = vsubps_avx(auVar178,auVar164);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar152 * 0x1d + 6);
  auVar286 = vpmovsxwd_avx(auVar24);
  auVar356._0_4_ = auVar164._0_4_ + auVar178._0_4_ * fVar250;
  auVar356._4_4_ = auVar164._4_4_ + auVar178._4_4_ * fVar252;
  auVar356._8_4_ = auVar164._8_4_ + auVar178._8_4_ * fVar257;
  auVar356._12_4_ = auVar164._12_4_ + auVar178._12_4_ * fVar211;
  auVar356._16_4_ = auVar164._16_4_ + auVar178._16_4_ * fVar250;
  auVar356._20_4_ = auVar164._20_4_ + auVar178._20_4_ * fVar252;
  auVar356._24_4_ = auVar164._24_4_ + auVar178._24_4_ * fVar257;
  auVar356._28_4_ = auVar164._28_4_ + auVar178._28_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar152 * 0x1d + 0xe);
  auVar220 = vpmovsxwd_avx(auVar25);
  auVar375._16_16_ = auVar220;
  auVar375._0_16_ = auVar286;
  auVar164 = vcvtdq2ps_avx(auVar375);
  lVar155 = uVar152 + (ulong)(byte)PVar32 * 0x20;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar155 + 6);
  auVar286 = vpmovsxwd_avx(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar155 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar27);
  auVar385._16_16_ = auVar220;
  auVar385._0_16_ = auVar286;
  auVar178 = vcvtdq2ps_avx(auVar385);
  auVar178 = vsubps_avx(auVar178,auVar164);
  auVar376._0_4_ = auVar164._0_4_ + auVar178._0_4_ * fVar250;
  auVar376._4_4_ = auVar164._4_4_ + auVar178._4_4_ * fVar252;
  auVar376._8_4_ = auVar164._8_4_ + auVar178._8_4_ * fVar257;
  auVar376._12_4_ = auVar164._12_4_ + auVar178._12_4_ * fVar211;
  auVar376._16_4_ = auVar164._16_4_ + auVar178._16_4_ * fVar250;
  auVar376._20_4_ = auVar164._20_4_ + auVar178._20_4_ * fVar252;
  auVar376._24_4_ = auVar164._24_4_ + auVar178._24_4_ * fVar257;
  auVar376._28_4_ = auVar164._28_4_ + auVar178._28_4_;
  lVar155 = (ulong)(byte)PVar32 * 0x20 - uVar152;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar155 + 6);
  auVar286 = vpmovsxwd_avx(auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar155 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar29);
  auVar386._16_16_ = auVar220;
  auVar386._0_16_ = auVar286;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar152 * 0x23 + 6);
  auVar286 = vpmovsxwd_avx(auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar152 * 0x23 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar31);
  auVar395._16_16_ = auVar220;
  auVar395._0_16_ = auVar286;
  auVar164 = vcvtdq2ps_avx(auVar386);
  auVar178 = vcvtdq2ps_avx(auVar395);
  auVar178 = vsubps_avx(auVar178,auVar164);
  auVar387._0_4_ = auVar164._0_4_ + auVar178._0_4_ * fVar250;
  auVar387._4_4_ = auVar164._4_4_ + auVar178._4_4_ * fVar252;
  auVar387._8_4_ = auVar164._8_4_ + auVar178._8_4_ * fVar257;
  auVar387._12_4_ = auVar164._12_4_ + auVar178._12_4_ * fVar211;
  auVar387._16_4_ = auVar164._16_4_ + auVar178._16_4_ * fVar250;
  auVar387._20_4_ = auVar164._20_4_ + auVar178._20_4_ * fVar252;
  auVar387._24_4_ = auVar164._24_4_ + auVar178._24_4_ * fVar257;
  auVar387._28_4_ = auVar164._28_4_ + fVar211;
  auVar164 = vsubps_avx(auVar322,auVar193);
  auVar303._0_4_ = fVar235 * auVar164._0_4_;
  auVar303._4_4_ = fVar249 * auVar164._4_4_;
  auVar303._8_4_ = fVar234 * auVar164._8_4_;
  auVar303._12_4_ = fVar251 * auVar164._12_4_;
  auVar43._16_4_ = fVar253 * auVar164._16_4_;
  auVar43._0_16_ = auVar303;
  auVar43._20_4_ = fVar255 * auVar164._20_4_;
  auVar43._24_4_ = fVar258 * auVar164._24_4_;
  auVar43._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar334,auVar193);
  auVar236._0_4_ = fVar235 * auVar164._0_4_;
  auVar236._4_4_ = fVar249 * auVar164._4_4_;
  auVar236._8_4_ = fVar234 * auVar164._8_4_;
  auVar236._12_4_ = fVar251 * auVar164._12_4_;
  auVar44._16_4_ = fVar253 * auVar164._16_4_;
  auVar44._0_16_ = auVar236;
  auVar44._20_4_ = fVar255 * auVar164._20_4_;
  auVar44._24_4_ = fVar258 * auVar164._24_4_;
  auVar44._28_4_ = auVar172._28_4_ + auVar41._28_4_;
  auVar164 = vsubps_avx(auVar342,auVar165);
  auVar189._0_4_ = fVar260 * auVar164._0_4_;
  auVar189._4_4_ = fVar272 * auVar164._4_4_;
  auVar189._8_4_ = fVar275 * auVar164._8_4_;
  auVar189._12_4_ = fVar277 * auVar164._12_4_;
  auVar172._16_4_ = fVar279 * auVar164._16_4_;
  auVar172._0_16_ = auVar189;
  auVar172._20_4_ = fVar280 * auVar164._20_4_;
  auVar172._24_4_ = fVar281 * auVar164._24_4_;
  auVar172._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar356,auVar165);
  auVar263._0_4_ = fVar260 * auVar164._0_4_;
  auVar263._4_4_ = fVar272 * auVar164._4_4_;
  auVar263._8_4_ = fVar275 * auVar164._8_4_;
  auVar263._12_4_ = fVar277 * auVar164._12_4_;
  auVar41._16_4_ = fVar279 * auVar164._16_4_;
  auVar41._0_16_ = auVar263;
  auVar41._20_4_ = fVar280 * auVar164._20_4_;
  auVar41._24_4_ = fVar281 * auVar164._24_4_;
  auVar41._28_4_ = auVar40._28_4_ + auVar345._28_4_;
  auVar164 = vsubps_avx(auVar376,auVar225);
  auVar162._0_4_ = fVar283 * auVar164._0_4_;
  auVar162._4_4_ = fVar291 * auVar164._4_4_;
  auVar162._8_4_ = fVar293 * auVar164._8_4_;
  auVar162._12_4_ = fVar295 * auVar164._12_4_;
  auVar345._16_4_ = fVar297 * auVar164._16_4_;
  auVar345._0_16_ = auVar162;
  auVar345._20_4_ = fVar298 * auVar164._20_4_;
  auVar345._24_4_ = fVar299 * auVar164._24_4_;
  auVar345._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar387,auVar225);
  auVar217._0_4_ = fVar283 * auVar164._0_4_;
  auVar217._4_4_ = fVar291 * auVar164._4_4_;
  auVar217._8_4_ = fVar293 * auVar164._8_4_;
  auVar217._12_4_ = fVar295 * auVar164._12_4_;
  auVar39._16_4_ = fVar297 * auVar164._16_4_;
  auVar39._0_16_ = auVar217;
  auVar39._20_4_ = fVar298 * auVar164._20_4_;
  auVar39._24_4_ = fVar299 * auVar164._24_4_;
  auVar39._28_4_ = auVar164._28_4_;
  auVar286 = vpminsd_avx(auVar43._16_16_,auVar44._16_16_);
  auVar220 = vpminsd_avx(auVar303,auVar236);
  auVar335._16_16_ = auVar286;
  auVar335._0_16_ = auVar220;
  auVar286 = vpminsd_avx(auVar172._16_16_,auVar41._16_16_);
  auVar220 = vpminsd_avx(auVar189,auVar263);
  auVar377._16_16_ = auVar286;
  auVar377._0_16_ = auVar220;
  auVar164 = vmaxps_avx(auVar335,auVar377);
  auVar286 = vpminsd_avx(auVar345._16_16_,auVar39._16_16_);
  auVar220 = vpminsd_avx(auVar162,auVar217);
  auVar396._16_16_ = auVar286;
  auVar396._0_16_ = auVar220;
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar406._4_4_ = uVar12;
  auVar406._0_4_ = uVar12;
  auVar406._8_4_ = uVar12;
  auVar406._12_4_ = uVar12;
  auVar406._16_4_ = uVar12;
  auVar406._20_4_ = uVar12;
  auVar406._24_4_ = uVar12;
  auVar406._28_4_ = uVar12;
  auVar178 = vmaxps_avx(auVar396,auVar406);
  auVar164 = vmaxps_avx(auVar164,auVar178);
  local_80._4_4_ = auVar164._4_4_ * 0.99999964;
  local_80._0_4_ = auVar164._0_4_ * 0.99999964;
  local_80._8_4_ = auVar164._8_4_ * 0.99999964;
  local_80._12_4_ = auVar164._12_4_ * 0.99999964;
  local_80._16_4_ = auVar164._16_4_ * 0.99999964;
  local_80._20_4_ = auVar164._20_4_ * 0.99999964;
  local_80._24_4_ = auVar164._24_4_ * 0.99999964;
  local_80._28_4_ = auVar164._28_4_;
  auVar286 = vpmaxsd_avx(auVar43._16_16_,auVar44._16_16_);
  auVar220 = vpmaxsd_avx(auVar303,auVar236);
  auVar242._16_16_ = auVar286;
  auVar242._0_16_ = auVar220;
  auVar286 = vpmaxsd_avx(auVar172._16_16_,auVar41._16_16_);
  auVar220 = vpmaxsd_avx(auVar189,auVar263);
  auVar194._16_16_ = auVar286;
  auVar194._0_16_ = auVar220;
  auVar164 = vminps_avx(auVar242,auVar194);
  auVar286 = vpmaxsd_avx(auVar345._16_16_,auVar39._16_16_);
  auVar220 = vpmaxsd_avx(auVar162,auVar217);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar226._4_4_ = uVar12;
  auVar226._0_4_ = uVar12;
  auVar226._8_4_ = uVar12;
  auVar226._12_4_ = uVar12;
  auVar226._16_4_ = uVar12;
  auVar226._20_4_ = uVar12;
  auVar226._24_4_ = uVar12;
  auVar226._28_4_ = uVar12;
  auVar166._16_16_ = auVar286;
  auVar166._0_16_ = auVar220;
  auVar178 = vminps_avx(auVar166,auVar226);
  auVar164 = vminps_avx(auVar164,auVar178);
  auVar46._4_4_ = auVar164._4_4_ * 1.0000004;
  auVar46._0_4_ = auVar164._0_4_ * 1.0000004;
  auVar46._8_4_ = auVar164._8_4_ * 1.0000004;
  auVar46._12_4_ = auVar164._12_4_ * 1.0000004;
  auVar46._16_4_ = auVar164._16_4_ * 1.0000004;
  auVar46._20_4_ = auVar164._20_4_ * 1.0000004;
  auVar46._24_4_ = auVar164._24_4_ * 1.0000004;
  auVar46._28_4_ = auVar164._28_4_;
  auVar164 = vcmpps_avx(local_80,auVar46,2);
  auVar286 = vpshufd_avx(ZEXT116((byte)PVar32),0);
  auVar195._16_16_ = auVar286;
  auVar195._0_16_ = auVar286;
  auVar178 = vcvtdq2ps_avx(auVar195);
  auVar178 = vcmpps_avx(_DAT_01faff40,auVar178,1);
  auVar164 = vandps_avx(auVar164,auVar178);
  uVar150 = vmovmskps_avx(auVar164);
  if (uVar150 != 0) {
    uVar150 = uVar150 & 0xff;
    local_570 = pre->ray_space + k;
    local_560 = mm_lookupmask_ps._16_8_;
    uStack_558 = mm_lookupmask_ps._24_8_;
    uStack_550 = mm_lookupmask_ps._16_8_;
    uStack_548 = mm_lookupmask_ps._24_8_;
    local_728 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_828 = pre;
    local_568 = prim;
    do {
      lVar155 = 0;
      if (uVar150 != 0) {
        for (; (uVar150 >> lVar155 & 1) == 0; lVar155 = lVar155 + 1) {
        }
      }
      uVar153 = *(uint *)(local_568 + 2);
      uVar33 = *(uint *)(local_568 + lVar155 * 4 + 6);
      pGVar158 = (context->scene->geometries).items[uVar153].ptr;
      uVar152 = (ulong)*(uint *)(*(long *)&pGVar158->field_0x58 +
                                (ulong)uVar33 *
                                pGVar158[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar235 = (pGVar158->time_range).lower;
      fVar235 = pGVar158->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar235) /
                ((pGVar158->time_range).upper - fVar235));
      auVar286 = vroundss_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),9);
      auVar286 = vminss_avx(auVar286,ZEXT416((uint)(pGVar158->fnumTimeSegments + -1.0)));
      auVar286 = vmaxss_avx(ZEXT816(0) << 0x20,auVar286);
      fVar235 = fVar235 - auVar286._0_4_;
      _Var36 = pGVar158[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar157 = (long)(int)auVar286._0_4_ * 0x38;
      lVar155 = *(long *)(_Var36 + 0x10 + lVar157);
      lVar159 = *(long *)(_Var36 + 0x38 + lVar157);
      lVar156 = *(long *)(_Var36 + 0x48 + lVar157);
      auVar286 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
      pfVar1 = (float *)(lVar159 + uVar152 * lVar156);
      fVar250 = auVar286._0_4_;
      fVar249 = auVar286._4_4_;
      fVar252 = auVar286._8_4_;
      fVar234 = auVar286._12_4_;
      pfVar2 = (float *)(lVar159 + (uVar152 + 1) * lVar156);
      pfVar3 = (float *)(lVar159 + (uVar152 + 2) * lVar156);
      pfVar4 = (float *)(lVar159 + lVar156 * (uVar152 + 3));
      lVar159 = *(long *)(_Var36 + lVar157);
      auVar286 = vshufps_avx(ZEXT416((uint)(1.0 - fVar235)),ZEXT416((uint)(1.0 - fVar235)),0);
      pfVar5 = (float *)(lVar159 + lVar155 * uVar152);
      fVar235 = auVar286._0_4_;
      fVar257 = auVar286._4_4_;
      fVar251 = auVar286._8_4_;
      fVar211 = auVar286._12_4_;
      pfVar6 = (float *)(lVar159 + lVar155 * (uVar152 + 1));
      pfVar7 = (float *)(lVar159 + lVar155 * (uVar152 + 2));
      pfVar8 = (float *)(lVar159 + lVar155 * (uVar152 + 3));
      uVar34 = (uint)pGVar158[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar155 = (long)(int)uVar34 * 0x44;
      fVar261 = fVar250 * *pfVar1 + fVar235 * *pfVar5;
      fVar273 = fVar249 * pfVar1[1] + fVar257 * pfVar5[1];
      auVar264._0_8_ = CONCAT44(fVar273,fVar261);
      auVar264._8_4_ = fVar252 * pfVar1[2] + fVar251 * pfVar5[2];
      auVar264._12_4_ = fVar234 * pfVar1[3] + fVar211 * pfVar5[3];
      fVar402 = fVar235 * *pfVar6 + fVar250 * *pfVar2;
      fVar409 = fVar257 * pfVar6[1] + fVar249 * pfVar2[1];
      auVar405._0_8_ = CONCAT44(fVar409,fVar402);
      auVar405._8_4_ = fVar251 * pfVar6[2] + fVar252 * pfVar2[2];
      auVar405._12_4_ = fVar211 * pfVar6[3] + fVar234 * pfVar2[3];
      fVar416 = fVar235 * *pfVar7 + fVar250 * *pfVar3;
      fVar421 = fVar257 * pfVar7[1] + fVar249 * pfVar3[1];
      auVar418._0_8_ = CONCAT44(fVar421,fVar416);
      auVar418._8_4_ = fVar251 * pfVar7[2] + fVar252 * pfVar3[2];
      auVar418._12_4_ = fVar211 * pfVar7[3] + fVar234 * pfVar3[3];
      fVar382 = fVar235 * *pfVar8 + fVar250 * *pfVar4;
      fVar393 = fVar257 * pfVar8[1] + fVar249 * pfVar4[1];
      auVar383._0_8_ = CONCAT44(fVar393,fVar382);
      auVar383._8_4_ = fVar251 * pfVar8[2] + fVar252 * pfVar4[2];
      auVar383._12_4_ = fVar211 * pfVar8[3] + fVar234 * pfVar4[3];
      auVar286 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar238 = vinsertps_avx(auVar286,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar266 = vsubps_avx(auVar264,auVar238);
      auVar286 = vshufps_avx(auVar266,auVar266,0);
      auVar220 = vshufps_avx(auVar266,auVar266,0x55);
      auVar266 = vshufps_avx(auVar266,auVar266,0xaa);
      fVar235 = (local_570->vx).field_0.m128[0];
      fVar250 = (local_570->vx).field_0.m128[1];
      fVar249 = (local_570->vx).field_0.m128[2];
      fVar252 = (local_570->vx).field_0.m128[3];
      fVar234 = (local_570->vy).field_0.m128[0];
      fVar257 = (local_570->vy).field_0.m128[1];
      fVar251 = (local_570->vy).field_0.m128[2];
      fVar211 = (local_570->vy).field_0.m128[3];
      fVar253 = (local_570->vz).field_0.m128[0];
      fVar255 = (local_570->vz).field_0.m128[1];
      fVar258 = (local_570->vz).field_0.m128[2];
      fVar260 = (local_570->vz).field_0.m128[3];
      auVar237._0_8_ =
           CONCAT44(auVar286._4_4_ * fVar250 + auVar220._4_4_ * fVar257 + fVar255 * auVar266._4_4_,
                    auVar286._0_4_ * fVar235 + auVar220._0_4_ * fVar234 + fVar253 * auVar266._0_4_);
      auVar237._8_4_ =
           auVar286._8_4_ * fVar249 + auVar220._8_4_ * fVar251 + fVar258 * auVar266._8_4_;
      auVar237._12_4_ =
           auVar286._12_4_ * fVar252 + auVar220._12_4_ * fVar211 + fVar260 * auVar266._12_4_;
      auVar286 = vblendps_avx(auVar237,auVar264,8);
      auVar45 = vsubps_avx(auVar405,auVar238);
      auVar220 = vshufps_avx(auVar45,auVar45,0);
      auVar266 = vshufps_avx(auVar45,auVar45,0x55);
      auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
      auVar318._0_4_ = auVar220._0_4_ * fVar235 + auVar266._0_4_ * fVar234 + fVar253 * auVar45._0_4_
      ;
      auVar318._4_4_ = auVar220._4_4_ * fVar250 + auVar266._4_4_ * fVar257 + fVar255 * auVar45._4_4_
      ;
      auVar318._8_4_ = auVar220._8_4_ * fVar249 + auVar266._8_4_ * fVar251 + fVar258 * auVar45._8_4_
      ;
      auVar318._12_4_ =
           auVar220._12_4_ * fVar252 + auVar266._12_4_ * fVar211 + fVar260 * auVar45._12_4_;
      auVar220 = vblendps_avx(auVar318,auVar405,8);
      auVar13 = vsubps_avx(auVar418,auVar238);
      auVar266 = vshufps_avx(auVar13,auVar13,0);
      auVar45 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar329._0_4_ = auVar266._0_4_ * fVar235 + auVar45._0_4_ * fVar234 + auVar13._0_4_ * fVar253;
      auVar329._4_4_ = auVar266._4_4_ * fVar250 + auVar45._4_4_ * fVar257 + auVar13._4_4_ * fVar255;
      auVar329._8_4_ = auVar266._8_4_ * fVar249 + auVar45._8_4_ * fVar251 + auVar13._8_4_ * fVar258;
      auVar329._12_4_ =
           auVar266._12_4_ * fVar252 + auVar45._12_4_ * fVar211 + auVar13._12_4_ * fVar260;
      auVar266 = vblendps_avx(auVar329,auVar418,8);
      auVar13 = vsubps_avx(auVar383,auVar238);
      auVar238 = vshufps_avx(auVar13,auVar13,0);
      auVar45 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar190._0_4_ = auVar238._0_4_ * fVar235 + auVar45._0_4_ * fVar234 + fVar253 * auVar13._0_4_;
      auVar190._4_4_ = auVar238._4_4_ * fVar250 + auVar45._4_4_ * fVar257 + fVar255 * auVar13._4_4_;
      auVar190._8_4_ = auVar238._8_4_ * fVar249 + auVar45._8_4_ * fVar251 + fVar258 * auVar13._8_4_;
      auVar190._12_4_ =
           auVar238._12_4_ * fVar252 + auVar45._12_4_ * fVar211 + fVar260 * auVar13._12_4_;
      auVar238 = vblendps_avx(auVar190,auVar383,8);
      auVar265._8_4_ = 0x7fffffff;
      auVar265._0_8_ = 0x7fffffff7fffffff;
      auVar265._12_4_ = 0x7fffffff;
      auVar286 = vandps_avx(auVar286,auVar265);
      auVar220 = vandps_avx(auVar220,auVar265);
      auVar45 = vmaxps_avx(auVar286,auVar220);
      auVar286 = vandps_avx(auVar266,auVar265);
      auVar220 = vandps_avx(auVar238,auVar265);
      auVar286 = vmaxps_avx(auVar286,auVar220);
      auVar286 = vmaxps_avx(auVar45,auVar286);
      auVar220 = vmovshdup_avx(auVar286);
      auVar220 = vmaxss_avx(auVar220,auVar286);
      auVar286 = vshufpd_avx(auVar286,auVar286,1);
      auVar286 = vmaxss_avx(auVar286,auVar220);
      fVar277 = *(float *)(bspline_basis0 + lVar155 + 0x908);
      fVar279 = *(float *)(bspline_basis0 + lVar155 + 0x90c);
      fVar280 = *(float *)(bspline_basis0 + lVar155 + 0x910);
      fVar281 = *(float *)(bspline_basis0 + lVar155 + 0x914);
      fVar283 = *(float *)(bspline_basis0 + lVar155 + 0x918);
      fVar291 = *(float *)(bspline_basis0 + lVar155 + 0x91c);
      fVar293 = *(float *)(bspline_basis0 + lVar155 + 0x920);
      auVar220 = vshufps_avx(auVar329,auVar329,0);
      register0x00001250 = auVar220;
      _local_4a0 = auVar220;
      auVar266 = vshufps_avx(auVar329,auVar329,0x55);
      register0x00001290 = auVar266;
      _local_7e0 = auVar266;
      fVar235 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar155 + 0xd8c);
      fVar250 = *(float *)(bspline_basis0 + lVar155 + 0xd90);
      fVar249 = *(float *)(bspline_basis0 + lVar155 + 0xd94);
      fVar252 = *(float *)(bspline_basis0 + lVar155 + 0xd98);
      fVar234 = *(float *)(bspline_basis0 + lVar155 + 0xd9c);
      fVar257 = *(float *)(bspline_basis0 + lVar155 + 0xda0);
      fVar251 = *(float *)(bspline_basis0 + lVar155 + 0xda4);
      auVar145 = *(undefined1 (*) [28])(bspline_basis0 + lVar155 + 0xd8c);
      auVar238 = vshufps_avx(auVar190,auVar190,0);
      register0x00001210 = auVar238;
      _local_4c0 = auVar238;
      fVar160 = auVar238._0_4_;
      fVar301 = auVar238._4_4_;
      fVar183 = auVar238._8_4_;
      fVar184 = auVar238._12_4_;
      fVar186 = auVar220._0_4_;
      fVar204 = auVar220._4_4_;
      fVar206 = auVar220._8_4_;
      fVar208 = auVar220._12_4_;
      auVar220 = vshufps_avx(auVar190,auVar190,0x55);
      register0x000014d0 = auVar220;
      _local_5c0 = auVar220;
      fVar372 = auVar220._0_4_;
      fVar379 = auVar220._4_4_;
      fVar380 = auVar220._8_4_;
      fVar381 = auVar220._12_4_;
      fVar316 = auVar266._0_4_;
      fVar228 = auVar266._4_4_;
      fVar230 = auVar266._8_4_;
      fVar232 = auVar266._12_4_;
      auVar220 = vshufps_avx(auVar418,auVar418,0xff);
      register0x00001450 = auVar220;
      _local_a0 = auVar220;
      auVar266 = vshufps_avx(auVar383,auVar383,0xff);
      register0x00001390 = auVar266;
      _local_140 = auVar266;
      fVar302 = auVar266._0_4_;
      fVar310 = auVar266._4_4_;
      fVar311 = auVar266._8_4_;
      fVar312 = auVar266._12_4_;
      fVar213 = auVar220._0_4_;
      fVar348 = auVar220._4_4_;
      fVar349 = auVar220._8_4_;
      auVar266 = vshufps_avx(auVar318,auVar318,0);
      register0x00001310 = auVar266;
      _local_640 = auVar266;
      fVar295 = *(float *)(bspline_basis0 + lVar155 + 0x484);
      fVar297 = *(float *)(bspline_basis0 + lVar155 + 0x488);
      fVar298 = *(float *)(bspline_basis0 + lVar155 + 0x48c);
      fVar299 = *(float *)(bspline_basis0 + lVar155 + 0x490);
      fVar338 = *(float *)(bspline_basis0 + lVar155 + 0x494);
      fVar254 = *(float *)(bspline_basis0 + lVar155 + 0x498);
      fVar369 = *(float *)(bspline_basis0 + lVar155 + 0x49c);
      fVar262 = auVar266._0_4_;
      fVar274 = auVar266._4_4_;
      fVar276 = auVar266._8_4_;
      fVar278 = auVar266._12_4_;
      auVar266 = vshufps_avx(auVar318,auVar318,0x55);
      register0x000015d0 = auVar266;
      _local_660 = auVar266;
      fVar417 = auVar266._0_4_;
      fVar422 = auVar266._4_4_;
      fVar317 = auVar266._8_4_;
      fVar328 = auVar266._12_4_;
      auVar266 = vshufps_avx(auVar405,auVar405,0xff);
      register0x00001590 = auVar266;
      _local_c0 = auVar266;
      fVar403 = auVar266._0_4_;
      fVar410 = auVar266._4_4_;
      fVar412 = auVar266._8_4_;
      fVar414 = auVar266._12_4_;
      auVar136._8_4_ = auVar237._8_4_;
      auVar136._0_8_ = auVar237._0_8_;
      auVar136._12_4_ = auVar237._12_4_;
      auVar266 = vshufps_avx(auVar136,auVar136,0);
      register0x00001350 = auVar266;
      _local_680 = auVar266;
      pauVar9 = (undefined1 (*) [32])(bspline_basis0 + lVar155);
      fVar211 = *(float *)*pauVar9;
      fVar253 = *(float *)(bspline_basis0 + lVar155 + 4);
      fVar255 = *(float *)(bspline_basis0 + lVar155 + 8);
      fVar258 = *(float *)(bspline_basis0 + lVar155 + 0xc);
      fVar260 = *(float *)(bspline_basis0 + lVar155 + 0x10);
      fVar272 = *(float *)(bspline_basis0 + lVar155 + 0x14);
      fVar275 = *(float *)(bspline_basis0 + lVar155 + 0x18);
      auVar146 = *(undefined1 (*) [28])*pauVar9;
      fVar284 = auVar266._0_4_;
      fVar292 = auVar266._4_4_;
      fVar294 = auVar266._8_4_;
      fVar296 = auVar266._12_4_;
      auVar323._0_4_ = fVar284 * fVar211 + fVar262 * fVar295 + fVar186 * fVar277 + fVar160 * fVar235
      ;
      auVar323._4_4_ = fVar292 * fVar253 + fVar274 * fVar297 + fVar204 * fVar279 + fVar301 * fVar250
      ;
      auVar323._8_4_ = fVar294 * fVar255 + fVar276 * fVar298 + fVar206 * fVar280 + fVar183 * fVar249
      ;
      auVar323._12_4_ =
           fVar296 * fVar258 + fVar278 * fVar299 + fVar208 * fVar281 + fVar184 * fVar252;
      auVar323._16_4_ =
           fVar284 * fVar260 + fVar262 * fVar338 + fVar186 * fVar283 + fVar160 * fVar234;
      auVar323._20_4_ =
           fVar292 * fVar272 + fVar274 * fVar254 + fVar204 * fVar291 + fVar301 * fVar257;
      auVar323._24_4_ =
           fVar294 * fVar275 + fVar276 * fVar369 + fVar206 * fVar293 + fVar183 * fVar251;
      auVar323._28_4_ = fVar296 + fVar208 + fVar184 + 0.0;
      auVar266 = vshufps_avx(auVar136,auVar136,0x55);
      register0x00001290 = auVar266;
      _local_120 = auVar266;
      fVar216 = auVar266._0_4_;
      fVar229 = auVar266._4_4_;
      fVar231 = auVar266._8_4_;
      fVar233 = auVar266._12_4_;
      auVar388._0_4_ = fVar216 * fVar211 + fVar417 * fVar295 + fVar316 * fVar277 + fVar372 * fVar235
      ;
      auVar388._4_4_ = fVar229 * fVar253 + fVar422 * fVar297 + fVar228 * fVar279 + fVar379 * fVar250
      ;
      auVar388._8_4_ = fVar231 * fVar255 + fVar317 * fVar298 + fVar230 * fVar280 + fVar380 * fVar249
      ;
      auVar388._12_4_ =
           fVar233 * fVar258 + fVar328 * fVar299 + fVar232 * fVar281 + fVar381 * fVar252;
      auVar388._16_4_ =
           fVar216 * fVar260 + fVar417 * fVar338 + fVar316 * fVar283 + fVar372 * fVar234;
      auVar388._20_4_ =
           fVar229 * fVar272 + fVar422 * fVar254 + fVar228 * fVar291 + fVar379 * fVar257;
      auVar388._24_4_ =
           fVar231 * fVar275 + fVar317 * fVar369 + fVar230 * fVar293 + fVar380 * fVar251;
      auVar388._28_4_ = fVar232 + 0.0 + 0.0 + 0.0;
      auVar266 = vpermilps_avx(auVar264,0xff);
      register0x00001490 = auVar266;
      _local_160 = auVar266;
      fVar350 = auVar266._0_4_;
      fVar363 = auVar266._4_4_;
      fVar365 = auVar266._8_4_;
      auVar167._0_4_ = fVar403 * fVar295 + fVar213 * fVar277 + fVar302 * fVar235 + fVar350 * fVar211
      ;
      auVar167._4_4_ = fVar410 * fVar297 + fVar348 * fVar279 + fVar310 * fVar250 + fVar363 * fVar253
      ;
      auVar167._8_4_ = fVar412 * fVar298 + fVar349 * fVar280 + fVar311 * fVar249 + fVar365 * fVar255
      ;
      auVar167._12_4_ =
           fVar414 * fVar299 + auVar220._12_4_ * fVar281 + fVar312 * fVar252 +
           auVar266._12_4_ * fVar258;
      auVar167._16_4_ =
           fVar403 * fVar338 + fVar213 * fVar283 + fVar302 * fVar234 + fVar350 * fVar260;
      auVar167._20_4_ =
           fVar410 * fVar254 + fVar348 * fVar291 + fVar310 * fVar257 + fVar363 * fVar272;
      auVar167._24_4_ =
           fVar412 * fVar369 + fVar349 * fVar293 + fVar311 * fVar251 + fVar365 * fVar275;
      auVar167._28_4_ = 0;
      fVar352 = *(float *)(bspline_basis1 + lVar155 + 0x908);
      fVar313 = *(float *)(bspline_basis1 + lVar155 + 0x90c);
      fVar256 = *(float *)(bspline_basis1 + lVar155 + 0x910);
      fVar371 = *(float *)(bspline_basis1 + lVar155 + 0x914);
      fVar368 = *(float *)(bspline_basis1 + lVar155 + 0x918);
      fVar370 = *(float *)(bspline_basis1 + lVar155 + 0x91c);
      fVar259 = *(float *)(bspline_basis1 + lVar155 + 0x920);
      fVar214 = *(float *)(bspline_basis1 + lVar155 + 0xd8c);
      fVar314 = *(float *)(bspline_basis1 + lVar155 + 0xd90);
      fVar181 = *(float *)(bspline_basis1 + lVar155 + 0xd94);
      fVar185 = *(float *)(bspline_basis1 + lVar155 + 0xd98);
      fVar187 = *(float *)(bspline_basis1 + lVar155 + 0xd9c);
      fVar205 = *(float *)(bspline_basis1 + lVar155 + 0xda0);
      fVar207 = *(float *)(bspline_basis1 + lVar155 + 0xda4);
      fVar209 = *(float *)(bspline_basis1 + lVar155 + 0x484);
      fVar161 = *(float *)(bspline_basis1 + lVar155 + 0x488);
      fVar182 = *(float *)(bspline_basis1 + lVar155 + 0x48c);
      fVar282 = *(float *)(bspline_basis1 + lVar155 + 0x490);
      fVar210 = *(float *)(bspline_basis1 + lVar155 + 0x494);
      fVar212 = *(float *)(bspline_basis1 + lVar155 + 0x498);
      fVar215 = *(float *)(bspline_basis1 + lVar155 + 0x49c);
      auVar164 = *(undefined1 (*) [32])(bspline_basis1 + lVar155);
      auVar309 = ZEXT3264(auVar164);
      fVar235 = auVar164._0_4_;
      fVar249 = auVar164._4_4_;
      fVar234 = auVar164._8_4_;
      fVar251 = auVar164._12_4_;
      fVar253 = auVar164._16_4_;
      fVar258 = auVar164._20_4_;
      fVar272 = auVar164._24_4_;
      auVar267._0_4_ = fVar284 * fVar235 + fVar262 * fVar209 + fVar352 * fVar186 + fVar214 * fVar160
      ;
      auVar267._4_4_ = fVar292 * fVar249 + fVar274 * fVar161 + fVar313 * fVar204 + fVar314 * fVar301
      ;
      auVar267._8_4_ = fVar294 * fVar234 + fVar276 * fVar182 + fVar256 * fVar206 + fVar181 * fVar183
      ;
      auVar267._12_4_ =
           fVar296 * fVar251 + fVar278 * fVar282 + fVar371 * fVar208 + fVar185 * fVar184;
      auVar267._16_4_ =
           fVar284 * fVar253 + fVar262 * fVar210 + fVar368 * fVar186 + fVar187 * fVar160;
      auVar267._20_4_ =
           fVar292 * fVar258 + fVar274 * fVar212 + fVar370 * fVar204 + fVar205 * fVar301;
      auVar267._24_4_ =
           fVar294 * fVar272 + fVar276 * fVar215 + fVar259 * fVar206 + fVar207 * fVar183;
      auVar267._28_4_ = fVar414 + fVar296 + 0.0 + 0.0;
      local_300._0_4_ =
           fVar216 * fVar235 + fVar417 * fVar209 + fVar352 * fVar316 + fVar372 * fVar214;
      local_300._4_4_ =
           fVar229 * fVar249 + fVar422 * fVar161 + fVar313 * fVar228 + fVar379 * fVar314;
      local_300._8_4_ =
           fVar231 * fVar234 + fVar317 * fVar182 + fVar256 * fVar230 + fVar380 * fVar181;
      local_300._12_4_ =
           fVar233 * fVar251 + fVar328 * fVar282 + fVar371 * fVar232 + fVar381 * fVar185;
      local_300._16_4_ =
           fVar216 * fVar253 + fVar417 * fVar210 + fVar368 * fVar316 + fVar372 * fVar187;
      local_300._20_4_ =
           fVar229 * fVar258 + fVar422 * fVar212 + fVar370 * fVar228 + fVar379 * fVar205;
      local_300._24_4_ =
           fVar231 * fVar272 + fVar317 * fVar215 + fVar259 * fVar230 + fVar380 * fVar207;
      local_300._28_4_ = fVar233 + fVar296 + 0.0 + 0.0;
      auVar343._0_4_ = fVar403 * fVar209 + fVar213 * fVar352 + fVar214 * fVar302 + fVar350 * fVar235
      ;
      auVar343._4_4_ = fVar410 * fVar161 + fVar348 * fVar313 + fVar314 * fVar310 + fVar363 * fVar249
      ;
      auVar343._8_4_ = fVar412 * fVar182 + fVar349 * fVar256 + fVar181 * fVar311 + fVar365 * fVar234
      ;
      auVar343._12_4_ =
           fVar414 * fVar282 + auVar220._12_4_ * fVar371 + fVar185 * fVar312 +
           auVar266._12_4_ * fVar251;
      auVar343._16_4_ =
           fVar403 * fVar210 + fVar213 * fVar368 + fVar187 * fVar302 + fVar350 * fVar253;
      auVar343._20_4_ =
           fVar410 * fVar212 + fVar348 * fVar370 + fVar205 * fVar310 + fVar363 * fVar258;
      auVar343._24_4_ =
           fVar412 * fVar215 + fVar349 * fVar259 + fVar207 * fVar311 + fVar365 * fVar272;
      auVar343._28_4_ = fVar312 + fVar296 + 0.0 + fVar233;
      local_360 = vsubps_avx(auVar267,auVar323);
      auVar172 = vsubps_avx(local_300,auVar388);
      fVar250 = local_360._0_4_;
      fVar252 = local_360._4_4_;
      auVar47._4_4_ = auVar388._4_4_ * fVar252;
      auVar47._0_4_ = auVar388._0_4_ * fVar250;
      fVar257 = local_360._8_4_;
      auVar47._8_4_ = auVar388._8_4_ * fVar257;
      fVar211 = local_360._12_4_;
      auVar47._12_4_ = auVar388._12_4_ * fVar211;
      fVar255 = local_360._16_4_;
      auVar47._16_4_ = auVar388._16_4_ * fVar255;
      fVar260 = local_360._20_4_;
      auVar47._20_4_ = auVar388._20_4_ * fVar260;
      fVar275 = local_360._24_4_;
      auVar47._24_4_ = auVar388._24_4_ * fVar275;
      auVar47._28_4_ = fVar233;
      fVar302 = auVar172._0_4_;
      fVar310 = auVar172._4_4_;
      auVar48._4_4_ = fVar310 * auVar323._4_4_;
      auVar48._0_4_ = fVar302 * auVar323._0_4_;
      fVar311 = auVar172._8_4_;
      auVar48._8_4_ = fVar311 * auVar323._8_4_;
      fVar312 = auVar172._12_4_;
      auVar48._12_4_ = fVar312 * auVar323._12_4_;
      fVar213 = auVar172._16_4_;
      auVar48._16_4_ = fVar213 * auVar323._16_4_;
      fVar348 = auVar172._20_4_;
      auVar48._20_4_ = fVar348 * auVar323._20_4_;
      fVar349 = auVar172._24_4_;
      auVar48._24_4_ = fVar349 * auVar323._24_4_;
      auVar48._28_4_ = local_300._28_4_;
      auVar345 = vsubps_avx(auVar47,auVar48);
      auVar178 = vmaxps_avx(auVar167,auVar343);
      auVar49._4_4_ = auVar178._4_4_ * auVar178._4_4_ * (fVar252 * fVar252 + fVar310 * fVar310);
      auVar49._0_4_ = auVar178._0_4_ * auVar178._0_4_ * (fVar250 * fVar250 + fVar302 * fVar302);
      auVar49._8_4_ = auVar178._8_4_ * auVar178._8_4_ * (fVar257 * fVar257 + fVar311 * fVar311);
      auVar49._12_4_ = auVar178._12_4_ * auVar178._12_4_ * (fVar211 * fVar211 + fVar312 * fVar312);
      auVar49._16_4_ = auVar178._16_4_ * auVar178._16_4_ * (fVar255 * fVar255 + fVar213 * fVar213);
      auVar49._20_4_ = auVar178._20_4_ * auVar178._20_4_ * (fVar260 * fVar260 + fVar348 * fVar348);
      auVar49._24_4_ = auVar178._24_4_ * auVar178._24_4_ * (fVar275 * fVar275 + fVar349 * fVar349);
      auVar49._28_4_ = auVar267._28_4_ + local_300._28_4_;
      auVar50._4_4_ = auVar345._4_4_ * auVar345._4_4_;
      auVar50._0_4_ = auVar345._0_4_ * auVar345._0_4_;
      auVar50._8_4_ = auVar345._8_4_ * auVar345._8_4_;
      auVar50._12_4_ = auVar345._12_4_ * auVar345._12_4_;
      auVar50._16_4_ = auVar345._16_4_ * auVar345._16_4_;
      auVar50._20_4_ = auVar345._20_4_ * auVar345._20_4_;
      auVar50._24_4_ = auVar345._24_4_ * auVar345._24_4_;
      auVar50._28_4_ = auVar345._28_4_;
      auVar178 = vcmpps_avx(auVar50,auVar49,2);
      local_540 = (float)(int)uVar34;
      fStack_53c = 0.0;
      fStack_538 = 0.0;
      fStack_534 = 0.0;
      auVar220 = vshufps_avx(ZEXT416((uint)local_540),ZEXT416((uint)local_540),0);
      auVar243._16_16_ = auVar220;
      auVar243._0_16_ = auVar220;
      auVar345 = vcmpps_avx(_DAT_01faff40,auVar243,1);
      auVar248 = ZEXT3264(auVar345);
      auVar137._8_4_ = auVar237._8_4_;
      auVar137._0_8_ = auVar237._0_8_;
      auVar137._12_4_ = auVar237._12_4_;
      auVar220 = vpermilps_avx(auVar137,0xaa);
      auVar357._16_16_ = auVar220;
      auVar357._0_16_ = auVar220;
      auVar266 = vpermilps_avx(auVar318,0xaa);
      register0x00001550 = auVar266;
      _local_2e0 = auVar266;
      auVar238 = vpermilps_avx(auVar329,0xaa);
      register0x00001590 = auVar238;
      _local_e0 = auVar238;
      auVar45 = vpermilps_avx(auVar190,0xaa);
      register0x00001310 = auVar45;
      _local_800 = auVar45;
      auVar40 = auVar345 & auVar178;
      local_820 = *(uint *)(ray + k * 4 + 0x30);
      uStack_81c = 0;
      fStack_818 = 0.0;
      fStack_814 = 0.0;
      auVar286 = ZEXT416((uint)(auVar286._0_4_ * 4.7683716e-07));
      local_700._0_16_ = auVar286;
      uStack_848 = auVar264._8_8_;
      fVar250 = fVar417;
      fVar252 = fVar422;
      fVar257 = fVar317;
      fVar211 = fVar328;
      fVar255 = fVar316;
      fVar260 = fVar228;
      fVar275 = fVar230;
      _local_7c0 = auVar383;
      _local_7b0 = auVar418;
      _local_7a0 = auVar405;
      if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar40 >> 0x7f,0) == '\0') &&
            (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar40 >> 0xbf,0) == '\0') &&
          (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar40[0x1f])
      {
        auVar326 = ZEXT3264(_local_640);
        auVar345 = local_520;
      }
      else {
        local_320 = vandps_avx(auVar178,auVar345);
        fVar351 = auVar220._0_4_;
        fVar364 = auVar220._4_4_;
        fVar366 = auVar220._8_4_;
        fVar367 = auVar220._12_4_;
        fVar394 = auVar266._0_4_;
        fVar399 = auVar266._4_4_;
        fVar400 = auVar266._8_4_;
        fVar401 = auVar266._12_4_;
        fVar404 = auVar238._0_4_;
        fVar411 = auVar238._4_4_;
        fVar413 = auVar238._8_4_;
        fVar415 = auVar238._12_4_;
        fVar302 = auVar45._0_4_;
        fVar310 = auVar45._4_4_;
        fVar311 = auVar45._8_4_;
        fVar312 = auVar45._12_4_;
        fVar213 = auVar345._28_4_ +
                  *(float *)(bspline_basis1 + lVar155 + 0x924) +
                  *(float *)(bspline_basis1 + lVar155 + 0x4a0);
        local_340._0_4_ =
             fVar351 * fVar235 + fVar394 * fVar209 + fVar404 * fVar352 + fVar214 * fVar302;
        local_340._4_4_ =
             fVar364 * fVar249 + fVar399 * fVar161 + fVar411 * fVar313 + fVar314 * fVar310;
        fStack_338 = fVar366 * fVar234 + fVar400 * fVar182 + fVar413 * fVar256 + fVar181 * fVar311;
        fStack_334 = fVar367 * fVar251 + fVar401 * fVar282 + fVar415 * fVar371 + fVar185 * fVar312;
        fStack_330 = fVar351 * fVar253 + fVar394 * fVar210 + fVar404 * fVar368 + fVar187 * fVar302;
        fStack_32c = fVar364 * fVar258 + fVar399 * fVar212 + fVar411 * fVar370 + fVar205 * fVar310;
        fStack_328 = fVar366 * fVar272 + fVar400 * fVar215 + fVar413 * fVar259 + fVar207 * fVar311;
        fStack_324 = local_320._28_4_ + fVar213;
        local_4e0._0_4_ = auVar146._0_4_;
        local_4e0._4_4_ = auVar146._4_4_;
        fStack_4d8 = auVar146._8_4_;
        fStack_4d4 = auVar146._12_4_;
        fStack_4d0 = auVar146._16_4_;
        fStack_4cc = auVar146._20_4_;
        fStack_4c8 = auVar146._24_4_;
        local_6e0._0_4_ = auVar145._0_4_;
        local_6e0._4_4_ = auVar145._4_4_;
        fStack_6d8 = auVar145._8_4_;
        fStack_6d4 = auVar145._12_4_;
        fStack_6d0 = auVar145._16_4_;
        fStack_6cc = auVar145._20_4_;
        fStack_6c8 = auVar145._24_4_;
        local_6c0 = fVar351 * (float)local_4e0._0_4_ +
                    fVar394 * fVar295 + fVar404 * fVar277 + fVar302 * (float)local_6e0._0_4_;
        fStack_6bc = fVar364 * (float)local_4e0._4_4_ +
                     fVar399 * fVar297 + fVar411 * fVar279 + fVar310 * (float)local_6e0._4_4_;
        fStack_6b8 = fVar366 * fStack_4d8 +
                     fVar400 * fVar298 + fVar413 * fVar280 + fVar311 * fStack_6d8;
        fStack_6b4 = fVar367 * fStack_4d4 +
                     fVar401 * fVar299 + fVar415 * fVar281 + fVar312 * fStack_6d4;
        fStack_6b0 = fVar351 * fStack_4d0 +
                     fVar394 * fVar338 + fVar404 * fVar283 + fVar302 * fStack_6d0;
        fStack_6ac = fVar364 * fStack_4cc +
                     fVar399 * fVar254 + fVar411 * fVar291 + fVar310 * fStack_6cc;
        fStack_6a8 = fVar366 * fStack_4c8 +
                     fVar400 * fVar369 + fVar413 * fVar293 + fVar311 * fStack_6c8;
        fStack_6a4 = fStack_324 + fVar213 + local_320._28_4_ + auVar345._28_4_;
        fVar235 = *(float *)(bspline_basis0 + lVar155 + 0x1210);
        fVar249 = *(float *)(bspline_basis0 + lVar155 + 0x1214);
        fVar234 = *(float *)(bspline_basis0 + lVar155 + 0x1218);
        fVar251 = *(float *)(bspline_basis0 + lVar155 + 0x121c);
        fVar253 = *(float *)(bspline_basis0 + lVar155 + 0x1220);
        fVar258 = *(float *)(bspline_basis0 + lVar155 + 0x1224);
        fVar272 = *(float *)(bspline_basis0 + lVar155 + 0x1228);
        fVar277 = *(float *)(bspline_basis0 + lVar155 + 0x1694);
        fVar279 = *(float *)(bspline_basis0 + lVar155 + 0x1698);
        fVar280 = *(float *)(bspline_basis0 + lVar155 + 0x169c);
        fVar281 = *(float *)(bspline_basis0 + lVar155 + 0x16a0);
        fVar283 = *(float *)(bspline_basis0 + lVar155 + 0x16a4);
        fVar291 = *(float *)(bspline_basis0 + lVar155 + 0x16a8);
        fVar293 = *(float *)(bspline_basis0 + lVar155 + 0x16ac);
        fVar295 = *(float *)(bspline_basis0 + lVar155 + 0x1b18);
        fVar297 = *(float *)(bspline_basis0 + lVar155 + 0x1b1c);
        fVar298 = *(float *)(bspline_basis0 + lVar155 + 0x1b20);
        fVar299 = *(float *)(bspline_basis0 + lVar155 + 0x1b24);
        fVar338 = *(float *)(bspline_basis0 + lVar155 + 0x1b28);
        fVar254 = *(float *)(bspline_basis0 + lVar155 + 0x1b2c);
        fVar369 = *(float *)(bspline_basis0 + lVar155 + 0x1b30);
        fVar352 = *(float *)(bspline_basis0 + lVar155 + 0x1f9c);
        fVar313 = *(float *)(bspline_basis0 + lVar155 + 0x1fa0);
        fVar256 = *(float *)(bspline_basis0 + lVar155 + 0x1fa4);
        fVar371 = *(float *)(bspline_basis0 + lVar155 + 0x1fa8);
        fVar368 = *(float *)(bspline_basis0 + lVar155 + 0x1fac);
        fVar370 = *(float *)(bspline_basis0 + lVar155 + 0x1fb0);
        fVar259 = *(float *)(bspline_basis0 + lVar155 + 0x1fb4);
        fVar300 = *(float *)(bspline_basis1 + lVar155 + 0x4a0) + 0.0;
        fVar214 = *(float *)(bspline_basis0 + lVar155 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar155 + 0x1fb8);
        fVar315 = *(float *)(bspline_basis0 + lVar155 + 0x16b0) + fVar214;
        auVar196._0_4_ =
             fVar216 * fVar235 + fVar417 * fVar277 + fVar316 * fVar295 + fVar372 * fVar352;
        auVar196._4_4_ =
             fVar229 * fVar249 + fVar422 * fVar279 + fVar228 * fVar297 + fVar379 * fVar313;
        auVar196._8_4_ =
             fVar231 * fVar234 + fVar317 * fVar280 + fVar230 * fVar298 + fVar380 * fVar256;
        auVar196._12_4_ =
             fVar233 * fVar251 + fVar328 * fVar281 + fVar232 * fVar299 + fVar381 * fVar371;
        auVar196._16_4_ =
             fVar216 * fVar253 + fVar417 * fVar283 + fVar316 * fVar338 + fVar372 * fVar368;
        auVar196._20_4_ =
             fVar229 * fVar258 + fVar422 * fVar291 + fVar228 * fVar254 + fVar379 * fVar370;
        auVar196._24_4_ =
             fVar231 * fVar272 + fVar317 * fVar293 + fVar230 * fVar369 + fVar380 * fVar259;
        auVar196._28_4_ = fVar214 + fVar300 + auVar164._28_4_ + 0.0;
        auVar288._0_4_ =
             fVar351 * fVar235 + fVar394 * fVar277 + fVar404 * fVar295 + fVar302 * fVar352;
        auVar288._4_4_ =
             fVar364 * fVar249 + fVar399 * fVar279 + fVar411 * fVar297 + fVar310 * fVar313;
        auVar288._8_4_ =
             fVar366 * fVar234 + fVar400 * fVar280 + fVar413 * fVar298 + fVar311 * fVar256;
        auVar288._12_4_ =
             fVar367 * fVar251 + fVar401 * fVar281 + fVar415 * fVar299 + fVar312 * fVar371;
        auVar288._16_4_ =
             fVar351 * fVar253 + fVar394 * fVar283 + fVar404 * fVar338 + fVar302 * fVar368;
        auVar288._20_4_ =
             fVar364 * fVar258 + fVar399 * fVar291 + fVar411 * fVar254 + fVar310 * fVar370;
        auVar288._24_4_ =
             fVar366 * fVar272 + fVar400 * fVar293 + fVar413 * fVar369 + fVar311 * fVar259;
        auVar288._28_4_ = *(float *)(bspline_basis0 + lVar155 + 0x122c) + fVar315;
        fVar214 = *(float *)(bspline_basis1 + lVar155 + 0x1b18);
        fVar314 = *(float *)(bspline_basis1 + lVar155 + 0x1b1c);
        fVar181 = *(float *)(bspline_basis1 + lVar155 + 0x1b20);
        fVar185 = *(float *)(bspline_basis1 + lVar155 + 0x1b24);
        fVar187 = *(float *)(bspline_basis1 + lVar155 + 0x1b28);
        fVar205 = *(float *)(bspline_basis1 + lVar155 + 0x1b2c);
        fVar207 = *(float *)(bspline_basis1 + lVar155 + 0x1b30);
        fVar209 = *(float *)(bspline_basis1 + lVar155 + 0x1f9c);
        fVar161 = *(float *)(bspline_basis1 + lVar155 + 0x1fa0);
        fVar182 = *(float *)(bspline_basis1 + lVar155 + 0x1fa4);
        fVar282 = *(float *)(bspline_basis1 + lVar155 + 0x1fa8);
        fVar210 = *(float *)(bspline_basis1 + lVar155 + 0x1fac);
        fVar212 = *(float *)(bspline_basis1 + lVar155 + 0x1fb0);
        fVar215 = *(float *)(bspline_basis1 + lVar155 + 0x1fb4);
        fVar213 = *(float *)(bspline_basis1 + lVar155 + 0x1694);
        fVar348 = *(float *)(bspline_basis1 + lVar155 + 0x1698);
        fVar349 = *(float *)(bspline_basis1 + lVar155 + 0x169c);
        fVar350 = *(float *)(bspline_basis1 + lVar155 + 0x16a0);
        fVar363 = *(float *)(bspline_basis1 + lVar155 + 0x16a4);
        fVar365 = *(float *)(bspline_basis1 + lVar155 + 0x16a8);
        fVar403 = *(float *)(bspline_basis1 + lVar155 + 0x16ac);
        fVar410 = *(float *)(bspline_basis1 + lVar155 + 0x1210);
        fVar412 = *(float *)(bspline_basis1 + lVar155 + 0x1214);
        fVar414 = *(float *)(bspline_basis1 + lVar155 + 0x1218);
        fVar132 = *(float *)(bspline_basis1 + lVar155 + 0x121c);
        fVar133 = *(float *)(bspline_basis1 + lVar155 + 0x1220);
        fVar134 = *(float *)(bspline_basis1 + lVar155 + 0x1224);
        fVar135 = *(float *)(bspline_basis1 + lVar155 + 0x1228);
        auVar305._0_4_ =
             fVar410 * fVar284 + fVar262 * fVar213 + fVar186 * fVar214 + fVar160 * fVar209;
        auVar305._4_4_ =
             fVar412 * fVar292 + fVar274 * fVar348 + fVar204 * fVar314 + fVar301 * fVar161;
        auVar305._8_4_ =
             fVar414 * fVar294 + fVar276 * fVar349 + fVar206 * fVar181 + fVar183 * fVar182;
        auVar305._12_4_ =
             fVar132 * fVar296 + fVar278 * fVar350 + fVar208 * fVar185 + fVar184 * fVar282;
        auVar305._16_4_ =
             fVar133 * fVar284 + fVar262 * fVar363 + fVar186 * fVar187 + fVar160 * fVar210;
        auVar305._20_4_ =
             fVar134 * fVar292 + fVar274 * fVar365 + fVar204 * fVar205 + fVar301 * fVar212;
        auVar305._24_4_ =
             fVar135 * fVar294 + fVar276 * fVar403 + fVar206 * fVar207 + fVar183 * fVar215;
        auVar305._28_4_ = fVar208 + fVar208 + fVar296 + fVar315;
        auVar344._0_4_ =
             fVar216 * fVar410 + fVar417 * fVar213 + fVar316 * fVar214 + fVar372 * fVar209;
        auVar344._4_4_ =
             fVar229 * fVar412 + fVar422 * fVar348 + fVar228 * fVar314 + fVar379 * fVar161;
        auVar344._8_4_ =
             fVar231 * fVar414 + fVar317 * fVar349 + fVar230 * fVar181 + fVar380 * fVar182;
        auVar344._12_4_ =
             fVar233 * fVar132 + fVar328 * fVar350 + fVar232 * fVar185 + fVar381 * fVar282;
        auVar344._16_4_ =
             fVar216 * fVar133 + fVar417 * fVar363 + fVar316 * fVar187 + fVar372 * fVar210;
        auVar344._20_4_ =
             fVar229 * fVar134 + fVar422 * fVar365 + fVar228 * fVar205 + fVar379 * fVar212;
        auVar344._24_4_ =
             fVar231 * fVar135 + fVar317 * fVar403 + fVar230 * fVar207 + fVar380 * fVar215;
        auVar344._28_4_ = fVar208 + fVar208 + fVar208 + fVar296;
        auVar227._0_4_ =
             fVar351 * fVar410 + fVar394 * fVar213 + fVar404 * fVar214 + fVar209 * fVar302;
        auVar227._4_4_ =
             fVar364 * fVar412 + fVar399 * fVar348 + fVar411 * fVar314 + fVar161 * fVar310;
        auVar227._8_4_ =
             fVar366 * fVar414 + fVar400 * fVar349 + fVar413 * fVar181 + fVar182 * fVar311;
        auVar227._12_4_ =
             fVar367 * fVar132 + fVar401 * fVar350 + fVar415 * fVar185 + fVar282 * fVar312;
        auVar227._16_4_ =
             fVar351 * fVar133 + fVar394 * fVar363 + fVar404 * fVar187 + fVar210 * fVar302;
        auVar227._20_4_ =
             fVar364 * fVar134 + fVar399 * fVar365 + fVar411 * fVar205 + fVar212 * fVar310;
        auVar227._24_4_ =
             fVar366 * fVar135 + fVar400 * fVar403 + fVar413 * fVar207 + fVar215 * fVar311;
        auVar227._28_4_ =
             *(float *)(bspline_basis1 + lVar155 + 0x122c) +
             *(float *)(bspline_basis1 + lVar155 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar155 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar155 + 0x1fb8);
        auVar268._8_4_ = 0x7fffffff;
        auVar268._0_8_ = 0x7fffffff7fffffff;
        auVar268._12_4_ = 0x7fffffff;
        auVar268._16_4_ = 0x7fffffff;
        auVar268._20_4_ = 0x7fffffff;
        auVar268._24_4_ = 0x7fffffff;
        auVar268._28_4_ = 0x7fffffff;
        auVar142._4_4_ =
             fVar292 * fVar249 + fVar274 * fVar279 + fVar204 * fVar297 + fVar301 * fVar313;
        auVar142._0_4_ =
             fVar284 * fVar235 + fVar262 * fVar277 + fVar186 * fVar295 + fVar160 * fVar352;
        auVar142._8_4_ =
             fVar294 * fVar234 + fVar276 * fVar280 + fVar206 * fVar298 + fVar183 * fVar256;
        auVar142._12_4_ =
             fVar296 * fVar251 + fVar278 * fVar281 + fVar208 * fVar299 + fVar184 * fVar371;
        auVar142._16_4_ =
             fVar284 * fVar253 + fVar262 * fVar283 + fVar186 * fVar338 + fVar160 * fVar368;
        auVar142._20_4_ =
             fVar292 * fVar258 + fVar274 * fVar291 + fVar204 * fVar254 + fVar301 * fVar370;
        auVar142._24_4_ =
             fVar294 * fVar272 + fVar276 * fVar293 + fVar206 * fVar369 + fVar183 * fVar259;
        auVar142._28_4_ =
             *(float *)(bspline_basis0 + lVar155 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar155 + 0x1fb8) + fVar300;
        auVar164 = vandps_avx(auVar142,auVar268);
        auVar178 = vandps_avx(auVar196,auVar268);
        auVar178 = vmaxps_avx(auVar164,auVar178);
        auVar164 = vandps_avx(auVar288,auVar268);
        auVar164 = vmaxps_avx(auVar178,auVar164);
        auVar286 = vpermilps_avx(auVar286,0);
        auVar289._16_16_ = auVar286;
        auVar289._0_16_ = auVar286;
        auVar164 = vcmpps_avx(auVar164,auVar289,1);
        auVar345 = vblendvps_avx(auVar142,local_360,auVar164);
        auVar40 = vblendvps_avx(auVar196,auVar172,auVar164);
        auVar164 = vandps_avx(auVar305,auVar268);
        auVar178 = vandps_avx(auVar344,auVar268);
        auVar41 = vmaxps_avx(auVar164,auVar178);
        auVar164 = vandps_avx(auVar227,auVar268);
        auVar164 = vmaxps_avx(auVar41,auVar164);
        auVar41 = vcmpps_avx(auVar164,auVar289,1);
        auVar164 = vblendvps_avx(auVar305,local_360,auVar41);
        auVar172 = vblendvps_avx(auVar344,auVar172,auVar41);
        fVar314 = auVar345._0_4_;
        fVar181 = auVar345._4_4_;
        fVar185 = auVar345._8_4_;
        fVar187 = auVar345._12_4_;
        fVar205 = auVar345._16_4_;
        fVar207 = auVar345._20_4_;
        fVar209 = auVar345._24_4_;
        fVar301 = -auVar345._28_4_;
        fVar161 = auVar164._0_4_;
        fVar182 = auVar164._4_4_;
        fVar282 = auVar164._8_4_;
        fVar210 = auVar164._12_4_;
        fVar212 = auVar164._16_4_;
        fVar215 = auVar164._20_4_;
        fVar160 = auVar164._24_4_;
        fVar235 = auVar40._0_4_;
        fVar253 = auVar40._4_4_;
        fVar279 = auVar40._8_4_;
        fVar291 = auVar40._12_4_;
        fVar298 = auVar40._16_4_;
        fVar369 = auVar40._20_4_;
        fVar371 = auVar40._24_4_;
        auVar168._0_4_ = fVar235 * fVar235 + fVar314 * fVar314;
        auVar168._4_4_ = fVar253 * fVar253 + fVar181 * fVar181;
        auVar168._8_4_ = fVar279 * fVar279 + fVar185 * fVar185;
        auVar168._12_4_ = fVar291 * fVar291 + fVar187 * fVar187;
        auVar168._16_4_ = fVar298 * fVar298 + fVar205 * fVar205;
        auVar168._20_4_ = fVar369 * fVar369 + fVar207 * fVar207;
        auVar168._24_4_ = fVar371 * fVar371 + fVar209 * fVar209;
        auVar168._28_4_ = auVar344._28_4_ + auVar345._28_4_;
        auVar345 = vrsqrtps_avx(auVar168);
        fVar249 = auVar345._0_4_;
        fVar234 = auVar345._4_4_;
        auVar51._4_4_ = fVar234 * 1.5;
        auVar51._0_4_ = fVar249 * 1.5;
        fVar251 = auVar345._8_4_;
        auVar51._8_4_ = fVar251 * 1.5;
        fVar258 = auVar345._12_4_;
        auVar51._12_4_ = fVar258 * 1.5;
        fVar272 = auVar345._16_4_;
        auVar51._16_4_ = fVar272 * 1.5;
        fVar277 = auVar345._20_4_;
        auVar51._20_4_ = fVar277 * 1.5;
        fVar280 = auVar345._24_4_;
        fVar214 = auVar178._28_4_;
        auVar51._24_4_ = fVar280 * 1.5;
        auVar51._28_4_ = fVar214;
        auVar52._4_4_ = fVar234 * fVar234 * fVar234 * auVar168._4_4_ * 0.5;
        auVar52._0_4_ = fVar249 * fVar249 * fVar249 * auVar168._0_4_ * 0.5;
        auVar52._8_4_ = fVar251 * fVar251 * fVar251 * auVar168._8_4_ * 0.5;
        auVar52._12_4_ = fVar258 * fVar258 * fVar258 * auVar168._12_4_ * 0.5;
        auVar52._16_4_ = fVar272 * fVar272 * fVar272 * auVar168._16_4_ * 0.5;
        auVar52._20_4_ = fVar277 * fVar277 * fVar277 * auVar168._20_4_ * 0.5;
        auVar52._24_4_ = fVar280 * fVar280 * fVar280 * auVar168._24_4_ * 0.5;
        auVar52._28_4_ = auVar168._28_4_;
        auVar178 = vsubps_avx(auVar51,auVar52);
        fVar249 = auVar178._0_4_;
        fVar258 = auVar178._4_4_;
        fVar280 = auVar178._8_4_;
        fVar293 = auVar178._12_4_;
        fVar299 = auVar178._16_4_;
        fVar352 = auVar178._20_4_;
        fVar368 = auVar178._24_4_;
        fVar234 = auVar172._0_4_;
        fVar272 = auVar172._4_4_;
        fVar281 = auVar172._8_4_;
        fVar295 = auVar172._12_4_;
        fVar338 = auVar172._16_4_;
        fVar313 = auVar172._20_4_;
        fVar370 = auVar172._24_4_;
        auVar169._0_4_ = fVar234 * fVar234 + fVar161 * fVar161;
        auVar169._4_4_ = fVar272 * fVar272 + fVar182 * fVar182;
        auVar169._8_4_ = fVar281 * fVar281 + fVar282 * fVar282;
        auVar169._12_4_ = fVar295 * fVar295 + fVar210 * fVar210;
        auVar169._16_4_ = fVar338 * fVar338 + fVar212 * fVar212;
        auVar169._20_4_ = fVar313 * fVar313 + fVar215 * fVar215;
        auVar169._24_4_ = fVar370 * fVar370 + fVar160 * fVar160;
        auVar169._28_4_ = auVar164._28_4_ + auVar178._28_4_;
        auVar164 = vrsqrtps_avx(auVar169);
        fVar251 = auVar164._0_4_;
        fVar277 = auVar164._4_4_;
        auVar53._4_4_ = fVar277 * 1.5;
        auVar53._0_4_ = fVar251 * 1.5;
        fVar283 = auVar164._8_4_;
        auVar53._8_4_ = fVar283 * 1.5;
        fVar297 = auVar164._12_4_;
        auVar53._12_4_ = fVar297 * 1.5;
        fVar254 = auVar164._16_4_;
        auVar53._16_4_ = fVar254 * 1.5;
        fVar256 = auVar164._20_4_;
        auVar53._20_4_ = fVar256 * 1.5;
        fVar259 = auVar164._24_4_;
        auVar53._24_4_ = fVar259 * 1.5;
        auVar53._28_4_ = fVar214;
        auVar54._4_4_ = fVar277 * fVar277 * fVar277 * auVar169._4_4_ * 0.5;
        auVar54._0_4_ = fVar251 * fVar251 * fVar251 * auVar169._0_4_ * 0.5;
        auVar54._8_4_ = fVar283 * fVar283 * fVar283 * auVar169._8_4_ * 0.5;
        auVar54._12_4_ = fVar297 * fVar297 * fVar297 * auVar169._12_4_ * 0.5;
        auVar54._16_4_ = fVar254 * fVar254 * fVar254 * auVar169._16_4_ * 0.5;
        auVar54._20_4_ = fVar256 * fVar256 * fVar256 * auVar169._20_4_ * 0.5;
        auVar54._24_4_ = fVar259 * fVar259 * fVar259 * auVar169._24_4_ * 0.5;
        auVar54._28_4_ = auVar169._28_4_;
        auVar164 = vsubps_avx(auVar53,auVar54);
        fVar251 = auVar164._0_4_;
        fVar277 = auVar164._4_4_;
        fVar283 = auVar164._8_4_;
        fVar297 = auVar164._12_4_;
        fVar254 = auVar164._16_4_;
        fVar256 = auVar164._20_4_;
        fVar259 = auVar164._24_4_;
        fVar235 = auVar167._0_4_ * fVar235 * fVar249;
        fVar253 = auVar167._4_4_ * fVar253 * fVar258;
        auVar55._4_4_ = fVar253;
        auVar55._0_4_ = fVar235;
        fVar279 = auVar167._8_4_ * fVar279 * fVar280;
        auVar55._8_4_ = fVar279;
        fVar291 = auVar167._12_4_ * fVar291 * fVar293;
        auVar55._12_4_ = fVar291;
        fVar298 = auVar167._16_4_ * fVar298 * fVar299;
        auVar55._16_4_ = fVar298;
        fVar369 = auVar167._20_4_ * fVar369 * fVar352;
        auVar55._20_4_ = fVar369;
        fVar371 = auVar167._24_4_ * fVar371 * fVar368;
        auVar55._24_4_ = fVar371;
        auVar55._28_4_ = fVar214;
        local_6e0._4_4_ = fVar253 + auVar323._4_4_;
        local_6e0._0_4_ = fVar235 + auVar323._0_4_;
        fStack_6d8 = fVar279 + auVar323._8_4_;
        fStack_6d4 = fVar291 + auVar323._12_4_;
        fStack_6d0 = fVar298 + auVar323._16_4_;
        fStack_6cc = fVar369 + auVar323._20_4_;
        fStack_6c8 = fVar371 + auVar323._24_4_;
        fStack_6c4 = fVar214 + auVar323._28_4_;
        local_620 = auVar167._0_4_ * fVar249 * -fVar314;
        fStack_61c = auVar167._4_4_ * fVar258 * -fVar181;
        auVar56._4_4_ = fStack_61c;
        auVar56._0_4_ = local_620;
        fStack_618 = auVar167._8_4_ * fVar280 * -fVar185;
        auVar56._8_4_ = fStack_618;
        fStack_614 = auVar167._12_4_ * fVar293 * -fVar187;
        auVar56._12_4_ = fStack_614;
        fStack_610 = auVar167._16_4_ * fVar299 * -fVar205;
        auVar56._16_4_ = fStack_610;
        fStack_60c = auVar167._20_4_ * fVar352 * -fVar207;
        auVar56._20_4_ = fStack_60c;
        fStack_608 = auVar167._24_4_ * fVar368 * -fVar209;
        auVar56._24_4_ = fStack_608;
        auVar56._28_4_ = fVar301;
        local_620 = auVar388._0_4_ + local_620;
        fStack_61c = auVar388._4_4_ + fStack_61c;
        fStack_618 = auVar388._8_4_ + fStack_618;
        fStack_614 = auVar388._12_4_ + fStack_614;
        fStack_610 = auVar388._16_4_ + fStack_610;
        fStack_60c = auVar388._20_4_ + fStack_60c;
        fStack_608 = auVar388._24_4_ + fStack_608;
        fStack_604 = auVar388._28_4_ + fVar301;
        fVar235 = fVar249 * 0.0 * auVar167._0_4_;
        fVar249 = fVar258 * 0.0 * auVar167._4_4_;
        auVar57._4_4_ = fVar249;
        auVar57._0_4_ = fVar235;
        fVar253 = fVar280 * 0.0 * auVar167._8_4_;
        auVar57._8_4_ = fVar253;
        fVar258 = fVar293 * 0.0 * auVar167._12_4_;
        auVar57._12_4_ = fVar258;
        fVar279 = fVar299 * 0.0 * auVar167._16_4_;
        auVar57._16_4_ = fVar279;
        fVar280 = fVar352 * 0.0 * auVar167._20_4_;
        auVar57._20_4_ = fVar280;
        fVar291 = fVar368 * 0.0 * auVar167._24_4_;
        auVar57._24_4_ = fVar291;
        auVar57._28_4_ = fVar401;
        auVar140._4_4_ = fStack_6bc;
        auVar140._0_4_ = local_6c0;
        auVar140._8_4_ = fStack_6b8;
        auVar140._12_4_ = fStack_6b4;
        auVar140._16_4_ = fStack_6b0;
        auVar140._20_4_ = fStack_6ac;
        auVar140._24_4_ = fStack_6a8;
        auVar140._28_4_ = fStack_6a4;
        auVar306._0_4_ = local_6c0 + fVar235;
        auVar306._4_4_ = fStack_6bc + fVar249;
        auVar306._8_4_ = fStack_6b8 + fVar253;
        auVar306._12_4_ = fStack_6b4 + fVar258;
        auVar306._16_4_ = fStack_6b0 + fVar279;
        auVar306._20_4_ = fStack_6ac + fVar280;
        auVar306._24_4_ = fStack_6a8 + fVar291;
        auVar306._28_4_ = fStack_6a4 + fVar401;
        fVar235 = auVar343._0_4_ * fVar234 * fVar251;
        fVar249 = auVar343._4_4_ * fVar272 * fVar277;
        auVar58._4_4_ = fVar249;
        auVar58._0_4_ = fVar235;
        fVar234 = auVar343._8_4_ * fVar281 * fVar283;
        auVar58._8_4_ = fVar234;
        fVar253 = auVar343._12_4_ * fVar295 * fVar297;
        auVar58._12_4_ = fVar253;
        fVar258 = auVar343._16_4_ * fVar338 * fVar254;
        auVar58._16_4_ = fVar258;
        fVar272 = auVar343._20_4_ * fVar313 * fVar256;
        auVar58._20_4_ = fVar272;
        fVar279 = auVar343._24_4_ * fVar370 * fVar259;
        auVar58._24_4_ = fVar279;
        auVar58._28_4_ = auVar172._28_4_;
        auVar42 = vsubps_avx(auVar323,auVar55);
        auVar358._0_4_ = auVar267._0_4_ + fVar235;
        auVar358._4_4_ = auVar267._4_4_ + fVar249;
        auVar358._8_4_ = auVar267._8_4_ + fVar234;
        auVar358._12_4_ = auVar267._12_4_ + fVar253;
        auVar358._16_4_ = auVar267._16_4_ + fVar258;
        auVar358._20_4_ = auVar267._20_4_ + fVar272;
        auVar358._24_4_ = auVar267._24_4_ + fVar279;
        auVar358._28_4_ = auVar267._28_4_ + auVar172._28_4_;
        fVar235 = auVar343._0_4_ * fVar251 * -fVar161;
        fVar249 = auVar343._4_4_ * fVar277 * -fVar182;
        auVar59._4_4_ = fVar249;
        auVar59._0_4_ = fVar235;
        fVar234 = auVar343._8_4_ * fVar283 * -fVar282;
        auVar59._8_4_ = fVar234;
        fVar253 = auVar343._12_4_ * fVar297 * -fVar210;
        auVar59._12_4_ = fVar253;
        fVar258 = auVar343._16_4_ * fVar254 * -fVar212;
        auVar59._16_4_ = fVar258;
        fVar272 = auVar343._20_4_ * fVar256 * -fVar215;
        auVar59._20_4_ = fVar272;
        fVar279 = auVar343._24_4_ * fVar259 * -fVar160;
        auVar59._24_4_ = fVar279;
        auVar59._28_4_ = fVar415;
        auVar43 = vsubps_avx(auVar388,auVar56);
        auVar378._0_4_ = fVar235 + local_300._0_4_;
        auVar378._4_4_ = fVar249 + local_300._4_4_;
        auVar378._8_4_ = fVar234 + local_300._8_4_;
        auVar378._12_4_ = fVar253 + local_300._12_4_;
        auVar378._16_4_ = fVar258 + local_300._16_4_;
        auVar378._20_4_ = fVar272 + local_300._20_4_;
        auVar378._24_4_ = fVar279 + local_300._24_4_;
        auVar378._28_4_ = fVar415 + local_300._28_4_;
        fVar235 = fVar251 * 0.0 * auVar343._0_4_;
        fVar249 = fVar277 * 0.0 * auVar343._4_4_;
        auVar60._4_4_ = fVar249;
        auVar60._0_4_ = fVar235;
        fVar234 = fVar283 * 0.0 * auVar343._8_4_;
        auVar60._8_4_ = fVar234;
        fVar251 = fVar297 * 0.0 * auVar343._12_4_;
        auVar60._12_4_ = fVar251;
        fVar253 = fVar254 * 0.0 * auVar343._16_4_;
        auVar60._16_4_ = fVar253;
        fVar258 = fVar256 * 0.0 * auVar343._20_4_;
        auVar60._20_4_ = fVar258;
        fVar272 = fVar259 * 0.0 * auVar343._24_4_;
        auVar60._24_4_ = fVar272;
        auVar60._28_4_ = fVar301;
        auVar44 = vsubps_avx(auVar140,auVar57);
        auVar419._0_4_ = (float)local_340._0_4_ + fVar235;
        auVar419._4_4_ = (float)local_340._4_4_ + fVar249;
        auVar419._8_4_ = fStack_338 + fVar234;
        auVar419._12_4_ = fStack_334 + fVar251;
        auVar419._16_4_ = fStack_330 + fVar253;
        auVar419._20_4_ = fStack_32c + fVar258;
        auVar419._24_4_ = fStack_328 + fVar272;
        auVar419._28_4_ = fStack_324 + fVar301;
        auVar164 = vsubps_avx(auVar267,auVar58);
        auVar178 = vsubps_avx(local_300,auVar59);
        auVar345 = vsubps_avx(_local_340,auVar60);
        auVar172 = vsubps_avx(auVar378,auVar43);
        auVar40 = vsubps_avx(auVar419,auVar44);
        auVar61._4_4_ = auVar44._4_4_ * auVar172._4_4_;
        auVar61._0_4_ = auVar44._0_4_ * auVar172._0_4_;
        auVar61._8_4_ = auVar44._8_4_ * auVar172._8_4_;
        auVar61._12_4_ = auVar44._12_4_ * auVar172._12_4_;
        auVar61._16_4_ = auVar44._16_4_ * auVar172._16_4_;
        auVar61._20_4_ = auVar44._20_4_ * auVar172._20_4_;
        auVar61._24_4_ = auVar44._24_4_ * auVar172._24_4_;
        auVar61._28_4_ = fVar415;
        auVar62._4_4_ = auVar43._4_4_ * auVar40._4_4_;
        auVar62._0_4_ = auVar43._0_4_ * auVar40._0_4_;
        auVar62._8_4_ = auVar43._8_4_ * auVar40._8_4_;
        auVar62._12_4_ = auVar43._12_4_ * auVar40._12_4_;
        auVar62._16_4_ = auVar43._16_4_ * auVar40._16_4_;
        auVar62._20_4_ = auVar43._20_4_ * auVar40._20_4_;
        auVar62._24_4_ = auVar43._24_4_ * auVar40._24_4_;
        auVar62._28_4_ = local_300._28_4_;
        auVar41 = vsubps_avx(auVar62,auVar61);
        auVar63._4_4_ = auVar42._4_4_ * auVar40._4_4_;
        auVar63._0_4_ = auVar42._0_4_ * auVar40._0_4_;
        auVar63._8_4_ = auVar42._8_4_ * auVar40._8_4_;
        auVar63._12_4_ = auVar42._12_4_ * auVar40._12_4_;
        auVar63._16_4_ = auVar42._16_4_ * auVar40._16_4_;
        auVar63._20_4_ = auVar42._20_4_ * auVar40._20_4_;
        auVar63._24_4_ = auVar42._24_4_ * auVar40._24_4_;
        auVar63._28_4_ = auVar40._28_4_;
        auVar39 = vsubps_avx(auVar358,auVar42);
        auVar64._4_4_ = auVar44._4_4_ * auVar39._4_4_;
        auVar64._0_4_ = auVar44._0_4_ * auVar39._0_4_;
        auVar64._8_4_ = auVar44._8_4_ * auVar39._8_4_;
        auVar64._12_4_ = auVar44._12_4_ * auVar39._12_4_;
        auVar64._16_4_ = auVar44._16_4_ * auVar39._16_4_;
        auVar64._20_4_ = auVar44._20_4_ * auVar39._20_4_;
        auVar64._24_4_ = auVar44._24_4_ * auVar39._24_4_;
        auVar64._28_4_ = auVar267._28_4_;
        auVar46 = vsubps_avx(auVar64,auVar63);
        auVar65._4_4_ = auVar39._4_4_ * auVar43._4_4_;
        auVar65._0_4_ = auVar39._0_4_ * auVar43._0_4_;
        auVar65._8_4_ = auVar39._8_4_ * auVar43._8_4_;
        auVar65._12_4_ = auVar39._12_4_ * auVar43._12_4_;
        auVar65._16_4_ = auVar39._16_4_ * auVar43._16_4_;
        auVar65._20_4_ = auVar39._20_4_ * auVar43._20_4_;
        auVar65._24_4_ = auVar39._24_4_ * auVar43._24_4_;
        auVar65._28_4_ = auVar40._28_4_;
        auVar66._4_4_ = auVar42._4_4_ * auVar172._4_4_;
        auVar66._0_4_ = auVar42._0_4_ * auVar172._0_4_;
        auVar66._8_4_ = auVar42._8_4_ * auVar172._8_4_;
        auVar66._12_4_ = auVar42._12_4_ * auVar172._12_4_;
        auVar66._16_4_ = auVar42._16_4_ * auVar172._16_4_;
        auVar66._20_4_ = auVar42._20_4_ * auVar172._20_4_;
        auVar66._24_4_ = auVar42._24_4_ * auVar172._24_4_;
        auVar66._28_4_ = auVar172._28_4_;
        auVar172 = vsubps_avx(auVar66,auVar65);
        auVar170._0_4_ = auVar41._0_4_ * 0.0 + auVar172._0_4_ + auVar46._0_4_ * 0.0;
        auVar170._4_4_ = auVar41._4_4_ * 0.0 + auVar172._4_4_ + auVar46._4_4_ * 0.0;
        auVar170._8_4_ = auVar41._8_4_ * 0.0 + auVar172._8_4_ + auVar46._8_4_ * 0.0;
        auVar170._12_4_ = auVar41._12_4_ * 0.0 + auVar172._12_4_ + auVar46._12_4_ * 0.0;
        auVar170._16_4_ = auVar41._16_4_ * 0.0 + auVar172._16_4_ + auVar46._16_4_ * 0.0;
        auVar170._20_4_ = auVar41._20_4_ * 0.0 + auVar172._20_4_ + auVar46._20_4_ * 0.0;
        auVar170._24_4_ = auVar41._24_4_ * 0.0 + auVar172._24_4_ + auVar46._24_4_ * 0.0;
        auVar170._28_4_ = auVar172._28_4_ + auVar172._28_4_ + auVar46._28_4_;
        auVar39 = vcmpps_avx(auVar170,ZEXT432(0) << 0x20,2);
        auVar164 = vblendvps_avx(auVar164,_local_6e0,auVar39);
        auVar143._4_4_ = fStack_61c;
        auVar143._0_4_ = local_620;
        auVar143._8_4_ = fStack_618;
        auVar143._12_4_ = fStack_614;
        auVar143._16_4_ = fStack_610;
        auVar143._20_4_ = fStack_60c;
        auVar143._24_4_ = fStack_608;
        auVar143._28_4_ = fStack_604;
        auVar178 = vblendvps_avx(auVar178,auVar143,auVar39);
        auVar345 = vblendvps_avx(auVar345,auVar306,auVar39);
        auVar309 = ZEXT3264(auVar345);
        auVar172 = vblendvps_avx(auVar42,auVar358,auVar39);
        auVar40 = vblendvps_avx(auVar43,auVar378,auVar39);
        auVar41 = vblendvps_avx(auVar44,auVar419,auVar39);
        auVar42 = vblendvps_avx(auVar358,auVar42,auVar39);
        auVar43 = vblendvps_avx(auVar378,auVar43,auVar39);
        auVar286 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
        local_5e0._16_16_ = auVar323._16_16_;
        auVar44 = vblendvps_avx(auVar419,auVar44,auVar39);
        auVar42 = vsubps_avx(auVar42,auVar164);
        auVar46 = vsubps_avx(auVar43,auVar178);
        auVar44 = vsubps_avx(auVar44,auVar345);
        auVar165 = vsubps_avx(auVar178,auVar40);
        fVar235 = auVar46._0_4_;
        fVar209 = auVar345._0_4_;
        fVar258 = auVar46._4_4_;
        fVar161 = auVar345._4_4_;
        auVar67._4_4_ = fVar161 * fVar258;
        auVar67._0_4_ = fVar209 * fVar235;
        fVar281 = auVar46._8_4_;
        fVar182 = auVar345._8_4_;
        auVar67._8_4_ = fVar182 * fVar281;
        fVar297 = auVar46._12_4_;
        fVar282 = auVar345._12_4_;
        auVar67._12_4_ = fVar282 * fVar297;
        fVar369 = auVar46._16_4_;
        fVar210 = auVar345._16_4_;
        auVar67._16_4_ = fVar210 * fVar369;
        fVar368 = auVar46._20_4_;
        fVar212 = auVar345._20_4_;
        auVar67._20_4_ = fVar212 * fVar368;
        fVar181 = auVar46._24_4_;
        fVar215 = auVar345._24_4_;
        auVar67._24_4_ = fVar215 * fVar181;
        auVar67._28_4_ = auVar43._28_4_;
        fVar249 = auVar178._0_4_;
        fVar208 = auVar44._0_4_;
        fVar272 = auVar178._4_4_;
        fVar216 = auVar44._4_4_;
        auVar68._4_4_ = fVar216 * fVar272;
        auVar68._0_4_ = fVar208 * fVar249;
        fVar283 = auVar178._8_4_;
        fVar229 = auVar44._8_4_;
        auVar68._8_4_ = fVar229 * fVar283;
        fVar298 = auVar178._12_4_;
        fVar231 = auVar44._12_4_;
        auVar68._12_4_ = fVar231 * fVar298;
        fVar352 = auVar178._16_4_;
        fVar233 = auVar44._16_4_;
        auVar68._16_4_ = fVar233 * fVar352;
        fVar370 = auVar178._20_4_;
        fVar262 = auVar44._20_4_;
        auVar68._20_4_ = fVar262 * fVar370;
        fVar185 = auVar178._24_4_;
        fVar274 = auVar44._24_4_;
        auVar68._24_4_ = fVar274 * fVar185;
        auVar68._28_4_ = auVar378._28_4_;
        auVar43 = vsubps_avx(auVar68,auVar67);
        fVar234 = auVar164._0_4_;
        fVar277 = auVar164._4_4_;
        auVar69._4_4_ = fVar216 * fVar277;
        auVar69._0_4_ = fVar208 * fVar234;
        fVar291 = auVar164._8_4_;
        auVar69._8_4_ = fVar229 * fVar291;
        fVar299 = auVar164._12_4_;
        auVar69._12_4_ = fVar231 * fVar299;
        fVar313 = auVar164._16_4_;
        auVar69._16_4_ = fVar233 * fVar313;
        fVar259 = auVar164._20_4_;
        auVar69._20_4_ = fVar262 * fVar259;
        fVar187 = auVar164._24_4_;
        auVar69._24_4_ = fVar274 * fVar187;
        auVar69._28_4_ = auVar378._28_4_;
        fVar251 = auVar42._0_4_;
        auVar407._0_4_ = fVar209 * fVar251;
        fVar279 = auVar42._4_4_;
        auVar407._4_4_ = fVar161 * fVar279;
        fVar293 = auVar42._8_4_;
        auVar407._8_4_ = fVar182 * fVar293;
        fVar338 = auVar42._12_4_;
        auVar407._12_4_ = fVar282 * fVar338;
        fVar256 = auVar42._16_4_;
        auVar407._16_4_ = fVar210 * fVar256;
        fVar214 = auVar42._20_4_;
        auVar407._20_4_ = fVar212 * fVar214;
        fVar205 = auVar42._24_4_;
        auVar407._24_4_ = fVar215 * fVar205;
        auVar407._28_4_ = 0;
        auVar166 = vsubps_avx(auVar407,auVar69);
        auVar70._4_4_ = fVar272 * fVar279;
        auVar70._0_4_ = fVar249 * fVar251;
        auVar70._8_4_ = fVar283 * fVar293;
        auVar70._12_4_ = fVar298 * fVar338;
        auVar70._16_4_ = fVar352 * fVar256;
        auVar70._20_4_ = fVar370 * fVar214;
        auVar70._24_4_ = fVar185 * fVar205;
        auVar70._28_4_ = auVar378._28_4_;
        auVar71._4_4_ = fVar277 * fVar258;
        auVar71._0_4_ = fVar234 * fVar235;
        auVar71._8_4_ = fVar291 * fVar281;
        auVar71._12_4_ = fVar299 * fVar297;
        auVar71._16_4_ = fVar313 * fVar369;
        auVar71._20_4_ = fVar259 * fVar368;
        auVar71._24_4_ = fVar187 * fVar181;
        auVar71._28_4_ = auVar419._28_4_;
        auVar193 = vsubps_avx(auVar71,auVar70);
        auVar194 = vsubps_avx(auVar345,auVar41);
        fVar253 = auVar193._28_4_ + auVar166._28_4_;
        auVar197._0_4_ = auVar193._0_4_ + auVar166._0_4_ * 0.0 + auVar43._0_4_ * 0.0;
        auVar197._4_4_ = auVar193._4_4_ + auVar166._4_4_ * 0.0 + auVar43._4_4_ * 0.0;
        auVar197._8_4_ = auVar193._8_4_ + auVar166._8_4_ * 0.0 + auVar43._8_4_ * 0.0;
        auVar197._12_4_ = auVar193._12_4_ + auVar166._12_4_ * 0.0 + auVar43._12_4_ * 0.0;
        auVar197._16_4_ = auVar193._16_4_ + auVar166._16_4_ * 0.0 + auVar43._16_4_ * 0.0;
        auVar197._20_4_ = auVar193._20_4_ + auVar166._20_4_ * 0.0 + auVar43._20_4_ * 0.0;
        auVar197._24_4_ = auVar193._24_4_ + auVar166._24_4_ * 0.0 + auVar43._24_4_ * 0.0;
        auVar197._28_4_ = fVar253 + auVar43._28_4_;
        fVar160 = auVar165._0_4_;
        fVar301 = auVar165._4_4_;
        auVar72._4_4_ = fVar301 * auVar41._4_4_;
        auVar72._0_4_ = fVar160 * auVar41._0_4_;
        fVar183 = auVar165._8_4_;
        auVar72._8_4_ = fVar183 * auVar41._8_4_;
        fVar184 = auVar165._12_4_;
        auVar72._12_4_ = fVar184 * auVar41._12_4_;
        fVar186 = auVar165._16_4_;
        auVar72._16_4_ = fVar186 * auVar41._16_4_;
        fVar204 = auVar165._20_4_;
        auVar72._20_4_ = fVar204 * auVar41._20_4_;
        fVar206 = auVar165._24_4_;
        auVar72._24_4_ = fVar206 * auVar41._24_4_;
        auVar72._28_4_ = fVar253;
        fVar253 = auVar194._0_4_;
        fVar280 = auVar194._4_4_;
        auVar73._4_4_ = auVar40._4_4_ * fVar280;
        auVar73._0_4_ = auVar40._0_4_ * fVar253;
        fVar295 = auVar194._8_4_;
        auVar73._8_4_ = auVar40._8_4_ * fVar295;
        fVar254 = auVar194._12_4_;
        auVar73._12_4_ = auVar40._12_4_ * fVar254;
        fVar371 = auVar194._16_4_;
        auVar73._16_4_ = auVar40._16_4_ * fVar371;
        fVar314 = auVar194._20_4_;
        auVar73._20_4_ = auVar40._20_4_ * fVar314;
        fVar207 = auVar194._24_4_;
        auVar73._24_4_ = auVar40._24_4_ * fVar207;
        auVar73._28_4_ = auVar193._28_4_;
        auVar165 = vsubps_avx(auVar73,auVar72);
        auVar166 = vsubps_avx(auVar164,auVar172);
        fVar276 = auVar166._0_4_;
        fVar278 = auVar166._4_4_;
        auVar74._4_4_ = fVar278 * auVar41._4_4_;
        auVar74._0_4_ = fVar276 * auVar41._0_4_;
        fVar284 = auVar166._8_4_;
        auVar74._8_4_ = fVar284 * auVar41._8_4_;
        fVar292 = auVar166._12_4_;
        auVar74._12_4_ = fVar292 * auVar41._12_4_;
        fVar294 = auVar166._16_4_;
        auVar74._16_4_ = fVar294 * auVar41._16_4_;
        fVar296 = auVar166._20_4_;
        auVar74._20_4_ = fVar296 * auVar41._20_4_;
        fVar302 = auVar166._24_4_;
        auVar74._24_4_ = fVar302 * auVar41._24_4_;
        auVar74._28_4_ = auVar41._28_4_;
        auVar75._4_4_ = auVar172._4_4_ * fVar280;
        auVar75._0_4_ = auVar172._0_4_ * fVar253;
        auVar75._8_4_ = auVar172._8_4_ * fVar295;
        auVar75._12_4_ = auVar172._12_4_ * fVar254;
        auVar75._16_4_ = auVar172._16_4_ * fVar371;
        auVar75._20_4_ = auVar172._20_4_ * fVar314;
        auVar75._24_4_ = auVar172._24_4_ * fVar207;
        auVar75._28_4_ = auVar43._28_4_;
        auVar43 = vsubps_avx(auVar74,auVar75);
        auVar76._4_4_ = auVar40._4_4_ * fVar278;
        auVar76._0_4_ = auVar40._0_4_ * fVar276;
        auVar76._8_4_ = auVar40._8_4_ * fVar284;
        auVar76._12_4_ = auVar40._12_4_ * fVar292;
        auVar76._16_4_ = auVar40._16_4_ * fVar294;
        auVar76._20_4_ = auVar40._20_4_ * fVar296;
        auVar76._24_4_ = auVar40._24_4_ * fVar302;
        auVar76._28_4_ = auVar41._28_4_;
        auVar77._4_4_ = auVar172._4_4_ * fVar301;
        auVar77._0_4_ = auVar172._0_4_ * fVar160;
        auVar77._8_4_ = auVar172._8_4_ * fVar183;
        auVar77._12_4_ = auVar172._12_4_ * fVar184;
        auVar77._16_4_ = auVar172._16_4_ * fVar186;
        auVar77._20_4_ = auVar172._20_4_ * fVar204;
        auVar77._24_4_ = auVar172._24_4_ * fVar206;
        auVar77._28_4_ = auVar172._28_4_;
        auVar172 = vsubps_avx(auVar77,auVar76);
        auVar180 = ZEXT864(0) << 0x20;
        auVar269._0_4_ = auVar165._0_4_ * 0.0 + auVar172._0_4_ + auVar43._0_4_ * 0.0;
        auVar269._4_4_ = auVar165._4_4_ * 0.0 + auVar172._4_4_ + auVar43._4_4_ * 0.0;
        auVar269._8_4_ = auVar165._8_4_ * 0.0 + auVar172._8_4_ + auVar43._8_4_ * 0.0;
        auVar269._12_4_ = auVar165._12_4_ * 0.0 + auVar172._12_4_ + auVar43._12_4_ * 0.0;
        auVar269._16_4_ = auVar165._16_4_ * 0.0 + auVar172._16_4_ + auVar43._16_4_ * 0.0;
        auVar269._20_4_ = auVar165._20_4_ * 0.0 + auVar172._20_4_ + auVar43._20_4_ * 0.0;
        auVar269._24_4_ = auVar165._24_4_ * 0.0 + auVar172._24_4_ + auVar43._24_4_ * 0.0;
        auVar269._28_4_ = auVar172._28_4_ + auVar172._28_4_ + auVar43._28_4_;
        auVar172 = vmaxps_avx(auVar197,auVar269);
        auVar172 = vcmpps_avx(auVar172,ZEXT832(0) << 0x20,2);
        auVar220 = vpackssdw_avx(auVar172._0_16_,auVar172._16_16_);
        auVar286 = vpand_avx(auVar220,auVar286);
        auVar220 = vpmovsxwd_avx(auVar286);
        auVar266 = vpunpckhwd_avx(auVar286,auVar286);
        auVar244._16_16_ = auVar266;
        auVar244._0_16_ = auVar220;
        if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar244 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar244 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar244 >> 0x7f,0) == '\0') &&
              (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar266 >> 0x3f,0) == '\0') &&
            (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar266[0xf]) {
LAB_01154110:
          auVar327 = ZEXT3264(local_520);
          auVar248 = ZEXT3264(auVar244);
          auVar326 = ZEXT3264(CONCAT824(uStack_548,
                                        CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
        }
        else {
          auVar78._4_4_ = fVar280 * fVar258;
          auVar78._0_4_ = fVar253 * fVar235;
          auVar78._8_4_ = fVar295 * fVar281;
          auVar78._12_4_ = fVar254 * fVar297;
          auVar78._16_4_ = fVar371 * fVar369;
          auVar78._20_4_ = fVar314 * fVar368;
          auVar78._24_4_ = fVar207 * fVar181;
          auVar78._28_4_ = auVar266._12_4_;
          auVar389._0_4_ = fVar160 * fVar208;
          auVar389._4_4_ = fVar301 * fVar216;
          auVar389._8_4_ = fVar183 * fVar229;
          auVar389._12_4_ = fVar184 * fVar231;
          auVar389._16_4_ = fVar186 * fVar233;
          auVar389._20_4_ = fVar204 * fVar262;
          auVar389._24_4_ = fVar206 * fVar274;
          auVar389._28_4_ = 0;
          auVar172 = vsubps_avx(auVar389,auVar78);
          auVar79._4_4_ = fVar278 * fVar216;
          auVar79._0_4_ = fVar276 * fVar208;
          auVar79._8_4_ = fVar284 * fVar229;
          auVar79._12_4_ = fVar292 * fVar231;
          auVar79._16_4_ = fVar294 * fVar233;
          auVar79._20_4_ = fVar296 * fVar262;
          auVar79._24_4_ = fVar302 * fVar274;
          auVar79._28_4_ = auVar44._28_4_;
          auVar80._4_4_ = fVar280 * fVar279;
          auVar80._0_4_ = fVar253 * fVar251;
          auVar80._8_4_ = fVar295 * fVar293;
          auVar80._12_4_ = fVar254 * fVar338;
          auVar80._16_4_ = fVar371 * fVar256;
          auVar80._20_4_ = fVar314 * fVar214;
          auVar80._24_4_ = fVar207 * fVar205;
          auVar80._28_4_ = auVar194._28_4_;
          auVar41 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = fVar301 * fVar279;
          auVar81._0_4_ = fVar160 * fVar251;
          auVar81._8_4_ = fVar183 * fVar293;
          auVar81._12_4_ = fVar184 * fVar338;
          auVar81._16_4_ = fVar186 * fVar256;
          auVar81._20_4_ = fVar204 * fVar214;
          auVar81._24_4_ = fVar206 * fVar205;
          auVar81._28_4_ = auVar197._28_4_;
          auVar82._4_4_ = fVar278 * fVar258;
          auVar82._0_4_ = fVar276 * fVar235;
          auVar82._8_4_ = fVar284 * fVar281;
          auVar82._12_4_ = fVar292 * fVar297;
          auVar82._16_4_ = fVar294 * fVar369;
          auVar82._20_4_ = fVar296 * fVar368;
          auVar82._24_4_ = fVar302 * fVar181;
          auVar82._28_4_ = auVar46._28_4_;
          auVar43 = vsubps_avx(auVar82,auVar81);
          auVar324._0_4_ = auVar172._0_4_ * 0.0 + auVar43._0_4_ + auVar41._0_4_ * 0.0;
          auVar324._4_4_ = auVar172._4_4_ * 0.0 + auVar43._4_4_ + auVar41._4_4_ * 0.0;
          auVar324._8_4_ = auVar172._8_4_ * 0.0 + auVar43._8_4_ + auVar41._8_4_ * 0.0;
          auVar324._12_4_ = auVar172._12_4_ * 0.0 + auVar43._12_4_ + auVar41._12_4_ * 0.0;
          auVar324._16_4_ = auVar172._16_4_ * 0.0 + auVar43._16_4_ + auVar41._16_4_ * 0.0;
          auVar324._20_4_ = auVar172._20_4_ * 0.0 + auVar43._20_4_ + auVar41._20_4_ * 0.0;
          auVar324._24_4_ = auVar172._24_4_ * 0.0 + auVar43._24_4_ + auVar41._24_4_ * 0.0;
          auVar324._28_4_ = auVar46._28_4_ + auVar43._28_4_ + auVar197._28_4_;
          auVar40 = vrcpps_avx(auVar324);
          fVar235 = auVar40._0_4_;
          fVar251 = auVar40._4_4_;
          auVar83._4_4_ = auVar324._4_4_ * fVar251;
          auVar83._0_4_ = auVar324._0_4_ * fVar235;
          fVar253 = auVar40._8_4_;
          auVar83._8_4_ = auVar324._8_4_ * fVar253;
          fVar258 = auVar40._12_4_;
          auVar83._12_4_ = auVar324._12_4_ * fVar258;
          fVar279 = auVar40._16_4_;
          auVar83._16_4_ = auVar324._16_4_ * fVar279;
          fVar280 = auVar40._20_4_;
          auVar83._20_4_ = auVar324._20_4_ * fVar280;
          fVar281 = auVar40._24_4_;
          auVar83._24_4_ = auVar324._24_4_ * fVar281;
          auVar83._28_4_ = auVar194._28_4_;
          auVar390._8_4_ = 0x3f800000;
          auVar390._0_8_ = 0x3f8000003f800000;
          auVar390._12_4_ = 0x3f800000;
          auVar390._16_4_ = 0x3f800000;
          auVar390._20_4_ = 0x3f800000;
          auVar390._24_4_ = 0x3f800000;
          auVar390._28_4_ = 0x3f800000;
          auVar44 = vsubps_avx(auVar390,auVar83);
          fVar235 = auVar44._0_4_ * fVar235 + fVar235;
          fVar251 = auVar44._4_4_ * fVar251 + fVar251;
          fVar253 = auVar44._8_4_ * fVar253 + fVar253;
          fVar258 = auVar44._12_4_ * fVar258 + fVar258;
          fVar279 = auVar44._16_4_ * fVar279 + fVar279;
          fVar280 = auVar44._20_4_ * fVar280 + fVar280;
          fVar281 = auVar44._24_4_ * fVar281 + fVar281;
          auVar84._4_4_ =
               (auVar172._4_4_ * fVar277 + auVar41._4_4_ * fVar272 + auVar43._4_4_ * fVar161) *
               fVar251;
          auVar84._0_4_ =
               (auVar172._0_4_ * fVar234 + auVar41._0_4_ * fVar249 + auVar43._0_4_ * fVar209) *
               fVar235;
          auVar84._8_4_ =
               (auVar172._8_4_ * fVar291 + auVar41._8_4_ * fVar283 + auVar43._8_4_ * fVar182) *
               fVar253;
          auVar84._12_4_ =
               (auVar172._12_4_ * fVar299 + auVar41._12_4_ * fVar298 + auVar43._12_4_ * fVar282) *
               fVar258;
          auVar84._16_4_ =
               (auVar172._16_4_ * fVar313 + auVar41._16_4_ * fVar352 + auVar43._16_4_ * fVar210) *
               fVar279;
          auVar84._20_4_ =
               (auVar172._20_4_ * fVar259 + auVar41._20_4_ * fVar370 + auVar43._20_4_ * fVar212) *
               fVar280;
          auVar84._24_4_ =
               (auVar172._24_4_ * fVar187 + auVar41._24_4_ * fVar185 + auVar43._24_4_ * fVar215) *
               fVar281;
          auVar84._28_4_ = auVar42._28_4_ + auVar345._28_4_;
          auVar220 = vpermilps_avx(ZEXT416(local_820),0);
          auVar171._16_16_ = auVar220;
          auVar171._0_16_ = auVar220;
          auVar345 = vcmpps_avx(auVar171,auVar84,2);
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar245._4_4_ = uVar12;
          auVar245._0_4_ = uVar12;
          auVar245._8_4_ = uVar12;
          auVar245._12_4_ = uVar12;
          auVar245._16_4_ = uVar12;
          auVar245._20_4_ = uVar12;
          auVar245._24_4_ = uVar12;
          auVar245._28_4_ = uVar12;
          auVar172 = vcmpps_avx(auVar84,auVar245,2);
          auVar345 = vandps_avx(auVar172,auVar345);
          auVar220 = vpackssdw_avx(auVar345._0_16_,auVar345._16_16_);
          auVar286 = vpand_avx(auVar286,auVar220);
          auVar220 = vpmovsxwd_avx(auVar286);
          auVar266 = vpshufd_avx(auVar286,0xee);
          auVar266 = vpmovsxwd_avx(auVar266);
          auVar309 = ZEXT1664(auVar266);
          auVar244._16_16_ = auVar266;
          auVar244._0_16_ = auVar220;
          auVar327 = ZEXT3264(local_520);
          if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar244 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar244 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar244 >> 0x7f,0) == '\0') &&
                (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar266 >> 0x3f,0) == '\0') &&
              (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar266[0xf]) goto LAB_01154110;
          auVar345 = vcmpps_avx(ZEXT832(0) << 0x20,auVar324,4);
          auVar220 = vpackssdw_avx(auVar345._0_16_,auVar345._16_16_);
          auVar286 = vpand_avx(auVar286,auVar220);
          auVar220 = vpmovsxwd_avx(auVar286);
          auVar248 = ZEXT1664(auVar220);
          auVar286 = vpunpckhwd_avx(auVar286,auVar286);
          auVar307._16_16_ = auVar286;
          auVar307._0_16_ = auVar220;
          auVar309 = ZEXT3264(auVar307);
          auVar326 = ZEXT3264(CONCAT824(uStack_548,
                                        CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
          if ((((((((auVar307 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar307 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar307 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar307 >> 0x7f,0) != '\0') ||
                (auVar307 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar286 >> 0x3f,0) != '\0') ||
              (auVar307 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar286[0xf] < '\0') {
            auVar85._4_4_ = auVar197._4_4_ * fVar251;
            auVar85._0_4_ = auVar197._0_4_ * fVar235;
            auVar85._8_4_ = auVar197._8_4_ * fVar253;
            auVar85._12_4_ = auVar197._12_4_ * fVar258;
            auVar85._16_4_ = auVar197._16_4_ * fVar279;
            auVar85._20_4_ = auVar197._20_4_ * fVar280;
            auVar85._24_4_ = auVar197._24_4_ * fVar281;
            auVar85._28_4_ = SUB84(uStack_548,4);
            auVar86._4_4_ = auVar269._4_4_ * fVar251;
            auVar86._0_4_ = auVar269._0_4_ * fVar235;
            auVar86._8_4_ = auVar269._8_4_ * fVar253;
            auVar86._12_4_ = auVar269._12_4_ * fVar258;
            auVar86._16_4_ = auVar269._16_4_ * fVar279;
            auVar86._20_4_ = auVar269._20_4_ * fVar280;
            auVar86._24_4_ = auVar269._24_4_ * fVar281;
            auVar86._28_4_ = auVar44._28_4_ + auVar40._28_4_;
            auVar270._8_4_ = 0x3f800000;
            auVar270._0_8_ = 0x3f8000003f800000;
            auVar270._12_4_ = 0x3f800000;
            auVar270._16_4_ = 0x3f800000;
            auVar270._20_4_ = 0x3f800000;
            auVar270._24_4_ = 0x3f800000;
            auVar270._28_4_ = 0x3f800000;
            auVar345 = vsubps_avx(auVar270,auVar85);
            auVar248 = ZEXT3264(auVar345);
            auVar345 = vblendvps_avx(auVar345,auVar85,auVar39);
            auVar327 = ZEXT3264(auVar345);
            auVar345 = vsubps_avx(auVar270,auVar86);
            _local_380 = vblendvps_avx(auVar345,auVar86,auVar39);
            auVar326 = ZEXT3264(auVar307);
            local_480 = auVar84;
          }
        }
        auVar362 = ZEXT3264(auVar357);
        auVar345 = auVar327._0_32_;
        auVar172 = auVar326._0_32_;
        if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar172 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar172 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar172 >> 0x7f,0) != '\0') ||
              (auVar326 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar172 >> 0xbf,0) != '\0') ||
            (auVar326 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar326[0x1f] < '\0') {
          auVar40 = vsubps_avx(auVar343,auVar167);
          fVar249 = auVar167._0_4_ + auVar327._0_4_ * auVar40._0_4_;
          fVar234 = auVar167._4_4_ + auVar327._4_4_ * auVar40._4_4_;
          fVar251 = auVar167._8_4_ + auVar327._8_4_ * auVar40._8_4_;
          fVar253 = auVar167._12_4_ + auVar327._12_4_ * auVar40._12_4_;
          fVar258 = auVar167._16_4_ + auVar327._16_4_ * auVar40._16_4_;
          fVar272 = auVar167._20_4_ + auVar327._20_4_ * auVar40._20_4_;
          fVar277 = auVar167._24_4_ + auVar327._24_4_ * auVar40._24_4_;
          fVar279 = auVar40._28_4_ + 0.0;
          fVar235 = *(float *)((long)local_828->ray_space + k * 4 + -0x10);
          auVar87._4_4_ = (fVar234 + fVar234) * fVar235;
          auVar87._0_4_ = (fVar249 + fVar249) * fVar235;
          auVar87._8_4_ = (fVar251 + fVar251) * fVar235;
          auVar87._12_4_ = (fVar253 + fVar253) * fVar235;
          auVar87._16_4_ = (fVar258 + fVar258) * fVar235;
          auVar87._20_4_ = (fVar272 + fVar272) * fVar235;
          auVar87._24_4_ = (fVar277 + fVar277) * fVar235;
          auVar87._28_4_ = fVar279 + fVar279;
          auVar40 = vcmpps_avx(local_480,auVar87,6);
          auVar41 = auVar172 & auVar40;
          if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar41 >> 0x7f,0) != '\0') ||
                (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar41 >> 0xbf,0) != '\0') ||
              (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar41[0x1f] < '\0') {
            auVar248 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
            local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
            uStack_378._0_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
            uStack_378._4_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
            uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
            uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
            uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
            uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
            local_2a0 = auVar345;
            auVar149 = _local_380;
            auVar41 = _local_380;
            local_280 = (float)local_380._0_4_;
            fStack_27c = (float)local_380._4_4_;
            fStack_278 = (float)uStack_378;
            fStack_274 = uStack_378._4_4_;
            fStack_270 = (float)uStack_370;
            fStack_26c = uStack_370._4_4_;
            fStack_268 = (float)uStack_368;
            fStack_264 = uStack_368._4_4_;
            local_260 = local_480;
            local_240 = 0;
            local_23c = uVar34;
            local_230 = auVar264._0_8_;
            uStack_228 = uStack_848;
            uStack_798 = auVar405._8_8_;
            local_220 = auVar405._0_8_;
            uStack_218 = uStack_798;
            uStack_7a8 = auVar418._8_8_;
            local_210 = auVar418._0_8_;
            uStack_208 = uStack_7a8;
            uStack_7b8 = auVar383._8_8_;
            local_200 = auVar383._0_8_;
            uStack_1f8 = uStack_7b8;
            auVar326 = ZEXT3264(_local_640);
            _local_380 = auVar41;
            if ((pGVar158->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_5a0 = vandps_avx(auVar40,auVar172);
              auVar218._0_4_ = 1.0 / local_540;
              auVar218._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar286 = vshufps_avx(auVar218,auVar218,0);
              local_1c0[0] = auVar286._0_4_ * (auVar327._0_4_ + 0.0);
              local_1c0[1] = auVar286._4_4_ * (auVar327._4_4_ + 1.0);
              local_1c0[2] = auVar286._8_4_ * (auVar327._8_4_ + 2.0);
              local_1c0[3] = auVar286._12_4_ * (auVar327._12_4_ + 3.0);
              fStack_1b0 = auVar286._0_4_ * (auVar327._16_4_ + 4.0);
              fStack_1ac = auVar286._4_4_ * (auVar327._20_4_ + 5.0);
              fStack_1a8 = auVar286._8_4_ * (auVar327._24_4_ + 6.0);
              fStack_1a4 = auVar327._28_4_ + 7.0;
              uStack_370 = auVar149._16_8_;
              uStack_368 = auVar41._24_8_;
              local_1a0 = local_380;
              uStack_198 = uStack_378;
              uStack_190 = uStack_370;
              uStack_188 = uStack_368;
              local_180 = local_480;
              auVar198._8_4_ = 0x7f800000;
              auVar198._0_8_ = 0x7f8000007f800000;
              auVar198._12_4_ = 0x7f800000;
              auVar198._16_4_ = 0x7f800000;
              auVar198._20_4_ = 0x7f800000;
              auVar198._24_4_ = 0x7f800000;
              auVar198._28_4_ = 0x7f800000;
              auVar172 = vblendvps_avx(auVar198,local_480,local_5a0);
              auVar40 = vshufps_avx(auVar172,auVar172,0xb1);
              auVar40 = vminps_avx(auVar172,auVar40);
              auVar41 = vshufpd_avx(auVar40,auVar40,5);
              auVar40 = vminps_avx(auVar40,auVar41);
              auVar41 = vperm2f128_avx(auVar40,auVar40,1);
              auVar40 = vminps_avx(auVar40,auVar41);
              auVar40 = vcmpps_avx(auVar172,auVar40,0);
              auVar41 = local_5a0 & auVar40;
              auVar172 = local_5a0;
              if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar41 >> 0x7f,0) != '\0') ||
                    (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar41 >> 0xbf,0) != '\0') ||
                  (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar41[0x1f] < '\0') {
                auVar172 = vandps_avx(auVar40,local_5a0);
              }
              uVar151 = vmovmskps_avx(auVar172);
              uVar38 = 0;
              if (uVar151 != 0) {
                for (; (uVar151 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar152 = (ulong)uVar38;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar158->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar235 = local_1c0[uVar152];
                uVar12 = *(undefined4 *)((long)&local_1a0 + uVar152 * 4);
                fVar234 = 1.0 - fVar235;
                fVar249 = fVar235 * fVar234 * 4.0;
                auVar309 = ZEXT464(0x3f000000);
                auVar286 = ZEXT416((uint)(fVar235 * fVar235 * 0.5));
                auVar286 = vshufps_avx(auVar286,auVar286,0);
                auVar220 = ZEXT416((uint)((fVar234 * fVar234 + fVar249) * 0.5));
                auVar220 = vshufps_avx(auVar220,auVar220,0);
                auVar266 = ZEXT416((uint)((-fVar235 * fVar235 - fVar249) * 0.5));
                auVar266 = vshufps_avx(auVar266,auVar266,0);
                auVar238 = ZEXT416((uint)(fVar234 * -fVar234 * 0.5));
                auVar238 = vshufps_avx(auVar238,auVar238,0);
                auVar219._0_4_ =
                     auVar238._0_4_ * fVar261 +
                     auVar266._0_4_ * fVar402 + auVar286._0_4_ * fVar382 + auVar220._0_4_ * fVar416;
                auVar219._4_4_ =
                     auVar238._4_4_ * fVar273 +
                     auVar266._4_4_ * fVar409 + auVar286._4_4_ * fVar393 + auVar220._4_4_ * fVar421;
                auVar219._8_4_ =
                     auVar238._8_4_ * auVar264._8_4_ +
                     auVar266._8_4_ * auVar405._8_4_ +
                     auVar286._8_4_ * auVar383._8_4_ + auVar220._8_4_ * auVar418._8_4_;
                auVar219._12_4_ =
                     auVar238._12_4_ * auVar264._12_4_ +
                     auVar266._12_4_ * auVar405._12_4_ +
                     auVar286._12_4_ * auVar383._12_4_ + auVar220._12_4_ * auVar418._12_4_;
                auVar248 = ZEXT464(*(uint *)(local_180 + uVar152 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_180 + uVar152 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar219._0_4_;
                uVar35 = vextractps_avx(auVar219,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar35;
                uVar35 = vextractps_avx(auVar219,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar35;
                *(float *)(ray + k * 4 + 0xf0) = fVar235;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar12;
                *(uint *)(ray + k * 4 + 0x110) = uVar33;
                *(uint *)(ray + k * 4 + 0x120) = uVar153;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_5e0._0_16_ = vshufps_avx(ZEXT416(uVar153),ZEXT416(uVar153),0);
                local_600._0_16_ = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
                local_600._16_16_ = auVar164._16_16_;
                _auStack_690 = auVar178._16_16_;
                _local_6a0 = *local_728;
                auStack_750 = auVar343._16_16_;
                local_760 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                _local_720 = auVar357;
                local_520 = auVar345;
                _local_4e0 = *pauVar9;
                while( true ) {
                  local_420 = local_1c0[uVar152];
                  local_410 = *(undefined4 *)((long)&local_1a0 + uVar152 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar152 * 4);
                  fVar249 = 1.0 - local_420;
                  fVar235 = local_420 * fVar249 * 4.0;
                  auVar309 = ZEXT464(0x3f000000);
                  auVar286 = ZEXT416((uint)(local_420 * local_420 * 0.5));
                  auVar286 = vshufps_avx(auVar286,auVar286,0);
                  auVar220 = ZEXT416((uint)((fVar249 * fVar249 + fVar235) * 0.5));
                  auVar220 = vshufps_avx(auVar220,auVar220,0);
                  auVar266 = ZEXT416((uint)((-local_420 * local_420 - fVar235) * 0.5));
                  auVar266 = vshufps_avx(auVar266,auVar266,0);
                  local_790.context = context->user;
                  auVar238 = ZEXT416((uint)(fVar249 * -fVar249 * 0.5));
                  auVar238 = vshufps_avx(auVar238,auVar238,0);
                  auVar223._0_4_ =
                       auVar238._0_4_ * fVar261 +
                       auVar266._0_4_ * (float)local_7a0._0_4_ +
                       auVar286._0_4_ * (float)local_7c0._0_4_ +
                       auVar220._0_4_ * (float)local_7b0._0_4_;
                  auVar223._4_4_ =
                       auVar238._4_4_ * fVar273 +
                       auVar266._4_4_ * (float)local_7a0._4_4_ +
                       auVar286._4_4_ * (float)local_7c0._4_4_ +
                       auVar220._4_4_ * (float)local_7b0._4_4_;
                  auVar223._8_4_ =
                       auVar238._8_4_ * auVar264._8_4_ +
                       auVar266._8_4_ * (float)uStack_798 +
                       auVar286._8_4_ * (float)uStack_7b8 + auVar220._8_4_ * (float)uStack_7a8;
                  auVar223._12_4_ =
                       auVar238._12_4_ * auVar264._12_4_ +
                       auVar266._12_4_ * uStack_798._4_4_ +
                       auVar286._12_4_ * uStack_7b8._4_4_ + auVar220._12_4_ * uStack_7a8._4_4_;
                  auVar286 = vshufps_avx(auVar223,auVar223,0);
                  local_450[0] = (RTCHitN)auVar286[0];
                  local_450[1] = (RTCHitN)auVar286[1];
                  local_450[2] = (RTCHitN)auVar286[2];
                  local_450[3] = (RTCHitN)auVar286[3];
                  local_450[4] = (RTCHitN)auVar286[4];
                  local_450[5] = (RTCHitN)auVar286[5];
                  local_450[6] = (RTCHitN)auVar286[6];
                  local_450[7] = (RTCHitN)auVar286[7];
                  local_450[8] = (RTCHitN)auVar286[8];
                  local_450[9] = (RTCHitN)auVar286[9];
                  local_450[10] = (RTCHitN)auVar286[10];
                  local_450[0xb] = (RTCHitN)auVar286[0xb];
                  local_450[0xc] = (RTCHitN)auVar286[0xc];
                  local_450[0xd] = (RTCHitN)auVar286[0xd];
                  local_450[0xe] = (RTCHitN)auVar286[0xe];
                  local_450[0xf] = (RTCHitN)auVar286[0xf];
                  auVar286 = vshufps_avx(auVar223,auVar223,0x55);
                  local_440 = auVar286;
                  local_430 = vshufps_avx(auVar223,auVar223,0xaa);
                  fStack_41c = local_420;
                  fStack_418 = local_420;
                  fStack_414 = local_420;
                  uStack_40c = local_410;
                  uStack_408 = local_410;
                  uStack_404 = local_410;
                  local_400 = local_600._0_8_;
                  uStack_3f8 = local_600._8_8_;
                  local_3f0 = local_5e0._0_8_;
                  uStack_3e8 = local_5e0._8_8_;
                  vcmpps_avx(auVar180._0_32_,auVar180._0_32_,0xf);
                  uStack_3dc = (local_790.context)->instID[0];
                  local_3e0 = uStack_3dc;
                  uStack_3d8 = uStack_3dc;
                  uStack_3d4 = uStack_3dc;
                  uStack_3d0 = (local_790.context)->instPrimID[0];
                  uStack_3cc = uStack_3d0;
                  uStack_3c8 = uStack_3d0;
                  uStack_3c4 = uStack_3d0;
                  local_840 = _local_6a0;
                  local_790.valid = (int *)local_840;
                  local_790.geometryUserPtr = pGVar158->userPtr;
                  local_790.hit = local_450;
                  local_790.N = 4;
                  local_790.ray = (RTCRayN *)ray;
                  if (pGVar158->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar309 = ZEXT1664(auVar309._0_16_);
                    (*pGVar158->intersectionFilterN)(&local_790);
                    auVar362 = ZEXT3264(_local_720);
                    auVar326 = ZEXT3264(_local_640);
                    auVar327 = ZEXT3264(local_520);
                    auVar180 = ZEXT1664(ZEXT816(0) << 0x40);
                    fVar417 = (float)local_660._0_4_;
                    fVar422 = (float)local_660._4_4_;
                    fVar317 = fStack_658;
                    fVar328 = fStack_654;
                    fVar250 = fStack_650;
                    fVar252 = fStack_64c;
                    fVar257 = fStack_648;
                    fVar211 = fStack_644;
                    fVar316 = (float)local_7e0._0_4_;
                    fVar228 = (float)local_7e0._4_4_;
                    fVar230 = fStack_7d8;
                    fVar232 = fStack_7d4;
                    fVar255 = fStack_7d0;
                    fVar260 = fStack_7cc;
                    fVar275 = fStack_7c8;
                  }
                  if (local_840 == (undefined1  [16])0x0) {
                    auVar286 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar286 = auVar286 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var37 = context->args->filter;
                    if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar158->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar309 = ZEXT1664(auVar309._0_16_);
                      (*p_Var37)(&local_790);
                      auVar362 = ZEXT3264(_local_720);
                      auVar326 = ZEXT3264(_local_640);
                      auVar327 = ZEXT3264(local_520);
                      auVar180 = ZEXT1664(ZEXT816(0) << 0x40);
                      fVar417 = (float)local_660._0_4_;
                      fVar422 = (float)local_660._4_4_;
                      fVar317 = fStack_658;
                      fVar328 = fStack_654;
                      fVar250 = fStack_650;
                      fVar252 = fStack_64c;
                      fVar257 = fStack_648;
                      fVar211 = fStack_644;
                      fVar316 = (float)local_7e0._0_4_;
                      fVar228 = (float)local_7e0._4_4_;
                      fVar230 = fStack_7d8;
                      fVar232 = fStack_7d4;
                      fVar255 = fStack_7d0;
                      fVar260 = fStack_7cc;
                      fVar275 = fStack_7c8;
                    }
                    auVar220 = vpcmpeqd_avx(local_840,_DAT_01f7aa10);
                    auVar266 = vpcmpeqd_avx(auVar286,auVar286);
                    auVar286 = auVar220 ^ auVar266;
                    if (local_840 != (undefined1  [16])0x0) {
                      auVar220 = auVar220 ^ auVar266;
                      auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])local_790.hit);
                      *(undefined1 (*) [16])(local_790.ray + 0xc0) = auVar266;
                      auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x10));
                      *(undefined1 (*) [16])(local_790.ray + 0xd0) = auVar266;
                      auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x20));
                      *(undefined1 (*) [16])(local_790.ray + 0xe0) = auVar266;
                      auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x30));
                      *(undefined1 (*) [16])(local_790.ray + 0xf0) = auVar266;
                      auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x40));
                      *(undefined1 (*) [16])(local_790.ray + 0x100) = auVar266;
                      auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x50));
                      *(undefined1 (*) [16])(local_790.ray + 0x110) = auVar266;
                      auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x60));
                      *(undefined1 (*) [16])(local_790.ray + 0x120) = auVar266;
                      auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x70));
                      *(undefined1 (*) [16])(local_790.ray + 0x130) = auVar266;
                      auVar220 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x80));
                      *(undefined1 (*) [16])(local_790.ray + 0x140) = auVar220;
                    }
                  }
                  auVar164 = local_480;
                  auVar357 = auVar362._0_32_;
                  auVar345 = auVar327._0_32_;
                  auVar192._8_8_ = 0x100000001;
                  auVar192._0_8_ = 0x100000001;
                  if ((auVar192 & auVar286) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = local_760._0_4_;
                    auVar286 = local_760;
                  }
                  else {
                    auVar286 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  auVar248 = ZEXT3264(local_480);
                  *(undefined4 *)(local_5a0 + uVar152 * 4) = 0;
                  local_760 = auVar286;
                  auVar286 = vshufps_avx(auVar286,auVar286,0);
                  auVar179._16_16_ = auVar286;
                  auVar179._0_16_ = auVar286;
                  auVar172 = vcmpps_avx(auVar164,auVar179,2);
                  auVar178 = vandps_avx(auVar172,local_5a0);
                  local_5a0 = local_5a0 & auVar172;
                  if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_5a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_5a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_5a0 >> 0x7f,0) == '\0') &&
                        (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_5a0 >> 0xbf,0) == '\0') &&
                      (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_5a0[0x1f]) break;
                  auVar203._8_4_ = 0x7f800000;
                  auVar203._0_8_ = 0x7f8000007f800000;
                  auVar203._12_4_ = 0x7f800000;
                  auVar203._16_4_ = 0x7f800000;
                  auVar203._20_4_ = 0x7f800000;
                  auVar203._24_4_ = 0x7f800000;
                  auVar203._28_4_ = 0x7f800000;
                  auVar164 = vblendvps_avx(auVar203,auVar164,auVar178);
                  auVar345 = vshufps_avx(auVar164,auVar164,0xb1);
                  auVar345 = vminps_avx(auVar164,auVar345);
                  auVar172 = vshufpd_avx(auVar345,auVar345,5);
                  auVar345 = vminps_avx(auVar345,auVar172);
                  auVar172 = vperm2f128_avx(auVar345,auVar345,1);
                  auVar345 = vminps_avx(auVar345,auVar172);
                  auVar345 = vcmpps_avx(auVar164,auVar345,0);
                  auVar172 = auVar178 & auVar345;
                  auVar164 = auVar178;
                  if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar172 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar172 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar172 >> 0x7f,0) != '\0') ||
                        (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar172 >> 0xbf,0) != '\0') ||
                      (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar172[0x1f] < '\0') {
                    auVar164 = vandps_avx(auVar345,auVar178);
                  }
                  uVar151 = vmovmskps_avx(auVar164);
                  uVar38 = 0;
                  if (uVar151 != 0) {
                    for (; (uVar151 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar152 = (ulong)uVar38;
                  local_5a0 = auVar178;
                }
              }
            }
            goto LAB_01152d12;
          }
        }
        auVar326 = ZEXT3264(_local_640);
      }
LAB_01152d12:
      local_520 = auVar345;
      if (8 < (int)uVar34) {
        auVar286 = vpshufd_avx(ZEXT416(uVar34),0);
        local_320._0_16_ = auVar286;
        auVar286 = vshufps_avx(local_700._0_16_,local_700._0_16_,0);
        register0x00001210 = auVar286;
        _local_340 = auVar286;
        auVar138._4_4_ = uStack_81c;
        auVar138._0_4_ = local_820;
        auVar138._8_4_ = fStack_818;
        auVar138._12_4_ = fStack_814;
        auVar286 = vpermilps_avx(auVar138,0);
        local_360._16_16_ = auVar286;
        local_360._0_16_ = auVar286;
        auVar163._0_4_ = 1.0 / local_540;
        auVar163._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar286 = vshufps_avx(auVar163,auVar163,0);
        register0x00001210 = auVar286;
        _local_100 = auVar286;
        local_2b0 = vshufps_avx(ZEXT416(uVar153),ZEXT416(uVar153),0);
        local_2c0 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
        auVar180 = ZEXT1664(local_2c0);
        lVar159 = 8;
        fVar235 = (float)local_5c0._0_4_;
        fVar249 = (float)local_5c0._4_4_;
        fVar234 = fStack_5b8;
        fVar251 = fStack_5b4;
        fVar253 = fStack_5b0;
        fVar258 = fStack_5ac;
        fVar272 = fStack_5a8;
        fVar277 = (float)local_680._0_4_;
        fVar279 = (float)local_680._4_4_;
        fVar280 = fStack_678;
        fVar281 = fStack_674;
        fVar283 = fStack_670;
        fVar291 = fStack_66c;
        fVar293 = fStack_668;
        _local_720 = auVar357;
        do {
          pauVar10 = (undefined1 (*) [28])(bspline_basis0 + lVar159 * 4 + lVar155);
          fVar295 = *(float *)*pauVar10;
          fVar297 = *(float *)(*pauVar10 + 4);
          fVar298 = *(float *)(*pauVar10 + 8);
          fVar299 = *(float *)(*pauVar10 + 0xc);
          fVar338 = *(float *)(*pauVar10 + 0x10);
          fVar254 = *(float *)(*pauVar10 + 0x14);
          fVar369 = *(float *)(*pauVar10 + 0x18);
          auVar146 = *pauVar10;
          pfVar1 = (float *)(lVar155 + 0x21aefac + lVar159 * 4);
          fVar352 = *pfVar1;
          fVar313 = pfVar1[1];
          fVar256 = pfVar1[2];
          fVar371 = pfVar1[3];
          fVar368 = pfVar1[4];
          fVar370 = pfVar1[5];
          fVar259 = pfVar1[6];
          pauVar10 = (undefined1 (*) [28])(lVar155 + 0x21af430 + lVar159 * 4);
          fVar214 = *(float *)*pauVar10;
          fVar314 = *(float *)(*pauVar10 + 4);
          fVar181 = *(float *)(*pauVar10 + 8);
          fVar185 = *(float *)(*pauVar10 + 0xc);
          fVar187 = *(float *)(*pauVar10 + 0x10);
          fVar205 = *(float *)(*pauVar10 + 0x14);
          fVar207 = *(float *)(*pauVar10 + 0x18);
          auVar145 = *pauVar10;
          pfVar1 = (float *)(lVar155 + 0x21af8b4 + lVar159 * 4);
          local_620 = *pfVar1;
          fStack_61c = pfVar1[1];
          fStack_618 = pfVar1[2];
          fStack_614 = pfVar1[3];
          fStack_610 = pfVar1[4];
          fStack_60c = pfVar1[5];
          fStack_608 = pfVar1[6];
          fStack_604 = pfVar1[7];
          fVar209 = auVar248._28_4_;
          fStack_804 = fVar209 + fVar209 + auVar180._28_4_;
          auVar408._0_4_ =
               fVar277 * fVar295 +
               fVar352 * auVar326._0_4_ +
               fVar214 * (float)local_4a0._0_4_ + (float)local_4c0._0_4_ * local_620;
          auVar408._4_4_ =
               fVar279 * fVar297 +
               fVar313 * auVar326._4_4_ +
               fVar314 * (float)local_4a0._4_4_ + (float)local_4c0._4_4_ * fStack_61c;
          auVar408._8_4_ =
               fVar280 * fVar298 +
               fVar256 * auVar326._8_4_ + fVar181 * fStack_498 + fStack_4b8 * fStack_618;
          auVar408._12_4_ =
               fVar281 * fVar299 +
               fVar371 * auVar326._12_4_ + fVar185 * fStack_494 + fStack_4b4 * fStack_614;
          auVar408._16_4_ =
               fVar283 * fVar338 +
               fVar368 * auVar326._16_4_ + fVar187 * fStack_490 + fStack_4b0 * fStack_610;
          auVar408._20_4_ =
               fVar291 * fVar254 +
               fVar370 * auVar326._20_4_ + fVar205 * fStack_48c + fStack_4ac * fStack_60c;
          auVar408._24_4_ =
               fVar293 * fVar369 +
               fVar259 * auVar326._24_4_ + fVar207 * fStack_488 + fStack_4a8 * fStack_608;
          auVar408._28_4_ = fVar209 + fStack_604 + fStack_804;
          local_700._0_4_ =
               (float)local_120._0_4_ * fVar295 +
               fVar417 * fVar352 + fVar316 * fVar214 + fVar235 * local_620;
          local_700._4_4_ =
               (float)local_120._4_4_ * fVar297 +
               fVar422 * fVar313 + fVar228 * fVar314 + fVar249 * fStack_61c;
          local_700._8_4_ =
               fStack_118 * fVar298 + fVar317 * fVar256 + fVar230 * fVar181 + fVar234 * fStack_618;
          local_700._12_4_ =
               fStack_114 * fVar299 + fVar328 * fVar371 + fVar232 * fVar185 + fVar251 * fStack_614;
          local_700._16_4_ =
               fStack_110 * fVar338 + fVar250 * fVar368 + fVar255 * fVar187 + fVar253 * fStack_610;
          local_700._20_4_ =
               fStack_10c * fVar254 + fVar252 * fVar370 + fVar260 * fVar205 + fVar258 * fStack_60c;
          local_700._24_4_ =
               fStack_108 * fVar369 + fVar257 * fVar259 + fVar275 * fVar207 + fVar272 * fStack_608;
          local_700._28_4_ = fStack_804 + fVar209 + fVar209 + auVar309._28_4_;
          fVar161 = fVar295 * (float)local_160._0_4_ +
                    (float)local_c0._0_4_ * fVar352 +
                    (float)local_a0._0_4_ * fVar214 + local_620 * (float)local_140._0_4_;
          fVar182 = fVar297 * (float)local_160._4_4_ +
                    (float)local_c0._4_4_ * fVar313 +
                    (float)local_a0._4_4_ * fVar314 + fStack_61c * (float)local_140._4_4_;
          fStack_818 = fVar298 * fStack_158 +
                       fStack_b8 * fVar256 + fStack_98 * fVar181 + fStack_618 * fStack_138;
          fStack_814 = fVar299 * fStack_154 +
                       fStack_b4 * fVar371 + fStack_94 * fVar185 + fStack_614 * fStack_134;
          fStack_810 = fVar338 * fStack_150 +
                       fStack_b0 * fVar368 + fStack_90 * fVar187 + fStack_610 * fStack_130;
          fStack_80c = fVar254 * fStack_14c +
                       fStack_ac * fVar370 + fStack_8c * fVar205 + fStack_60c * fStack_12c;
          fStack_808 = fVar369 * fStack_148 +
                       fStack_a8 * fVar259 + fStack_88 * fVar207 + fStack_608 * fStack_128;
          fStack_804 = fStack_804 + fVar209 + fVar209 + fStack_604;
          pfVar1 = (float *)(bspline_basis1 + lVar159 * 4 + lVar155);
          fVar295 = *pfVar1;
          fVar297 = pfVar1[1];
          fVar298 = pfVar1[2];
          fVar299 = pfVar1[3];
          fVar338 = pfVar1[4];
          fVar254 = pfVar1[5];
          fVar369 = pfVar1[6];
          pauVar10 = (undefined1 (*) [28])(lVar155 + 0x21b13cc + lVar159 * 4);
          auVar147 = *pauVar10;
          pauVar11 = (undefined1 (*) [28])(lVar155 + 0x21b1850 + lVar159 * 4);
          fVar255 = *(float *)*pauVar11;
          fVar260 = *(float *)(*pauVar11 + 4);
          fVar275 = *(float *)(*pauVar11 + 8);
          fVar214 = *(float *)(*pauVar11 + 0xc);
          fVar314 = *(float *)(*pauVar11 + 0x10);
          fVar181 = *(float *)(*pauVar11 + 0x14);
          fVar185 = *(float *)(*pauVar11 + 0x18);
          auVar148 = *pauVar11;
          pfVar2 = (float *)(lVar155 + 0x21b1cd4 + lVar159 * 4);
          fVar187 = *pfVar2;
          fVar205 = pfVar2[1];
          fVar207 = pfVar2[2];
          fVar209 = pfVar2[3];
          fStack_530 = pfVar2[4];
          fStack_52c = pfVar2[5];
          fStack_528 = pfVar2[6];
          fStack_524 = pfVar2[7];
          fVar210 = auVar326._28_4_;
          local_880._0_4_ = auVar147._0_4_;
          local_880._4_4_ = auVar147._4_4_;
          fStack_878 = auVar147._8_4_;
          fStack_874 = auVar147._12_4_;
          auStack_870._0_4_ = auVar147._16_4_;
          auStack_870._4_4_ = auVar147._20_4_;
          fStack_868 = auVar147._24_4_;
          fVar282 = fVar210 + fVar210 + *(float *)pauVar10[1];
          local_5e0._0_4_ =
               fVar277 * fVar295 +
               (float)local_880._0_4_ * auVar326._0_4_ +
               fVar255 * (float)local_4a0._0_4_ + (float)local_4c0._0_4_ * fVar187;
          local_5e0._4_4_ =
               fVar279 * fVar297 +
               (float)local_880._4_4_ * auVar326._4_4_ +
               fVar260 * (float)local_4a0._4_4_ + (float)local_4c0._4_4_ * fVar205;
          local_5e0._8_4_ =
               fVar280 * fVar298 +
               fStack_878 * auVar326._8_4_ + fVar275 * fStack_498 + fStack_4b8 * fVar207;
          local_5e0._12_4_ =
               fVar281 * fVar299 +
               fStack_874 * auVar326._12_4_ + fVar214 * fStack_494 + fStack_4b4 * fVar209;
          local_5e0._16_4_ =
               fVar283 * fVar338 +
               (float)auStack_870._0_4_ * auVar326._16_4_ +
               fVar314 * fStack_490 + fStack_4b0 * fStack_530;
          local_5e0._20_4_ =
               fVar291 * fVar254 +
               (float)auStack_870._4_4_ * auVar326._20_4_ +
               fVar181 * fStack_48c + fStack_4ac * fStack_52c;
          local_5e0._24_4_ =
               fVar293 * fVar369 +
               fStack_868 * auVar326._24_4_ + fVar185 * fStack_488 + fStack_4a8 * fStack_528;
          local_5e0._28_4_ = fVar210 + fStack_524 + fVar282;
          local_600._0_4_ =
               (float)local_120._0_4_ * fVar295 +
               fVar417 * (float)local_880._0_4_ +
               fVar255 * (float)local_7e0._0_4_ + fVar235 * fVar187;
          local_600._4_4_ =
               (float)local_120._4_4_ * fVar297 +
               fVar422 * (float)local_880._4_4_ +
               fVar260 * (float)local_7e0._4_4_ + fVar249 * fVar205;
          local_600._8_4_ =
               fStack_118 * fVar298 +
               fVar317 * fStack_878 + fVar275 * fStack_7d8 + fVar234 * fVar207;
          local_600._12_4_ =
               fStack_114 * fVar299 +
               fVar328 * fStack_874 + fVar214 * fStack_7d4 + fVar251 * fVar209;
          local_600._16_4_ =
               fStack_110 * fVar338 +
               fVar250 * (float)auStack_870._0_4_ + fVar314 * fStack_7d0 + fVar253 * fStack_530;
          local_600._20_4_ =
               fStack_10c * fVar254 +
               fVar252 * (float)auStack_870._4_4_ + fVar181 * fStack_7cc + fVar258 * fStack_52c;
          local_600._24_4_ =
               fStack_108 * fVar369 +
               fVar257 * fStack_868 + fVar185 * fStack_7c8 + fVar272 * fStack_528;
          local_600._28_4_ = fVar282 + fVar210 + fVar210 + fVar211;
          auVar325._0_4_ =
               (float)local_c0._0_4_ * (float)local_880._0_4_ +
               (float)local_a0._0_4_ * fVar255 + fVar187 * (float)local_140._0_4_ +
               fVar295 * (float)local_160._0_4_;
          auVar325._4_4_ =
               (float)local_c0._4_4_ * (float)local_880._4_4_ +
               (float)local_a0._4_4_ * fVar260 + fVar205 * (float)local_140._4_4_ +
               fVar297 * (float)local_160._4_4_;
          auVar325._8_4_ =
               fStack_b8 * fStack_878 + fStack_98 * fVar275 + fVar207 * fStack_138 +
               fVar298 * fStack_158;
          auVar325._12_4_ =
               fStack_b4 * fStack_874 + fStack_94 * fVar214 + fVar209 * fStack_134 +
               fVar299 * fStack_154;
          auVar325._16_4_ =
               fStack_b0 * (float)auStack_870._0_4_ + fStack_90 * fVar314 + fStack_530 * fStack_130
               + fVar338 * fStack_150;
          auVar325._20_4_ =
               fStack_ac * (float)auStack_870._4_4_ + fStack_8c * fVar181 + fStack_52c * fStack_12c
               + fVar254 * fStack_14c;
          auVar325._24_4_ =
               fStack_a8 * fStack_868 + fStack_88 * fVar185 + fStack_528 * fStack_128 +
               fVar369 * fStack_148;
          auVar325._28_4_ = fVar210 + fVar210 + fStack_524 + fVar282;
          auVar178 = vsubps_avx(local_5e0,auVar408);
          auVar345 = vsubps_avx(local_600,local_700);
          fVar258 = auVar178._0_4_;
          fVar260 = auVar178._4_4_;
          auVar88._4_4_ = fVar260 * local_700._4_4_;
          auVar88._0_4_ = fVar258 * local_700._0_4_;
          fVar272 = auVar178._8_4_;
          auVar88._8_4_ = fVar272 * local_700._8_4_;
          fVar275 = auVar178._12_4_;
          auVar88._12_4_ = fVar275 * local_700._12_4_;
          fVar277 = auVar178._16_4_;
          auVar88._16_4_ = fVar277 * local_700._16_4_;
          fVar279 = auVar178._20_4_;
          auVar88._20_4_ = fVar279 * local_700._20_4_;
          fVar280 = auVar178._24_4_;
          auVar88._24_4_ = fVar280 * local_700._24_4_;
          auVar88._28_4_ = fVar282;
          fVar235 = auVar345._0_4_;
          fVar249 = auVar345._4_4_;
          auVar89._4_4_ = auVar408._4_4_ * fVar249;
          auVar89._0_4_ = auVar408._0_4_ * fVar235;
          fVar234 = auVar345._8_4_;
          auVar89._8_4_ = auVar408._8_4_ * fVar234;
          fVar251 = auVar345._12_4_;
          auVar89._12_4_ = auVar408._12_4_ * fVar251;
          fVar211 = auVar345._16_4_;
          auVar89._16_4_ = auVar408._16_4_ * fVar211;
          fVar253 = auVar345._20_4_;
          auVar89._20_4_ = auVar408._20_4_ * fVar253;
          fVar255 = auVar345._24_4_;
          auVar89._24_4_ = auVar408._24_4_ * fVar255;
          auVar89._28_4_ = local_600._28_4_;
          auVar172 = vsubps_avx(auVar88,auVar89);
          auVar139._4_4_ = fVar182;
          auVar139._0_4_ = fVar161;
          auVar139._8_4_ = fStack_818;
          auVar139._12_4_ = fStack_814;
          auVar139._16_4_ = fStack_810;
          auVar139._20_4_ = fStack_80c;
          auVar139._24_4_ = fStack_808;
          auVar139._28_4_ = fStack_804;
          auVar180 = ZEXT3264(auVar139);
          auVar164 = vmaxps_avx(auVar139,auVar325);
          auVar90._4_4_ = auVar164._4_4_ * auVar164._4_4_ * (fVar260 * fVar260 + fVar249 * fVar249);
          auVar90._0_4_ = auVar164._0_4_ * auVar164._0_4_ * (fVar258 * fVar258 + fVar235 * fVar235);
          auVar90._8_4_ = auVar164._8_4_ * auVar164._8_4_ * (fVar272 * fVar272 + fVar234 * fVar234);
          auVar90._12_4_ =
               auVar164._12_4_ * auVar164._12_4_ * (fVar275 * fVar275 + fVar251 * fVar251);
          auVar90._16_4_ =
               auVar164._16_4_ * auVar164._16_4_ * (fVar277 * fVar277 + fVar211 * fVar211);
          auVar90._20_4_ =
               auVar164._20_4_ * auVar164._20_4_ * (fVar279 * fVar279 + fVar253 * fVar253);
          auVar90._24_4_ =
               auVar164._24_4_ * auVar164._24_4_ * (fVar280 * fVar280 + fVar255 * fVar255);
          auVar90._28_4_ = local_5e0._28_4_ + local_600._28_4_;
          auVar91._4_4_ = auVar172._4_4_ * auVar172._4_4_;
          auVar91._0_4_ = auVar172._0_4_ * auVar172._0_4_;
          auVar91._8_4_ = auVar172._8_4_ * auVar172._8_4_;
          auVar91._12_4_ = auVar172._12_4_ * auVar172._12_4_;
          auVar91._16_4_ = auVar172._16_4_ * auVar172._16_4_;
          auVar91._20_4_ = auVar172._20_4_ * auVar172._20_4_;
          auVar91._24_4_ = auVar172._24_4_ * auVar172._24_4_;
          auVar91._28_4_ = auVar172._28_4_;
          local_300 = vcmpps_avx(auVar91,auVar90,2);
          local_240 = (uint)lVar159;
          auVar220 = vpshufd_avx(ZEXT416(local_240),0);
          auVar286 = vpor_avx(auVar220,_DAT_01f7fcf0);
          auVar220 = vpor_avx(auVar220,_DAT_01fafea0);
          auVar286 = vpcmpgtd_avx(local_320._0_16_,auVar286);
          auVar309 = ZEXT1664(auVar286);
          auVar220 = vpcmpgtd_avx(local_320._0_16_,auVar220);
          auVar246._16_16_ = auVar220;
          auVar246._0_16_ = auVar286;
          auVar248 = ZEXT3264(auVar246);
          auVar164 = auVar246 & local_300;
          fVar235 = (float)local_5c0._0_4_;
          fVar249 = (float)local_5c0._4_4_;
          fVar234 = fStack_5b8;
          fVar251 = fStack_5b4;
          fVar253 = fStack_5b0;
          fVar258 = fStack_5ac;
          fVar272 = fStack_5a8;
          fVar277 = (float)local_680._0_4_;
          fVar279 = (float)local_680._4_4_;
          fVar280 = fStack_678;
          fVar281 = fStack_674;
          fVar283 = fStack_670;
          fVar291 = fStack_66c;
          fVar293 = fStack_668;
          fVar316 = (float)local_7e0._0_4_;
          fVar228 = (float)local_7e0._4_4_;
          fVar230 = fStack_7d8;
          fVar232 = fStack_7d4;
          fVar255 = fStack_7d0;
          fVar260 = fStack_7cc;
          fVar275 = fStack_7c8;
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            local_4e0._0_4_ = auVar148._0_4_;
            local_4e0._4_4_ = auVar148._4_4_;
            fStack_4d8 = auVar148._8_4_;
            fStack_4d4 = auVar148._12_4_;
            fStack_4d0 = auVar148._16_4_;
            fStack_4cc = auVar148._20_4_;
            fStack_4c8 = auVar148._24_4_;
            local_540 = fVar295 * (float)local_720._0_4_ +
                        (float)local_880._0_4_ * (float)local_2e0._0_4_ +
                        (float)local_e0._0_4_ * (float)local_4e0._0_4_ +
                        (float)local_800._0_4_ * fVar187;
            fStack_53c = fVar297 * (float)local_720._4_4_ +
                         (float)local_880._4_4_ * (float)local_2e0._4_4_ +
                         (float)local_e0._4_4_ * (float)local_4e0._4_4_ +
                         (float)local_800._4_4_ * fVar205;
            fStack_538 = fVar298 * fStack_718 +
                         fStack_878 * fStack_2d8 + fStack_d8 * fStack_4d8 + fStack_7f8 * fVar207;
            fStack_534 = fVar299 * fStack_714 +
                         fStack_874 * fStack_2d4 + fStack_d4 * fStack_4d4 + fStack_7f4 * fVar209;
            fStack_530 = fVar338 * fStack_710 +
                         (float)auStack_870._0_4_ * fStack_2d0 +
                         fStack_d0 * fStack_4d0 + fStack_7f0 * fStack_530;
            fStack_52c = fVar254 * fStack_70c +
                         (float)auStack_870._4_4_ * fStack_2cc +
                         fStack_cc * fStack_4cc + fStack_7ec * fStack_52c;
            fStack_528 = fVar369 * fStack_708 +
                         fStack_868 * fStack_2c8 + fStack_c8 * fStack_4c8 + fStack_7e8 * fStack_528;
            fStack_524 = pfVar1[7] + fStack_804 + local_300._28_4_ + 0.0;
            local_6e0._0_4_ = auVar145._0_4_;
            local_6e0._4_4_ = auVar145._4_4_;
            fStack_6d8 = auVar145._8_4_;
            fStack_6d4 = auVar145._12_4_;
            fStack_6d0 = auVar145._16_4_;
            fStack_6cc = auVar145._20_4_;
            fStack_6c8 = auVar145._24_4_;
            fVar187 = (float)local_e0._0_4_ * (float)local_6e0._0_4_;
            fVar205 = (float)local_e0._4_4_ * (float)local_6e0._4_4_;
            fVar207 = fStack_d8 * fStack_6d8;
            fVar209 = fStack_d4 * fStack_6d4;
            fVar282 = fStack_d0 * fStack_6d0;
            fVar210 = fStack_cc * fStack_6cc;
            fVar212 = fStack_c8 * fStack_6c8;
            pfVar1 = (float *)(lVar155 + 0x21b0640 + lVar159 * 4);
            fVar235 = *pfVar1;
            fVar249 = pfVar1[1];
            fVar234 = pfVar1[2];
            fVar251 = pfVar1[3];
            fVar211 = pfVar1[4];
            fVar253 = pfVar1[5];
            fVar255 = pfVar1[6];
            pfVar2 = (float *)(lVar155 + 0x21b0ac4 + lVar159 * 4);
            fVar258 = *pfVar2;
            fVar260 = pfVar2[1];
            fVar272 = pfVar2[2];
            fVar275 = pfVar2[3];
            fVar277 = pfVar2[4];
            fVar279 = pfVar2[5];
            fVar280 = pfVar2[6];
            pfVar3 = (float *)(lVar155 + 0x21b01bc + lVar159 * 4);
            fVar281 = *pfVar3;
            fVar283 = pfVar3[1];
            fVar291 = pfVar3[2];
            fVar293 = pfVar3[3];
            fVar295 = pfVar3[4];
            fVar297 = pfVar3[5];
            fVar298 = pfVar3[6];
            fVar185 = pfVar1[7] + pfVar2[7];
            fVar215 = pfVar2[7] + auVar408._28_4_ + 0.0;
            fVar316 = auVar408._28_4_ + fStack_104 + auVar408._28_4_ + 0.0;
            pfVar1 = (float *)(lVar155 + 0x21afd38 + lVar159 * 4);
            fVar299 = *pfVar1;
            fVar338 = pfVar1[1];
            fVar254 = pfVar1[2];
            fVar369 = pfVar1[3];
            fVar214 = pfVar1[4];
            fVar314 = pfVar1[5];
            fVar181 = pfVar1[6];
            local_6e0._4_4_ =
                 fVar338 * (float)local_680._4_4_ +
                 fVar283 * (float)local_640._4_4_ +
                 fVar249 * (float)local_4a0._4_4_ + (float)local_4c0._4_4_ * fVar260;
            local_6e0._0_4_ =
                 fVar299 * (float)local_680._0_4_ +
                 fVar281 * (float)local_640._0_4_ +
                 fVar235 * (float)local_4a0._0_4_ + (float)local_4c0._0_4_ * fVar258;
            fStack_6d8 = fVar254 * fStack_678 +
                         fVar291 * fStack_638 + fVar234 * fStack_498 + fStack_4b8 * fVar272;
            fStack_6d4 = fVar369 * fStack_674 +
                         fVar293 * fStack_634 + fVar251 * fStack_494 + fStack_4b4 * fVar275;
            fStack_6d0 = fVar214 * fStack_670 +
                         fVar295 * fStack_630 + fVar211 * fStack_490 + fStack_4b0 * fVar277;
            fStack_6cc = fVar314 * fStack_66c +
                         fVar297 * fStack_62c + fVar253 * fStack_48c + fStack_4ac * fVar279;
            fStack_6c8 = fVar181 * fStack_668 +
                         fVar298 * fStack_628 + fVar255 * fStack_488 + fStack_4a8 * fVar280;
            fStack_6c4 = fVar185 + fVar215;
            auVar199._0_4_ =
                 fVar299 * (float)local_120._0_4_ +
                 (float)local_7e0._0_4_ * fVar235 + (float)local_5c0._0_4_ * fVar258 +
                 fVar417 * fVar281;
            auVar199._4_4_ =
                 fVar338 * (float)local_120._4_4_ +
                 (float)local_7e0._4_4_ * fVar249 + (float)local_5c0._4_4_ * fVar260 +
                 fVar422 * fVar283;
            auVar199._8_4_ =
                 fVar254 * fStack_118 +
                 fStack_7d8 * fVar234 + fStack_5b8 * fVar272 + fVar317 * fVar291;
            auVar199._12_4_ =
                 fVar369 * fStack_114 +
                 fStack_7d4 * fVar251 + fStack_5b4 * fVar275 + fVar328 * fVar293;
            auVar199._16_4_ =
                 fVar214 * fStack_110 +
                 fStack_7d0 * fVar211 + fStack_5b0 * fVar277 + fVar250 * fVar295;
            auVar199._20_4_ =
                 fVar314 * fStack_10c +
                 fStack_7cc * fVar253 + fStack_5ac * fVar279 + fVar252 * fVar297;
            auVar199._24_4_ =
                 fVar181 * fStack_108 +
                 fStack_7c8 * fVar255 + fStack_5a8 * fVar280 + fVar257 * fVar298;
            auVar199._28_4_ = fVar215 + fVar316;
            auVar397._0_4_ =
                 fVar281 * (float)local_2e0._0_4_ +
                 (float)local_e0._0_4_ * fVar235 + (float)local_800._0_4_ * fVar258 +
                 fVar299 * (float)local_720._0_4_;
            auVar397._4_4_ =
                 fVar283 * (float)local_2e0._4_4_ +
                 (float)local_e0._4_4_ * fVar249 + (float)local_800._4_4_ * fVar260 +
                 fVar338 * (float)local_720._4_4_;
            auVar397._8_4_ =
                 fVar291 * fStack_2d8 + fStack_d8 * fVar234 + fStack_7f8 * fVar272 +
                 fVar254 * fStack_718;
            auVar397._12_4_ =
                 fVar293 * fStack_2d4 + fStack_d4 * fVar251 + fStack_7f4 * fVar275 +
                 fVar369 * fStack_714;
            auVar397._16_4_ =
                 fVar295 * fStack_2d0 + fStack_d0 * fVar211 + fStack_7f0 * fVar277 +
                 fVar214 * fStack_710;
            auVar397._20_4_ =
                 fVar297 * fStack_2cc + fStack_cc * fVar253 + fStack_7ec * fVar279 +
                 fVar314 * fStack_70c;
            auVar397._24_4_ =
                 fVar298 * fStack_2c8 + fStack_c8 * fVar255 + fStack_7e8 * fVar280 +
                 fVar181 * fStack_708;
            auVar397._28_4_ = pfVar3[7] + fVar185 + fVar316;
            pfVar1 = (float *)(lVar155 + 0x21b2a60 + lVar159 * 4);
            fVar235 = *pfVar1;
            fVar250 = pfVar1[1];
            fVar249 = pfVar1[2];
            fVar252 = pfVar1[3];
            fVar234 = pfVar1[4];
            fVar257 = pfVar1[5];
            fVar251 = pfVar1[6];
            pfVar2 = (float *)(lVar155 + 0x21b2ee4 + lVar159 * 4);
            fVar211 = *pfVar2;
            fVar253 = pfVar2[1];
            fVar255 = pfVar2[2];
            fVar258 = pfVar2[3];
            fVar260 = pfVar2[4];
            fVar272 = pfVar2[5];
            fVar275 = pfVar2[6];
            pfVar3 = (float *)(lVar155 + 0x21b25dc + lVar159 * 4);
            fVar277 = *pfVar3;
            fVar279 = pfVar3[1];
            fVar280 = pfVar3[2];
            fVar281 = pfVar3[3];
            fVar283 = pfVar3[4];
            fVar291 = pfVar3[5];
            fVar293 = pfVar3[6];
            pfVar4 = (float *)(lVar155 + 0x21b2158 + lVar159 * 4);
            fVar295 = *pfVar4;
            fVar297 = pfVar4[1];
            fVar298 = pfVar4[2];
            fVar299 = pfVar4[3];
            fVar338 = pfVar4[4];
            fVar254 = pfVar4[5];
            fVar369 = pfVar4[6];
            auVar346._0_4_ =
                 fVar295 * (float)local_680._0_4_ +
                 fVar277 * (float)local_640._0_4_ +
                 fVar235 * (float)local_4a0._0_4_ + (float)local_4c0._0_4_ * fVar211;
            auVar346._4_4_ =
                 fVar297 * (float)local_680._4_4_ +
                 fVar279 * (float)local_640._4_4_ +
                 fVar250 * (float)local_4a0._4_4_ + (float)local_4c0._4_4_ * fVar253;
            auVar346._8_4_ =
                 fVar298 * fStack_678 +
                 fVar280 * fStack_638 + fVar249 * fStack_498 + fStack_4b8 * fVar255;
            auVar346._12_4_ =
                 fVar299 * fStack_674 +
                 fVar281 * fStack_634 + fVar252 * fStack_494 + fStack_4b4 * fVar258;
            auVar346._16_4_ =
                 fVar338 * fStack_670 +
                 fVar283 * fStack_630 + fVar234 * fStack_490 + fStack_4b0 * fVar260;
            auVar346._20_4_ =
                 fVar254 * fStack_66c +
                 fVar291 * fStack_62c + fVar257 * fStack_48c + fStack_4ac * fVar272;
            auVar346._24_4_ =
                 fVar369 * fStack_668 +
                 fVar293 * fStack_628 + fVar251 * fStack_488 + fStack_4a8 * fVar275;
            auVar346._28_4_ = fStack_7c4 + fStack_7c4 + fStack_4a4 + fStack_7c4;
            auVar391._0_4_ =
                 fVar295 * (float)local_120._0_4_ +
                 fVar277 * (float)local_660._0_4_ +
                 (float)local_7e0._0_4_ * fVar235 + (float)local_5c0._0_4_ * fVar211;
            auVar391._4_4_ =
                 fVar297 * (float)local_120._4_4_ +
                 fVar279 * (float)local_660._4_4_ +
                 (float)local_7e0._4_4_ * fVar250 + (float)local_5c0._4_4_ * fVar253;
            auVar391._8_4_ =
                 fVar298 * fStack_118 +
                 fVar280 * fStack_658 + fStack_7d8 * fVar249 + fStack_5b8 * fVar255;
            auVar391._12_4_ =
                 fVar299 * fStack_114 +
                 fVar281 * fStack_654 + fStack_7d4 * fVar252 + fStack_5b4 * fVar258;
            auVar391._16_4_ =
                 fVar338 * fStack_110 +
                 fVar283 * fStack_650 + fStack_7d0 * fVar234 + fStack_5b0 * fVar260;
            auVar391._20_4_ =
                 fVar254 * fStack_10c +
                 fVar291 * fStack_64c + fStack_7cc * fVar257 + fStack_5ac * fVar272;
            auVar391._24_4_ =
                 fVar369 * fStack_108 +
                 fVar293 * fStack_648 + fStack_7c8 * fVar251 + fStack_5a8 * fVar275;
            auVar391._28_4_ = fStack_7c4 + fStack_7c4 + fStack_7c4 + fStack_7c4;
            auVar290._8_4_ = 0x7fffffff;
            auVar290._0_8_ = 0x7fffffff7fffffff;
            auVar290._12_4_ = 0x7fffffff;
            auVar290._16_4_ = 0x7fffffff;
            auVar290._20_4_ = 0x7fffffff;
            auVar290._24_4_ = 0x7fffffff;
            auVar290._28_4_ = 0x7fffffff;
            auVar164 = vandps_avx(_local_6e0,auVar290);
            auVar172 = vandps_avx(auVar199,auVar290);
            auVar172 = vmaxps_avx(auVar164,auVar172);
            auVar164 = vandps_avx(auVar397,auVar290);
            auVar172 = vmaxps_avx(auVar172,auVar164);
            auVar172 = vcmpps_avx(auVar172,_local_340,1);
            auVar40 = vblendvps_avx(_local_6e0,auVar178,auVar172);
            auVar174._0_4_ =
                 fVar295 * (float)local_720._0_4_ +
                 fVar277 * (float)local_2e0._0_4_ +
                 fVar211 * (float)local_800._0_4_ + (float)local_e0._0_4_ * fVar235;
            auVar174._4_4_ =
                 fVar297 * (float)local_720._4_4_ +
                 fVar279 * (float)local_2e0._4_4_ +
                 fVar253 * (float)local_800._4_4_ + (float)local_e0._4_4_ * fVar250;
            auVar174._8_4_ =
                 fVar298 * fStack_718 +
                 fVar280 * fStack_2d8 + fVar255 * fStack_7f8 + fStack_d8 * fVar249;
            auVar174._12_4_ =
                 fVar299 * fStack_714 +
                 fVar281 * fStack_2d4 + fVar258 * fStack_7f4 + fStack_d4 * fVar252;
            auVar174._16_4_ =
                 fVar338 * fStack_710 +
                 fVar283 * fStack_2d0 + fVar260 * fStack_7f0 + fStack_d0 * fVar234;
            auVar174._20_4_ =
                 fVar254 * fStack_70c +
                 fVar291 * fStack_2cc + fVar272 * fStack_7ec + fStack_cc * fVar257;
            auVar174._24_4_ =
                 fVar369 * fStack_708 +
                 fVar293 * fStack_2c8 + fVar275 * fStack_7e8 + fStack_c8 * fVar251;
            auVar174._28_4_ = auVar164._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar41 = vblendvps_avx(auVar199,auVar345,auVar172);
            auVar164 = vandps_avx(auVar346,auVar290);
            auVar172 = vandps_avx(auVar391,auVar290);
            auVar42 = vmaxps_avx(auVar164,auVar172);
            auVar164 = vandps_avx(auVar174,auVar290);
            auVar164 = vmaxps_avx(auVar42,auVar164);
            local_6a0._0_4_ = auVar146._0_4_;
            local_6a0._4_4_ = auVar146._4_4_;
            fStack_698 = auVar146._8_4_;
            fStack_694 = auVar146._12_4_;
            auStack_690._0_4_ = auVar146._16_4_;
            auStack_690._4_4_ = auVar146._20_4_;
            fStack_688 = auVar146._24_4_;
            auVar172 = vcmpps_avx(auVar164,_local_340,1);
            auVar164 = vblendvps_avx(auVar346,auVar178,auVar172);
            auVar175._0_4_ =
                 (float)local_720._0_4_ * (float)local_6a0._0_4_ +
                 (float)local_2e0._0_4_ * fVar352 + fVar187 + (float)local_800._0_4_ * local_620;
            auVar175._4_4_ =
                 (float)local_720._4_4_ * (float)local_6a0._4_4_ +
                 (float)local_2e0._4_4_ * fVar313 + fVar205 + (float)local_800._4_4_ * fStack_61c;
            auVar175._8_4_ =
                 fStack_718 * fStack_698 + fStack_2d8 * fVar256 + fVar207 + fStack_7f8 * fStack_618;
            auVar175._12_4_ =
                 fStack_714 * fStack_694 + fStack_2d4 * fVar371 + fVar209 + fStack_7f4 * fStack_614;
            auVar175._16_4_ =
                 fStack_710 * (float)auStack_690._0_4_ +
                 fStack_2d0 * fVar368 + fVar282 + fStack_7f0 * fStack_610;
            auVar175._20_4_ =
                 fStack_70c * (float)auStack_690._4_4_ +
                 fStack_2cc * fVar370 + fVar210 + fStack_7ec * fStack_60c;
            auVar175._24_4_ =
                 fStack_708 * fStack_688 + fStack_2c8 * fVar259 + fVar212 + fStack_7e8 * fStack_608;
            auVar175._28_4_ = auVar42._28_4_ + fStack_524 + local_300._28_4_ + 0.0;
            auVar172 = vblendvps_avx(auVar391,auVar345,auVar172);
            fVar214 = auVar40._0_4_;
            fVar314 = auVar40._4_4_;
            fVar181 = auVar40._8_4_;
            fVar185 = auVar40._12_4_;
            fVar187 = auVar40._16_4_;
            fVar205 = auVar40._20_4_;
            fVar207 = auVar40._24_4_;
            fVar209 = auVar40._28_4_;
            fVar277 = auVar164._0_4_;
            fVar280 = auVar164._4_4_;
            fVar283 = auVar164._8_4_;
            fVar293 = auVar164._12_4_;
            fVar297 = auVar164._16_4_;
            fVar299 = auVar164._20_4_;
            fVar254 = auVar164._24_4_;
            fVar235 = auVar41._0_4_;
            fVar249 = auVar41._4_4_;
            fVar234 = auVar41._8_4_;
            fVar251 = auVar41._12_4_;
            fVar253 = auVar41._16_4_;
            fVar258 = auVar41._20_4_;
            fVar272 = auVar41._24_4_;
            auVar359._0_4_ = fVar235 * fVar235 + fVar214 * fVar214;
            auVar359._4_4_ = fVar249 * fVar249 + fVar314 * fVar314;
            auVar359._8_4_ = fVar234 * fVar234 + fVar181 * fVar181;
            auVar359._12_4_ = fVar251 * fVar251 + fVar185 * fVar185;
            auVar359._16_4_ = fVar253 * fVar253 + fVar187 * fVar187;
            auVar359._20_4_ = fVar258 * fVar258 + fVar205 * fVar205;
            auVar359._24_4_ = fVar272 * fVar272 + fVar207 * fVar207;
            auVar359._28_4_ = auVar178._28_4_ + auVar345._28_4_;
            auVar178 = vrsqrtps_avx(auVar359);
            fVar250 = auVar178._0_4_;
            fVar252 = auVar178._4_4_;
            auVar92._4_4_ = fVar252 * 1.5;
            auVar92._0_4_ = fVar250 * 1.5;
            fVar257 = auVar178._8_4_;
            auVar92._8_4_ = fVar257 * 1.5;
            fVar211 = auVar178._12_4_;
            auVar92._12_4_ = fVar211 * 1.5;
            fVar255 = auVar178._16_4_;
            auVar92._16_4_ = fVar255 * 1.5;
            fVar260 = auVar178._20_4_;
            auVar92._20_4_ = fVar260 * 1.5;
            fVar275 = auVar178._24_4_;
            auVar92._24_4_ = fVar275 * 1.5;
            auVar92._28_4_ = auVar391._28_4_;
            auVar93._4_4_ = fVar252 * fVar252 * fVar252 * auVar359._4_4_ * 0.5;
            auVar93._0_4_ = fVar250 * fVar250 * fVar250 * auVar359._0_4_ * 0.5;
            auVar93._8_4_ = fVar257 * fVar257 * fVar257 * auVar359._8_4_ * 0.5;
            auVar93._12_4_ = fVar211 * fVar211 * fVar211 * auVar359._12_4_ * 0.5;
            auVar93._16_4_ = fVar255 * fVar255 * fVar255 * auVar359._16_4_ * 0.5;
            auVar93._20_4_ = fVar260 * fVar260 * fVar260 * auVar359._20_4_ * 0.5;
            auVar93._24_4_ = fVar275 * fVar275 * fVar275 * auVar359._24_4_ * 0.5;
            auVar93._28_4_ = auVar359._28_4_;
            auVar345 = vsubps_avx(auVar92,auVar93);
            fVar352 = auVar345._0_4_;
            fVar313 = auVar345._4_4_;
            fVar256 = auVar345._8_4_;
            fVar371 = auVar345._12_4_;
            fVar368 = auVar345._16_4_;
            fVar370 = auVar345._20_4_;
            fVar259 = auVar345._24_4_;
            fVar250 = auVar172._0_4_;
            fVar252 = auVar172._4_4_;
            fVar257 = auVar172._8_4_;
            fVar211 = auVar172._12_4_;
            fVar255 = auVar172._16_4_;
            fVar260 = auVar172._20_4_;
            fVar275 = auVar172._24_4_;
            auVar336._0_4_ = fVar250 * fVar250 + fVar277 * fVar277;
            auVar336._4_4_ = fVar252 * fVar252 + fVar280 * fVar280;
            auVar336._8_4_ = fVar257 * fVar257 + fVar283 * fVar283;
            auVar336._12_4_ = fVar211 * fVar211 + fVar293 * fVar293;
            auVar336._16_4_ = fVar255 * fVar255 + fVar297 * fVar297;
            auVar336._20_4_ = fVar260 * fVar260 + fVar299 * fVar299;
            auVar336._24_4_ = fVar275 * fVar275 + fVar254 * fVar254;
            auVar336._28_4_ = auVar178._28_4_ + auVar164._28_4_;
            auVar164 = vrsqrtps_avx(auVar336);
            fVar279 = auVar164._0_4_;
            fVar281 = auVar164._4_4_;
            auVar94._4_4_ = fVar281 * 1.5;
            auVar94._0_4_ = fVar279 * 1.5;
            fVar291 = auVar164._8_4_;
            auVar94._8_4_ = fVar291 * 1.5;
            fVar295 = auVar164._12_4_;
            auVar94._12_4_ = fVar295 * 1.5;
            fVar298 = auVar164._16_4_;
            auVar94._16_4_ = fVar298 * 1.5;
            fVar338 = auVar164._20_4_;
            auVar94._20_4_ = fVar338 * 1.5;
            fVar369 = auVar164._24_4_;
            auVar94._24_4_ = fVar369 * 1.5;
            auVar94._28_4_ = auVar391._28_4_;
            auVar95._4_4_ = fVar281 * fVar281 * fVar281 * auVar336._4_4_ * 0.5;
            auVar95._0_4_ = fVar279 * fVar279 * fVar279 * auVar336._0_4_ * 0.5;
            auVar95._8_4_ = fVar291 * fVar291 * fVar291 * auVar336._8_4_ * 0.5;
            auVar95._12_4_ = fVar295 * fVar295 * fVar295 * auVar336._12_4_ * 0.5;
            auVar95._16_4_ = fVar298 * fVar298 * fVar298 * auVar336._16_4_ * 0.5;
            auVar95._20_4_ = fVar338 * fVar338 * fVar338 * auVar336._20_4_ * 0.5;
            auVar95._24_4_ = fVar369 * fVar369 * fVar369 * auVar336._24_4_ * 0.5;
            auVar95._28_4_ = auVar336._28_4_;
            auVar178 = vsubps_avx(auVar94,auVar95);
            fVar279 = auVar178._0_4_;
            fVar281 = auVar178._4_4_;
            fVar291 = auVar178._8_4_;
            fVar295 = auVar178._12_4_;
            fVar298 = auVar178._16_4_;
            fVar338 = auVar178._20_4_;
            fVar369 = auVar178._24_4_;
            fVar235 = fVar161 * fVar352 * fVar235;
            fVar249 = fVar182 * fVar313 * fVar249;
            auVar96._4_4_ = fVar249;
            auVar96._0_4_ = fVar235;
            fVar234 = fStack_818 * fVar256 * fVar234;
            auVar96._8_4_ = fVar234;
            fVar251 = fStack_814 * fVar371 * fVar251;
            auVar96._12_4_ = fVar251;
            fVar253 = fStack_810 * fVar368 * fVar253;
            auVar96._16_4_ = fVar253;
            fVar258 = fStack_80c * fVar370 * fVar258;
            auVar96._20_4_ = fVar258;
            fVar272 = fStack_808 * fVar259 * fVar272;
            auVar96._24_4_ = fVar272;
            auVar96._28_4_ = auVar164._28_4_;
            local_6a0._4_4_ = fVar249 + auVar408._4_4_;
            local_6a0._0_4_ = fVar235 + auVar408._0_4_;
            fStack_698 = fVar234 + auVar408._8_4_;
            fStack_694 = fVar251 + auVar408._12_4_;
            auStack_690._0_4_ = fVar253 + auVar408._16_4_;
            auStack_690._4_4_ = fVar258 + auVar408._20_4_;
            fStack_688 = fVar272 + auVar408._24_4_;
            fStack_684 = auVar164._28_4_ + auVar408._28_4_;
            local_6c0 = fVar161 * fVar352 * -fVar214;
            fStack_6bc = fVar182 * fVar313 * -fVar314;
            auVar97._4_4_ = fStack_6bc;
            auVar97._0_4_ = local_6c0;
            fStack_6b8 = fStack_818 * fVar256 * -fVar181;
            auVar97._8_4_ = fStack_6b8;
            fStack_6b4 = fStack_814 * fVar371 * -fVar185;
            auVar97._12_4_ = fStack_6b4;
            fStack_6b0 = fStack_810 * fVar368 * -fVar187;
            auVar97._16_4_ = fStack_6b0;
            fStack_6ac = fStack_80c * fVar370 * -fVar205;
            auVar97._20_4_ = fStack_6ac;
            fStack_6a8 = fStack_808 * fVar259 * -fVar207;
            auVar97._24_4_ = fStack_6a8;
            auVar97._28_4_ = -fVar209;
            local_6c0 = local_700._0_4_ + local_6c0;
            fStack_6bc = local_700._4_4_ + fStack_6bc;
            fStack_6b8 = local_700._8_4_ + fStack_6b8;
            fStack_6b4 = local_700._12_4_ + fStack_6b4;
            fStack_6b0 = local_700._16_4_ + fStack_6b0;
            fStack_6ac = local_700._20_4_ + fStack_6ac;
            fStack_6a8 = local_700._24_4_ + fStack_6a8;
            fStack_6a4 = local_700._28_4_ + -fVar209;
            fVar235 = fVar352 * 0.0 * fVar161;
            fVar249 = fVar313 * 0.0 * fVar182;
            auVar98._4_4_ = fVar249;
            auVar98._0_4_ = fVar235;
            fVar234 = fVar256 * 0.0 * fStack_818;
            auVar98._8_4_ = fVar234;
            fVar251 = fVar371 * 0.0 * fStack_814;
            auVar98._12_4_ = fVar251;
            fVar253 = fVar368 * 0.0 * fStack_810;
            auVar98._16_4_ = fVar253;
            fVar258 = fVar370 * 0.0 * fStack_80c;
            auVar98._20_4_ = fVar258;
            fVar272 = fVar259 * 0.0 * fStack_808;
            auVar98._24_4_ = fVar272;
            auVar98._28_4_ = fVar209;
            auVar42 = vsubps_avx(auVar408,auVar96);
            auVar420._0_4_ = fVar235 + auVar175._0_4_;
            auVar420._4_4_ = fVar249 + auVar175._4_4_;
            auVar420._8_4_ = fVar234 + auVar175._8_4_;
            auVar420._12_4_ = fVar251 + auVar175._12_4_;
            auVar420._16_4_ = fVar253 + auVar175._16_4_;
            auVar420._20_4_ = fVar258 + auVar175._20_4_;
            auVar420._24_4_ = fVar272 + auVar175._24_4_;
            auVar420._28_4_ = fVar209 + auVar175._28_4_;
            fVar235 = auVar325._0_4_ * fVar279 * fVar250;
            fVar250 = auVar325._4_4_ * fVar281 * fVar252;
            auVar99._4_4_ = fVar250;
            auVar99._0_4_ = fVar235;
            fVar249 = auVar325._8_4_ * fVar291 * fVar257;
            auVar99._8_4_ = fVar249;
            fVar252 = auVar325._12_4_ * fVar295 * fVar211;
            auVar99._12_4_ = fVar252;
            fVar234 = auVar325._16_4_ * fVar298 * fVar255;
            auVar99._16_4_ = fVar234;
            fVar257 = auVar325._20_4_ * fVar338 * fVar260;
            auVar99._20_4_ = fVar257;
            fVar251 = auVar325._24_4_ * fVar369 * fVar275;
            auVar99._24_4_ = fVar251;
            auVar99._28_4_ = fStack_804;
            auVar46 = vsubps_avx(local_700,auVar97);
            auVar398._0_4_ = local_5e0._0_4_ + fVar235;
            auVar398._4_4_ = local_5e0._4_4_ + fVar250;
            auVar398._8_4_ = local_5e0._8_4_ + fVar249;
            auVar398._12_4_ = local_5e0._12_4_ + fVar252;
            auVar398._16_4_ = local_5e0._16_4_ + fVar234;
            auVar398._20_4_ = local_5e0._20_4_ + fVar257;
            auVar398._24_4_ = local_5e0._24_4_ + fVar251;
            auVar398._28_4_ = local_5e0._28_4_ + fStack_804;
            fVar235 = fVar279 * -fVar277 * auVar325._0_4_;
            fVar250 = fVar281 * -fVar280 * auVar325._4_4_;
            auVar100._4_4_ = fVar250;
            auVar100._0_4_ = fVar235;
            fVar249 = fVar291 * -fVar283 * auVar325._8_4_;
            auVar100._8_4_ = fVar249;
            fVar252 = fVar295 * -fVar293 * auVar325._12_4_;
            auVar100._12_4_ = fVar252;
            fVar234 = fVar298 * -fVar297 * auVar325._16_4_;
            auVar100._16_4_ = fVar234;
            fVar257 = fVar338 * -fVar299 * auVar325._20_4_;
            auVar100._20_4_ = fVar257;
            fVar251 = fVar369 * -fVar254 * auVar325._24_4_;
            auVar100._24_4_ = fVar251;
            auVar100._28_4_ = auVar408._28_4_;
            auVar165 = vsubps_avx(auVar175,auVar98);
            auVar271._0_4_ = local_600._0_4_ + fVar235;
            auVar271._4_4_ = local_600._4_4_ + fVar250;
            auVar271._8_4_ = local_600._8_4_ + fVar249;
            auVar271._12_4_ = local_600._12_4_ + fVar252;
            auVar271._16_4_ = local_600._16_4_ + fVar234;
            auVar271._20_4_ = local_600._20_4_ + fVar257;
            auVar271._24_4_ = local_600._24_4_ + fVar251;
            auVar271._28_4_ = local_600._28_4_ + auVar408._28_4_;
            fVar235 = fVar279 * 0.0 * auVar325._0_4_;
            fVar250 = fVar281 * 0.0 * auVar325._4_4_;
            auVar101._4_4_ = fVar250;
            auVar101._0_4_ = fVar235;
            fVar249 = fVar291 * 0.0 * auVar325._8_4_;
            auVar101._8_4_ = fVar249;
            fVar252 = fVar295 * 0.0 * auVar325._12_4_;
            auVar101._12_4_ = fVar252;
            fVar234 = fVar298 * 0.0 * auVar325._16_4_;
            auVar101._16_4_ = fVar234;
            fVar257 = fVar338 * 0.0 * auVar325._20_4_;
            auVar101._20_4_ = fVar257;
            fVar251 = fVar369 * 0.0 * auVar325._24_4_;
            auVar101._24_4_ = fVar251;
            auVar101._28_4_ = auVar175._28_4_;
            auVar164 = vsubps_avx(local_5e0,auVar99);
            auVar144._4_4_ = fStack_53c;
            auVar144._0_4_ = local_540;
            auVar144._8_4_ = fStack_538;
            auVar144._12_4_ = fStack_534;
            auVar144._16_4_ = fStack_530;
            auVar144._20_4_ = fStack_52c;
            auVar144._24_4_ = fStack_528;
            auVar144._28_4_ = fStack_524;
            auVar347._0_4_ = local_540 + fVar235;
            auVar347._4_4_ = fStack_53c + fVar250;
            auVar347._8_4_ = fStack_538 + fVar249;
            auVar347._12_4_ = fStack_534 + fVar252;
            auVar347._16_4_ = fStack_530 + fVar234;
            auVar347._20_4_ = fStack_52c + fVar257;
            auVar347._24_4_ = fStack_528 + fVar251;
            auVar347._28_4_ = fStack_524 + auVar175._28_4_;
            auVar345 = vsubps_avx(local_600,auVar100);
            auVar172 = vsubps_avx(auVar144,auVar101);
            auVar40 = vsubps_avx(auVar271,auVar46);
            auVar41 = vsubps_avx(auVar347,auVar165);
            auVar102._4_4_ = auVar165._4_4_ * auVar40._4_4_;
            auVar102._0_4_ = auVar165._0_4_ * auVar40._0_4_;
            auVar102._8_4_ = auVar165._8_4_ * auVar40._8_4_;
            auVar102._12_4_ = auVar165._12_4_ * auVar40._12_4_;
            auVar102._16_4_ = auVar165._16_4_ * auVar40._16_4_;
            auVar102._20_4_ = auVar165._20_4_ * auVar40._20_4_;
            auVar102._24_4_ = auVar165._24_4_ * auVar40._24_4_;
            auVar102._28_4_ = auVar391._28_4_;
            auVar103._4_4_ = auVar46._4_4_ * auVar41._4_4_;
            auVar103._0_4_ = auVar46._0_4_ * auVar41._0_4_;
            auVar103._8_4_ = auVar46._8_4_ * auVar41._8_4_;
            auVar103._12_4_ = auVar46._12_4_ * auVar41._12_4_;
            auVar103._16_4_ = auVar46._16_4_ * auVar41._16_4_;
            auVar103._20_4_ = auVar46._20_4_ * auVar41._20_4_;
            auVar103._24_4_ = auVar46._24_4_ * auVar41._24_4_;
            auVar103._28_4_ = fStack_524;
            auVar43 = vsubps_avx(auVar103,auVar102);
            auVar104._4_4_ = auVar42._4_4_ * auVar41._4_4_;
            auVar104._0_4_ = auVar42._0_4_ * auVar41._0_4_;
            auVar104._8_4_ = auVar42._8_4_ * auVar41._8_4_;
            auVar104._12_4_ = auVar42._12_4_ * auVar41._12_4_;
            auVar104._16_4_ = auVar42._16_4_ * auVar41._16_4_;
            auVar104._20_4_ = auVar42._20_4_ * auVar41._20_4_;
            auVar104._24_4_ = auVar42._24_4_ * auVar41._24_4_;
            auVar104._28_4_ = auVar41._28_4_;
            auVar41 = vsubps_avx(auVar398,auVar42);
            auVar105._4_4_ = auVar165._4_4_ * auVar41._4_4_;
            auVar105._0_4_ = auVar165._0_4_ * auVar41._0_4_;
            auVar105._8_4_ = auVar165._8_4_ * auVar41._8_4_;
            auVar105._12_4_ = auVar165._12_4_ * auVar41._12_4_;
            auVar105._16_4_ = auVar165._16_4_ * auVar41._16_4_;
            auVar105._20_4_ = auVar165._20_4_ * auVar41._20_4_;
            auVar105._24_4_ = auVar165._24_4_ * auVar41._24_4_;
            auVar105._28_4_ = auVar178._28_4_;
            auVar44 = vsubps_avx(auVar105,auVar104);
            auVar106._4_4_ = auVar46._4_4_ * auVar41._4_4_;
            auVar106._0_4_ = auVar46._0_4_ * auVar41._0_4_;
            auVar106._8_4_ = auVar46._8_4_ * auVar41._8_4_;
            auVar106._12_4_ = auVar46._12_4_ * auVar41._12_4_;
            auVar106._16_4_ = auVar46._16_4_ * auVar41._16_4_;
            auVar106._20_4_ = auVar46._20_4_ * auVar41._20_4_;
            auVar106._24_4_ = auVar46._24_4_ * auVar41._24_4_;
            auVar106._28_4_ = auVar178._28_4_;
            auVar107._4_4_ = auVar42._4_4_ * auVar40._4_4_;
            auVar107._0_4_ = auVar42._0_4_ * auVar40._0_4_;
            auVar107._8_4_ = auVar42._8_4_ * auVar40._8_4_;
            auVar107._12_4_ = auVar42._12_4_ * auVar40._12_4_;
            auVar107._16_4_ = auVar42._16_4_ * auVar40._16_4_;
            auVar107._20_4_ = auVar42._20_4_ * auVar40._20_4_;
            auVar107._24_4_ = auVar42._24_4_ * auVar40._24_4_;
            auVar107._28_4_ = auVar40._28_4_;
            auVar178 = vsubps_avx(auVar107,auVar106);
            auVar200._0_4_ = auVar43._0_4_ * 0.0 + auVar178._0_4_ + auVar44._0_4_ * 0.0;
            auVar200._4_4_ = auVar43._4_4_ * 0.0 + auVar178._4_4_ + auVar44._4_4_ * 0.0;
            auVar200._8_4_ = auVar43._8_4_ * 0.0 + auVar178._8_4_ + auVar44._8_4_ * 0.0;
            auVar200._12_4_ = auVar43._12_4_ * 0.0 + auVar178._12_4_ + auVar44._12_4_ * 0.0;
            auVar200._16_4_ = auVar43._16_4_ * 0.0 + auVar178._16_4_ + auVar44._16_4_ * 0.0;
            auVar200._20_4_ = auVar43._20_4_ * 0.0 + auVar178._20_4_ + auVar44._20_4_ * 0.0;
            auVar200._24_4_ = auVar43._24_4_ * 0.0 + auVar178._24_4_ + auVar44._24_4_ * 0.0;
            auVar200._28_4_ = auVar43._28_4_ + auVar178._28_4_ + auVar44._28_4_;
            auVar39 = vcmpps_avx(auVar200,ZEXT832(0) << 0x20,2);
            auVar164 = vblendvps_avx(auVar164,_local_6a0,auVar39);
            auVar141._4_4_ = fStack_6bc;
            auVar141._0_4_ = local_6c0;
            auVar141._8_4_ = fStack_6b8;
            auVar141._12_4_ = fStack_6b4;
            auVar141._16_4_ = fStack_6b0;
            auVar141._20_4_ = fStack_6ac;
            auVar141._24_4_ = fStack_6a8;
            auVar141._28_4_ = fStack_6a4;
            auVar178 = vblendvps_avx(auVar345,auVar141,auVar39);
            auVar345 = vblendvps_avx(auVar172,auVar420,auVar39);
            auVar172 = vblendvps_avx(auVar42,auVar398,auVar39);
            auVar40 = vblendvps_avx(auVar46,auVar271,auVar39);
            auVar41 = vblendvps_avx(auVar165,auVar347,auVar39);
            auVar42 = vblendvps_avx(auVar398,auVar42,auVar39);
            auVar43 = vblendvps_avx(auVar271,auVar46,auVar39);
            auVar44 = vblendvps_avx(auVar347,auVar165,auVar39);
            local_700 = vandps_avx(local_300,auVar246);
            auVar42 = vsubps_avx(auVar42,auVar164);
            auVar166 = vsubps_avx(auVar43,auVar178);
            auVar44 = vsubps_avx(auVar44,auVar345);
            auVar193 = vsubps_avx(auVar178,auVar40);
            fVar235 = auVar166._0_4_;
            fVar317 = auVar345._0_4_;
            fVar211 = auVar166._4_4_;
            fVar328 = auVar345._4_4_;
            auVar108._4_4_ = fVar328 * fVar211;
            auVar108._0_4_ = fVar317 * fVar235;
            fVar277 = auVar166._8_4_;
            fVar316 = auVar345._8_4_;
            auVar108._8_4_ = fVar316 * fVar277;
            fVar295 = auVar166._12_4_;
            fVar228 = auVar345._12_4_;
            auVar108._12_4_ = fVar228 * fVar295;
            fVar352 = auVar166._16_4_;
            fVar230 = auVar345._16_4_;
            auVar108._16_4_ = fVar230 * fVar352;
            fVar214 = auVar166._20_4_;
            fVar232 = auVar345._20_4_;
            auVar108._20_4_ = fVar232 * fVar214;
            fVar209 = auVar166._24_4_;
            fVar160 = auVar345._24_4_;
            auVar108._24_4_ = fVar160 * fVar209;
            auVar108._28_4_ = auVar43._28_4_;
            fVar250 = auVar178._0_4_;
            fVar301 = auVar44._0_4_;
            fVar253 = auVar178._4_4_;
            fVar183 = auVar44._4_4_;
            auVar109._4_4_ = fVar183 * fVar253;
            auVar109._0_4_ = fVar301 * fVar250;
            fVar279 = auVar178._8_4_;
            fVar184 = auVar44._8_4_;
            auVar109._8_4_ = fVar184 * fVar279;
            fVar297 = auVar178._12_4_;
            fVar186 = auVar44._12_4_;
            auVar109._12_4_ = fVar186 * fVar297;
            fVar313 = auVar178._16_4_;
            fVar204 = auVar44._16_4_;
            auVar109._16_4_ = fVar204 * fVar313;
            fVar314 = auVar178._20_4_;
            fVar206 = auVar44._20_4_;
            auVar109._20_4_ = fVar206 * fVar314;
            fVar282 = auVar178._24_4_;
            fVar208 = auVar44._24_4_;
            uVar12 = auVar46._28_4_;
            auVar109._24_4_ = fVar208 * fVar282;
            auVar109._28_4_ = uVar12;
            auVar43 = vsubps_avx(auVar109,auVar108);
            fVar249 = auVar164._0_4_;
            fVar255 = auVar164._4_4_;
            auVar110._4_4_ = fVar183 * fVar255;
            auVar110._0_4_ = fVar301 * fVar249;
            fVar280 = auVar164._8_4_;
            auVar110._8_4_ = fVar184 * fVar280;
            fVar298 = auVar164._12_4_;
            auVar110._12_4_ = fVar186 * fVar298;
            fVar256 = auVar164._16_4_;
            auVar110._16_4_ = fVar204 * fVar256;
            fVar181 = auVar164._20_4_;
            auVar110._20_4_ = fVar206 * fVar181;
            fVar210 = auVar164._24_4_;
            auVar110._24_4_ = fVar208 * fVar210;
            auVar110._28_4_ = uVar12;
            fVar252 = auVar42._0_4_;
            fVar258 = auVar42._4_4_;
            auVar111._4_4_ = fVar328 * fVar258;
            auVar111._0_4_ = fVar317 * fVar252;
            fVar281 = auVar42._8_4_;
            auVar111._8_4_ = fVar316 * fVar281;
            fVar299 = auVar42._12_4_;
            auVar111._12_4_ = fVar228 * fVar299;
            fVar371 = auVar42._16_4_;
            auVar111._16_4_ = fVar230 * fVar371;
            fVar185 = auVar42._20_4_;
            auVar111._20_4_ = fVar232 * fVar185;
            fVar212 = auVar42._24_4_;
            auVar111._24_4_ = fVar160 * fVar212;
            auVar111._28_4_ = auVar398._28_4_;
            auVar46 = vsubps_avx(auVar111,auVar110);
            auVar112._4_4_ = fVar253 * fVar258;
            auVar112._0_4_ = fVar250 * fVar252;
            auVar112._8_4_ = fVar279 * fVar281;
            auVar112._12_4_ = fVar297 * fVar299;
            auVar112._16_4_ = fVar313 * fVar371;
            auVar112._20_4_ = fVar314 * fVar185;
            auVar112._24_4_ = fVar282 * fVar212;
            auVar112._28_4_ = uVar12;
            auVar113._4_4_ = fVar255 * fVar211;
            auVar113._0_4_ = fVar249 * fVar235;
            auVar113._8_4_ = fVar280 * fVar277;
            auVar113._12_4_ = fVar298 * fVar295;
            auVar113._16_4_ = fVar256 * fVar352;
            auVar113._20_4_ = fVar181 * fVar214;
            auVar113._24_4_ = fVar210 * fVar209;
            auVar113._28_4_ = auVar165._28_4_;
            auVar165 = vsubps_avx(auVar113,auVar112);
            auVar345 = vsubps_avx(auVar345,auVar41);
            fVar257 = auVar165._28_4_ + auVar46._28_4_;
            auVar360._0_4_ = auVar165._0_4_ + auVar46._0_4_ * 0.0 + auVar43._0_4_ * 0.0;
            auVar360._4_4_ = auVar165._4_4_ + auVar46._4_4_ * 0.0 + auVar43._4_4_ * 0.0;
            auVar360._8_4_ = auVar165._8_4_ + auVar46._8_4_ * 0.0 + auVar43._8_4_ * 0.0;
            auVar360._12_4_ = auVar165._12_4_ + auVar46._12_4_ * 0.0 + auVar43._12_4_ * 0.0;
            auVar360._16_4_ = auVar165._16_4_ + auVar46._16_4_ * 0.0 + auVar43._16_4_ * 0.0;
            auVar360._20_4_ = auVar165._20_4_ + auVar46._20_4_ * 0.0 + auVar43._20_4_ * 0.0;
            auVar360._24_4_ = auVar165._24_4_ + auVar46._24_4_ * 0.0 + auVar43._24_4_ * 0.0;
            auVar360._28_4_ = fVar257 + auVar43._28_4_;
            fVar234 = auVar193._0_4_;
            fVar260 = auVar193._4_4_;
            auVar114._4_4_ = auVar41._4_4_ * fVar260;
            auVar114._0_4_ = auVar41._0_4_ * fVar234;
            fVar283 = auVar193._8_4_;
            auVar114._8_4_ = auVar41._8_4_ * fVar283;
            fVar338 = auVar193._12_4_;
            auVar114._12_4_ = auVar41._12_4_ * fVar338;
            fVar368 = auVar193._16_4_;
            auVar114._16_4_ = auVar41._16_4_ * fVar368;
            fVar187 = auVar193._20_4_;
            auVar114._20_4_ = auVar41._20_4_ * fVar187;
            fVar215 = auVar193._24_4_;
            auVar114._24_4_ = auVar41._24_4_ * fVar215;
            auVar114._28_4_ = fVar257;
            fVar257 = auVar345._0_4_;
            fVar272 = auVar345._4_4_;
            auVar115._4_4_ = auVar40._4_4_ * fVar272;
            auVar115._0_4_ = auVar40._0_4_ * fVar257;
            fVar291 = auVar345._8_4_;
            auVar115._8_4_ = auVar40._8_4_ * fVar291;
            fVar254 = auVar345._12_4_;
            auVar115._12_4_ = auVar40._12_4_ * fVar254;
            fVar370 = auVar345._16_4_;
            auVar115._16_4_ = auVar40._16_4_ * fVar370;
            fVar205 = auVar345._20_4_;
            auVar115._20_4_ = auVar40._20_4_ * fVar205;
            fVar417 = auVar345._24_4_;
            auVar115._24_4_ = auVar40._24_4_ * fVar417;
            auVar115._28_4_ = auVar165._28_4_;
            auVar46 = vsubps_avx(auVar115,auVar114);
            auVar164 = vsubps_avx(auVar164,auVar172);
            fVar251 = auVar164._0_4_;
            fVar275 = auVar164._4_4_;
            auVar116._4_4_ = auVar41._4_4_ * fVar275;
            auVar116._0_4_ = auVar41._0_4_ * fVar251;
            fVar293 = auVar164._8_4_;
            auVar116._8_4_ = auVar41._8_4_ * fVar293;
            fVar369 = auVar164._12_4_;
            auVar116._12_4_ = auVar41._12_4_ * fVar369;
            fVar259 = auVar164._16_4_;
            auVar116._16_4_ = auVar41._16_4_ * fVar259;
            fVar207 = auVar164._20_4_;
            auVar116._20_4_ = auVar41._20_4_ * fVar207;
            fVar422 = auVar164._24_4_;
            auVar116._24_4_ = auVar41._24_4_ * fVar422;
            auVar116._28_4_ = auVar41._28_4_;
            auVar117._4_4_ = fVar272 * auVar172._4_4_;
            auVar117._0_4_ = fVar257 * auVar172._0_4_;
            auVar117._8_4_ = fVar291 * auVar172._8_4_;
            auVar117._12_4_ = fVar254 * auVar172._12_4_;
            auVar117._16_4_ = fVar370 * auVar172._16_4_;
            auVar117._20_4_ = fVar205 * auVar172._20_4_;
            auVar117._24_4_ = fVar417 * auVar172._24_4_;
            auVar117._28_4_ = auVar43._28_4_;
            auVar164 = vsubps_avx(auVar116,auVar117);
            auVar118._4_4_ = auVar40._4_4_ * fVar275;
            auVar118._0_4_ = auVar40._0_4_ * fVar251;
            auVar118._8_4_ = auVar40._8_4_ * fVar293;
            auVar118._12_4_ = auVar40._12_4_ * fVar369;
            auVar118._16_4_ = auVar40._16_4_ * fVar259;
            auVar118._20_4_ = auVar40._20_4_ * fVar207;
            auVar118._24_4_ = auVar40._24_4_ * fVar422;
            auVar118._28_4_ = auVar40._28_4_;
            auVar119._4_4_ = fVar260 * auVar172._4_4_;
            auVar119._0_4_ = fVar234 * auVar172._0_4_;
            auVar119._8_4_ = fVar283 * auVar172._8_4_;
            auVar119._12_4_ = fVar338 * auVar172._12_4_;
            auVar119._16_4_ = fVar368 * auVar172._16_4_;
            auVar119._20_4_ = fVar187 * auVar172._20_4_;
            auVar119._24_4_ = fVar215 * auVar172._24_4_;
            auVar119._28_4_ = auVar172._28_4_;
            auVar172 = vsubps_avx(auVar119,auVar118);
            auVar176._0_4_ = auVar46._0_4_ * 0.0 + auVar172._0_4_ + auVar164._0_4_ * 0.0;
            auVar176._4_4_ = auVar46._4_4_ * 0.0 + auVar172._4_4_ + auVar164._4_4_ * 0.0;
            auVar176._8_4_ = auVar46._8_4_ * 0.0 + auVar172._8_4_ + auVar164._8_4_ * 0.0;
            auVar176._12_4_ = auVar46._12_4_ * 0.0 + auVar172._12_4_ + auVar164._12_4_ * 0.0;
            auVar176._16_4_ = auVar46._16_4_ * 0.0 + auVar172._16_4_ + auVar164._16_4_ * 0.0;
            auVar176._20_4_ = auVar46._20_4_ * 0.0 + auVar172._20_4_ + auVar164._20_4_ * 0.0;
            auVar176._24_4_ = auVar46._24_4_ * 0.0 + auVar172._24_4_ + auVar164._24_4_ * 0.0;
            auVar176._28_4_ = auVar164._28_4_ + auVar172._28_4_ + auVar164._28_4_;
            auVar180 = ZEXT3264(auVar176);
            auVar164 = vmaxps_avx(auVar360,auVar176);
            auVar164 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,2);
            auVar172 = local_700 & auVar164;
            auVar127 = auVar178;
            if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar172 >> 0x7f,0) == '\0') &&
                  (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar172 >> 0xbf,0) == '\0') &&
                (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar172[0x1f]) {
LAB_01153c9d:
              auVar309 = ZEXT3264(auVar127);
              auVar248 = ZEXT3264(CONCAT824(uStack_548,
                                            CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
              auVar361._4_4_ = fVar182;
              auVar361._0_4_ = fVar161;
              auVar361._8_4_ = fStack_818;
              auVar361._12_4_ = fStack_814;
              auVar361._16_4_ = fStack_810;
              auVar361._20_4_ = fStack_80c;
              auVar361._24_4_ = fStack_808;
              auVar361._28_4_ = fStack_804;
            }
            else {
              auVar172 = vandps_avx(auVar164,local_700);
              auVar120._4_4_ = fVar272 * fVar211;
              auVar120._0_4_ = fVar257 * fVar235;
              auVar120._8_4_ = fVar291 * fVar277;
              auVar120._12_4_ = fVar254 * fVar295;
              auVar120._16_4_ = fVar370 * fVar352;
              auVar120._20_4_ = fVar205 * fVar214;
              auVar120._24_4_ = fVar417 * fVar209;
              auVar120._28_4_ = local_700._28_4_;
              auVar121._4_4_ = fVar260 * fVar183;
              auVar121._0_4_ = fVar234 * fVar301;
              auVar121._8_4_ = fVar283 * fVar184;
              auVar121._12_4_ = fVar338 * fVar186;
              auVar121._16_4_ = fVar368 * fVar204;
              auVar121._20_4_ = fVar187 * fVar206;
              auVar121._24_4_ = fVar215 * fVar208;
              auVar121._28_4_ = auVar164._28_4_;
              auVar40 = vsubps_avx(auVar121,auVar120);
              auVar122._4_4_ = fVar275 * fVar183;
              auVar122._0_4_ = fVar251 * fVar301;
              auVar122._8_4_ = fVar293 * fVar184;
              auVar122._12_4_ = fVar369 * fVar186;
              auVar122._16_4_ = fVar259 * fVar204;
              auVar122._20_4_ = fVar207 * fVar206;
              auVar122._24_4_ = fVar422 * fVar208;
              auVar122._28_4_ = auVar44._28_4_;
              auVar123._4_4_ = fVar272 * fVar258;
              auVar123._0_4_ = fVar257 * fVar252;
              auVar123._8_4_ = fVar291 * fVar281;
              auVar123._12_4_ = fVar254 * fVar299;
              auVar123._16_4_ = fVar370 * fVar371;
              auVar123._20_4_ = fVar205 * fVar185;
              auVar123._24_4_ = fVar417 * fVar212;
              auVar123._28_4_ = auVar345._28_4_;
              auVar41 = vsubps_avx(auVar123,auVar122);
              auVar124._4_4_ = fVar260 * fVar258;
              auVar124._0_4_ = fVar234 * fVar252;
              auVar124._8_4_ = fVar283 * fVar281;
              auVar124._12_4_ = fVar338 * fVar299;
              auVar124._16_4_ = fVar368 * fVar371;
              auVar124._20_4_ = fVar187 * fVar185;
              auVar124._24_4_ = fVar215 * fVar212;
              auVar124._28_4_ = auVar42._28_4_;
              auVar125._4_4_ = fVar275 * fVar211;
              auVar125._0_4_ = fVar251 * fVar235;
              auVar125._8_4_ = fVar293 * fVar277;
              auVar125._12_4_ = fVar369 * fVar295;
              auVar125._16_4_ = fVar259 * fVar352;
              auVar125._20_4_ = fVar207 * fVar214;
              auVar125._24_4_ = fVar422 * fVar209;
              auVar125._28_4_ = auVar166._28_4_;
              auVar43 = vsubps_avx(auVar125,auVar124);
              auVar337._0_4_ = auVar40._0_4_ * 0.0 + auVar43._0_4_ + auVar41._0_4_ * 0.0;
              auVar337._4_4_ = auVar40._4_4_ * 0.0 + auVar43._4_4_ + auVar41._4_4_ * 0.0;
              auVar337._8_4_ = auVar40._8_4_ * 0.0 + auVar43._8_4_ + auVar41._8_4_ * 0.0;
              auVar337._12_4_ = auVar40._12_4_ * 0.0 + auVar43._12_4_ + auVar41._12_4_ * 0.0;
              auVar337._16_4_ = auVar40._16_4_ * 0.0 + auVar43._16_4_ + auVar41._16_4_ * 0.0;
              auVar337._20_4_ = auVar40._20_4_ * 0.0 + auVar43._20_4_ + auVar41._20_4_ * 0.0;
              auVar337._24_4_ = auVar40._24_4_ * 0.0 + auVar43._24_4_ + auVar41._24_4_ * 0.0;
              auVar337._28_4_ = auVar193._28_4_ + auVar43._28_4_ + auVar42._28_4_;
              auVar164 = vrcpps_avx(auVar337);
              fVar235 = auVar164._0_4_;
              fVar252 = auVar164._4_4_;
              auVar126._4_4_ = auVar337._4_4_ * fVar252;
              auVar126._0_4_ = auVar337._0_4_ * fVar235;
              fVar234 = auVar164._8_4_;
              auVar126._8_4_ = auVar337._8_4_ * fVar234;
              fVar257 = auVar164._12_4_;
              auVar126._12_4_ = auVar337._12_4_ * fVar257;
              fVar251 = auVar164._16_4_;
              auVar126._16_4_ = auVar337._16_4_ * fVar251;
              fVar211 = auVar164._20_4_;
              auVar126._20_4_ = auVar337._20_4_ * fVar211;
              fVar258 = auVar164._24_4_;
              auVar126._24_4_ = auVar337._24_4_ * fVar258;
              auVar126._28_4_ = auVar345._28_4_;
              auVar392._8_4_ = 0x3f800000;
              auVar392._0_8_ = 0x3f8000003f800000;
              auVar392._12_4_ = 0x3f800000;
              auVar392._16_4_ = 0x3f800000;
              auVar392._20_4_ = 0x3f800000;
              auVar392._24_4_ = 0x3f800000;
              auVar392._28_4_ = 0x3f800000;
              auVar164 = vsubps_avx(auVar392,auVar126);
              fVar235 = auVar164._0_4_ * fVar235 + fVar235;
              fVar252 = auVar164._4_4_ * fVar252 + fVar252;
              fVar234 = auVar164._8_4_ * fVar234 + fVar234;
              fVar257 = auVar164._12_4_ * fVar257 + fVar257;
              fVar251 = auVar164._16_4_ * fVar251 + fVar251;
              fVar211 = auVar164._20_4_ * fVar211 + fVar211;
              fVar258 = auVar164._24_4_ * fVar258 + fVar258;
              fVar250 = auVar41._0_4_ * fVar250;
              fVar253 = auVar41._4_4_ * fVar253;
              auVar127._4_4_ = fVar253;
              auVar127._0_4_ = fVar250;
              fVar279 = auVar41._8_4_ * fVar279;
              auVar127._8_4_ = fVar279;
              fVar297 = auVar41._12_4_ * fVar297;
              auVar127._12_4_ = fVar297;
              fVar313 = auVar41._16_4_ * fVar313;
              auVar127._16_4_ = fVar313;
              fVar314 = auVar41._20_4_ * fVar314;
              auVar127._20_4_ = fVar314;
              fVar282 = auVar41._24_4_ * fVar282;
              auVar127._24_4_ = fVar282;
              auVar127._28_4_ = auVar178._28_4_;
              auVar128._4_4_ =
                   (fVar255 * auVar40._4_4_ + fVar253 + fVar328 * auVar43._4_4_) * fVar252;
              auVar128._0_4_ =
                   (fVar249 * auVar40._0_4_ + fVar250 + fVar317 * auVar43._0_4_) * fVar235;
              auVar128._8_4_ =
                   (fVar280 * auVar40._8_4_ + fVar279 + fVar316 * auVar43._8_4_) * fVar234;
              auVar128._12_4_ =
                   (fVar298 * auVar40._12_4_ + fVar297 + fVar228 * auVar43._12_4_) * fVar257;
              auVar128._16_4_ =
                   (fVar256 * auVar40._16_4_ + fVar313 + fVar230 * auVar43._16_4_) * fVar251;
              auVar128._20_4_ =
                   (fVar181 * auVar40._20_4_ + fVar314 + fVar232 * auVar43._20_4_) * fVar211;
              auVar128._24_4_ =
                   (fVar210 * auVar40._24_4_ + fVar282 + fVar160 * auVar43._24_4_) * fVar258;
              auVar128._28_4_ = auVar178._28_4_ + auVar43._28_4_;
              uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar247._4_4_ = uVar12;
              auVar247._0_4_ = uVar12;
              auVar247._8_4_ = uVar12;
              auVar247._12_4_ = uVar12;
              auVar247._16_4_ = uVar12;
              auVar247._20_4_ = uVar12;
              auVar247._24_4_ = uVar12;
              auVar247._28_4_ = uVar12;
              auVar178 = vcmpps_avx(local_360,auVar128,2);
              auVar164 = vcmpps_avx(auVar128,auVar247,2);
              auVar164 = vandps_avx(auVar178,auVar164);
              auVar345 = auVar172 & auVar164;
              if ((((((((auVar345 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar345 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar345 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar345 >> 0x7f,0) == '\0') &&
                    (auVar345 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar345 >> 0xbf,0) == '\0') &&
                  (auVar345 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar345[0x1f]) goto LAB_01153c9d;
              auVar164 = vandps_avx(auVar172,auVar164);
              auVar309 = ZEXT3264(auVar164);
              auVar345 = vcmpps_avx(auVar337,ZEXT832(0) << 0x20,4);
              auVar172 = auVar164 & auVar345;
              auVar248 = ZEXT3264(CONCAT824(uStack_548,
                                            CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
              auVar361._4_4_ = fVar182;
              auVar361._0_4_ = fVar161;
              auVar361._8_4_ = fStack_818;
              auVar361._12_4_ = fStack_814;
              auVar361._16_4_ = fStack_810;
              auVar361._20_4_ = fStack_80c;
              auVar361._24_4_ = fStack_808;
              auVar361._28_4_ = fStack_804;
              if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar172 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar172 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar172 >> 0x7f,0) != '\0') ||
                    (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar172 >> 0xbf,0) != '\0') ||
                  (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar172[0x1f] < '\0') {
                auVar164 = vandps_avx(auVar345,auVar164);
                auVar248 = ZEXT3264(auVar164);
                auVar129._4_4_ = auVar360._4_4_ * fVar252;
                auVar129._0_4_ = auVar360._0_4_ * fVar235;
                auVar129._8_4_ = auVar360._8_4_ * fVar234;
                auVar129._12_4_ = auVar360._12_4_ * fVar257;
                auVar129._16_4_ = auVar360._16_4_ * fVar251;
                auVar129._20_4_ = auVar360._20_4_ * fVar211;
                auVar129._24_4_ = auVar360._24_4_ * fVar258;
                auVar129._28_4_ = auVar178._28_4_;
                auVar130._4_4_ = auVar176._4_4_ * fVar252;
                auVar130._0_4_ = auVar176._0_4_ * fVar235;
                auVar130._8_4_ = auVar176._8_4_ * fVar234;
                auVar130._12_4_ = auVar176._12_4_ * fVar257;
                auVar130._16_4_ = auVar176._16_4_ * fVar251;
                auVar130._20_4_ = auVar176._20_4_ * fVar211;
                auVar130._24_4_ = auVar176._24_4_ * fVar258;
                auVar130._28_4_ = auVar176._28_4_;
                auVar308._8_4_ = 0x3f800000;
                auVar308._0_8_ = 0x3f8000003f800000;
                auVar308._12_4_ = 0x3f800000;
                auVar308._16_4_ = 0x3f800000;
                auVar308._20_4_ = 0x3f800000;
                auVar308._24_4_ = 0x3f800000;
                auVar308._28_4_ = 0x3f800000;
                auVar309 = ZEXT3264(auVar308);
                auVar164 = vsubps_avx(auVar308,auVar129);
                local_3a0 = vblendvps_avx(auVar164,auVar129,auVar39);
                auVar164 = vsubps_avx(auVar308,auVar130);
                _local_3c0 = vblendvps_avx(auVar164,auVar130,auVar39);
                auVar180 = ZEXT3264(_local_3c0);
                local_500 = auVar128;
              }
            }
            auVar164 = auVar248._0_32_;
            if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar164 >> 0x7f,0) != '\0') ||
                  (auVar248 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar164 >> 0xbf,0) != '\0') ||
                (auVar248 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar248[0x1f] < '\0') {
              auVar178 = vsubps_avx(auVar325,auVar361);
              fVar250 = auVar361._0_4_ + local_3a0._0_4_ * auVar178._0_4_;
              fVar249 = auVar361._4_4_ + local_3a0._4_4_ * auVar178._4_4_;
              fVar252 = auVar361._8_4_ + local_3a0._8_4_ * auVar178._8_4_;
              fVar234 = auVar361._12_4_ + local_3a0._12_4_ * auVar178._12_4_;
              fVar257 = auVar361._16_4_ + local_3a0._16_4_ * auVar178._16_4_;
              fVar251 = auVar361._20_4_ + local_3a0._20_4_ * auVar178._20_4_;
              fVar211 = auVar361._24_4_ + local_3a0._24_4_ * auVar178._24_4_;
              fVar253 = auVar361._28_4_ + auVar178._28_4_;
              fVar235 = *(float *)((long)local_828->ray_space + k * 4 + -0x10);
              auVar131._4_4_ = (fVar249 + fVar249) * fVar235;
              auVar131._0_4_ = (fVar250 + fVar250) * fVar235;
              auVar131._8_4_ = (fVar252 + fVar252) * fVar235;
              auVar131._12_4_ = (fVar234 + fVar234) * fVar235;
              auVar131._16_4_ = (fVar257 + fVar257) * fVar235;
              auVar131._20_4_ = (fVar251 + fVar251) * fVar235;
              auVar131._24_4_ = (fVar211 + fVar211) * fVar235;
              auVar131._28_4_ = fVar253 + fVar253;
              auVar178 = vcmpps_avx(local_500,auVar131,6);
              auVar180 = ZEXT3264(auVar178);
              auVar345 = auVar164 & auVar178;
              if ((((((((auVar345 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar345 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar345 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar345 >> 0x7f,0) != '\0') ||
                    (auVar345 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar345 >> 0xbf,0) != '\0') ||
                  (auVar345 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar345[0x1f] < '\0') {
                local_3c0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
                local_3c0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
                uStack_3b8._0_4_ = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
                uStack_3b8._4_4_ = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
                uStack_3b0._0_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
                uStack_3b0._4_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
                uStack_3a8._0_4_ = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
                uStack_3a8._4_4_ = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
                local_2a0 = local_3a0;
                auVar149 = _local_3c0;
                auVar345 = _local_3c0;
                local_280 = (float)local_3c0._0_4_;
                fStack_27c = (float)local_3c0._4_4_;
                fStack_278 = (float)uStack_3b8;
                fStack_274 = uStack_3b8._4_4_;
                fStack_270 = (float)uStack_3b0;
                fStack_26c = uStack_3b0._4_4_;
                fStack_268 = (float)uStack_3a8;
                fStack_264 = uStack_3a8._4_4_;
                local_260 = local_500;
                local_23c = uVar34;
                local_230 = auVar264._0_8_;
                uStack_228 = uStack_848;
                local_220 = local_7a0;
                uStack_218 = uStack_798;
                local_210 = local_7b0;
                uStack_208 = uStack_7a8;
                local_200 = local_7c0;
                uStack_1f8 = uStack_7b8;
                pGVar158 = (context->scene->geometries).items[uVar153].ptr;
                _local_3c0 = auVar345;
                if ((pGVar158->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_5a0 = vandps_avx(auVar178,auVar164);
                  auVar286 = vshufps_avx(ZEXT416((uint)(float)(int)local_240),
                                         ZEXT416((uint)(float)(int)local_240),0);
                  local_1c0[0] = (auVar286._0_4_ + local_3a0._0_4_ + 0.0) * (float)local_100._0_4_;
                  local_1c0[1] = (auVar286._4_4_ + local_3a0._4_4_ + 1.0) * (float)local_100._4_4_;
                  local_1c0[2] = (auVar286._8_4_ + local_3a0._8_4_ + 2.0) * fStack_f8;
                  local_1c0[3] = (auVar286._12_4_ + local_3a0._12_4_ + 3.0) * fStack_f4;
                  fStack_1b0 = (auVar286._0_4_ + local_3a0._16_4_ + 4.0) * fStack_f0;
                  fStack_1ac = (auVar286._4_4_ + local_3a0._20_4_ + 5.0) * fStack_ec;
                  fStack_1a8 = (auVar286._8_4_ + local_3a0._24_4_ + 6.0) * fStack_e8;
                  fStack_1a4 = auVar286._12_4_ + local_3a0._28_4_ + 7.0;
                  uStack_3b0 = auVar149._16_8_;
                  uStack_3a8 = auVar345._24_8_;
                  local_1a0 = local_3c0;
                  uStack_198 = uStack_3b8;
                  uStack_190 = uStack_3b0;
                  uStack_188 = uStack_3a8;
                  local_180 = local_500;
                  auVar201._8_4_ = 0x7f800000;
                  auVar201._0_8_ = 0x7f8000007f800000;
                  auVar201._12_4_ = 0x7f800000;
                  auVar201._16_4_ = 0x7f800000;
                  auVar201._20_4_ = 0x7f800000;
                  auVar201._24_4_ = 0x7f800000;
                  auVar201._28_4_ = 0x7f800000;
                  auVar164 = vblendvps_avx(auVar201,local_500,local_5a0);
                  auVar178 = vshufps_avx(auVar164,auVar164,0xb1);
                  auVar178 = vminps_avx(auVar164,auVar178);
                  auVar345 = vshufpd_avx(auVar178,auVar178,5);
                  auVar178 = vminps_avx(auVar178,auVar345);
                  auVar345 = vperm2f128_avx(auVar178,auVar178,1);
                  auVar178 = vminps_avx(auVar178,auVar345);
                  auVar178 = vcmpps_avx(auVar164,auVar178,0);
                  auVar345 = local_5a0 & auVar178;
                  auVar164 = local_5a0;
                  if ((((((((auVar345 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar345 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar345 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar345 >> 0x7f,0) != '\0') ||
                        (auVar345 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar345 >> 0xbf,0) != '\0') ||
                      (auVar345 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar345[0x1f] < '\0') {
                    auVar164 = vandps_avx(auVar178,local_5a0);
                  }
                  uVar151 = vmovmskps_avx(auVar164);
                  uVar38 = 0;
                  if (uVar151 != 0) {
                    for (; (uVar151 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar152 = (ulong)uVar38;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar158->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar235 = local_1c0[uVar152];
                    auVar180 = ZEXT464((uint)fVar235);
                    uVar12 = *(undefined4 *)((long)&local_1a0 + uVar152 * 4);
                    fVar249 = 1.0 - fVar235;
                    fVar250 = fVar235 * fVar249 * 4.0;
                    auVar309 = ZEXT464(0x3f000000);
                    auVar286 = ZEXT416((uint)(fVar235 * fVar235 * 0.5));
                    auVar286 = vshufps_avx(auVar286,auVar286,0);
                    auVar220 = ZEXT416((uint)((fVar249 * fVar249 + fVar250) * 0.5));
                    auVar220 = vshufps_avx(auVar220,auVar220,0);
                    auVar266 = ZEXT416((uint)((-fVar235 * fVar235 - fVar250) * 0.5));
                    auVar266 = vshufps_avx(auVar266,auVar266,0);
                    auVar238 = ZEXT416((uint)(fVar249 * -fVar249 * 0.5));
                    auVar238 = vshufps_avx(auVar238,auVar238,0);
                    auVar221._0_4_ =
                         auVar238._0_4_ * fVar261 +
                         auVar266._0_4_ * (float)local_7a0._0_4_ +
                         auVar286._0_4_ * (float)local_7c0._0_4_ +
                         auVar220._0_4_ * (float)local_7b0._0_4_;
                    auVar221._4_4_ =
                         auVar238._4_4_ * fVar273 +
                         auVar266._4_4_ * (float)local_7a0._4_4_ +
                         auVar286._4_4_ * (float)local_7c0._4_4_ +
                         auVar220._4_4_ * (float)local_7b0._4_4_;
                    auVar221._8_4_ =
                         auVar238._8_4_ * auVar264._8_4_ +
                         auVar266._8_4_ * (float)uStack_798 +
                         auVar286._8_4_ * (float)uStack_7b8 + auVar220._8_4_ * (float)uStack_7a8;
                    auVar221._12_4_ =
                         auVar238._12_4_ * auVar264._12_4_ +
                         auVar266._12_4_ * uStack_798._4_4_ +
                         auVar286._12_4_ * uStack_7b8._4_4_ + auVar220._12_4_ * uStack_7a8._4_4_;
                    auVar248 = ZEXT464(*(uint *)(local_180 + uVar152 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_180 + uVar152 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar221._0_4_;
                    uVar35 = vextractps_avx(auVar221,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar35;
                    uVar35 = vextractps_avx(auVar221,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar35;
                    *(float *)(ray + k * 4 + 0xf0) = fVar235;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar12;
                    *(uint *)(ray + k * 4 + 0x110) = uVar33;
                    *(uint *)(ray + k * 4 + 0x120) = uVar153;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_700._0_16_ = *local_728;
                    _auStack_870 = auVar325._16_16_;
                    _local_880 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    auVar327 = ZEXT3264(local_500);
                    stack0xfffffffffffff8a8 = auVar408._8_24_;
                    local_760._0_8_ = pGVar158;
                    auVar326 = ZEXT1664(ZEXT816(0) << 0x40);
                    _local_4e0 = auVar246;
                    while( true ) {
                      local_420 = local_1c0[uVar152];
                      local_410 = *(undefined4 *)((long)&local_1a0 + uVar152 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar152 * 4)
                      ;
                      fVar250 = 1.0 - local_420;
                      fVar235 = local_420 * fVar250 * 4.0;
                      auVar309 = ZEXT464(0x3f000000);
                      auVar286 = ZEXT416((uint)(local_420 * local_420 * 0.5));
                      auVar286 = vshufps_avx(auVar286,auVar286,0);
                      auVar220 = ZEXT416((uint)((fVar250 * fVar250 + fVar235) * 0.5));
                      auVar220 = vshufps_avx(auVar220,auVar220,0);
                      auVar266 = ZEXT416((uint)((-local_420 * local_420 - fVar235) * 0.5));
                      auVar266 = vshufps_avx(auVar266,auVar266,0);
                      local_790.context = context->user;
                      auVar238 = ZEXT416((uint)(fVar250 * -fVar250 * 0.5));
                      auVar238 = vshufps_avx(auVar238,auVar238,0);
                      auVar222._0_4_ =
                           auVar238._0_4_ * fVar261 +
                           auVar266._0_4_ * (float)local_7a0._0_4_ +
                           auVar286._0_4_ * (float)local_7c0._0_4_ +
                           auVar220._0_4_ * (float)local_7b0._0_4_;
                      auVar222._4_4_ =
                           auVar238._4_4_ * fVar273 +
                           auVar266._4_4_ * (float)local_7a0._4_4_ +
                           auVar286._4_4_ * (float)local_7c0._4_4_ +
                           auVar220._4_4_ * (float)local_7b0._4_4_;
                      auVar222._8_4_ =
                           auVar238._8_4_ * auVar264._8_4_ +
                           auVar266._8_4_ * (float)uStack_798 +
                           auVar286._8_4_ * (float)uStack_7b8 + auVar220._8_4_ * (float)uStack_7a8;
                      auVar222._12_4_ =
                           auVar238._12_4_ * auVar264._12_4_ +
                           auVar266._12_4_ * uStack_798._4_4_ +
                           auVar286._12_4_ * uStack_7b8._4_4_ + auVar220._12_4_ * uStack_7a8._4_4_;
                      auVar286 = vshufps_avx(auVar222,auVar222,0);
                      local_450[0] = (RTCHitN)auVar286[0];
                      local_450[1] = (RTCHitN)auVar286[1];
                      local_450[2] = (RTCHitN)auVar286[2];
                      local_450[3] = (RTCHitN)auVar286[3];
                      local_450[4] = (RTCHitN)auVar286[4];
                      local_450[5] = (RTCHitN)auVar286[5];
                      local_450[6] = (RTCHitN)auVar286[6];
                      local_450[7] = (RTCHitN)auVar286[7];
                      local_450[8] = (RTCHitN)auVar286[8];
                      local_450[9] = (RTCHitN)auVar286[9];
                      local_450[10] = (RTCHitN)auVar286[10];
                      local_450[0xb] = (RTCHitN)auVar286[0xb];
                      local_450[0xc] = (RTCHitN)auVar286[0xc];
                      local_450[0xd] = (RTCHitN)auVar286[0xd];
                      local_450[0xe] = (RTCHitN)auVar286[0xe];
                      local_450[0xf] = (RTCHitN)auVar286[0xf];
                      local_440 = vshufps_avx(auVar222,auVar222,0x55);
                      auVar248 = ZEXT1664(local_440);
                      local_430 = vshufps_avx(auVar222,auVar222,0xaa);
                      fStack_41c = local_420;
                      fStack_418 = local_420;
                      fStack_414 = local_420;
                      uStack_40c = local_410;
                      uStack_408 = local_410;
                      uStack_404 = local_410;
                      local_400 = local_2c0._0_8_;
                      uStack_3f8 = local_2c0._8_8_;
                      local_3f0 = local_2b0._0_8_;
                      uStack_3e8 = local_2b0._8_8_;
                      vcmpps_avx(auVar326._0_32_,auVar326._0_32_,0xf);
                      uStack_3dc = (local_790.context)->instID[0];
                      local_3e0 = uStack_3dc;
                      uStack_3d8 = uStack_3dc;
                      uStack_3d4 = uStack_3dc;
                      uStack_3d0 = (local_790.context)->instPrimID[0];
                      uStack_3cc = uStack_3d0;
                      uStack_3c8 = uStack_3d0;
                      uStack_3c4 = uStack_3d0;
                      local_840 = local_700._0_16_;
                      local_790.valid = (int *)local_840;
                      local_790.geometryUserPtr = pGVar158->userPtr;
                      local_790.hit = local_450;
                      local_790.N = 4;
                      local_820 = (uint)uVar152;
                      uStack_81c = 0;
                      local_790.ray = (RTCRayN *)ray;
                      if (pGVar158->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar248 = ZEXT1664(local_440);
                        auVar309 = ZEXT1664(auVar309._0_16_);
                        (*pGVar158->intersectionFilterN)(&local_790);
                        uVar152 = CONCAT44(uStack_81c,local_820);
                        auVar327 = ZEXT3264(local_500);
                        auVar326 = ZEXT1664(ZEXT816(0) << 0x40);
                        pGVar158 = (Geometry *)local_760._0_8_;
                      }
                      auVar286 = auVar248._0_16_;
                      if (local_840 == (undefined1  [16])0x0) {
                        auVar286 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar286 = auVar286 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var37 = context->args->filter;
                        if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar158->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar309 = ZEXT1664(auVar309._0_16_);
                          (*p_Var37)(&local_790);
                          uVar152 = CONCAT44(uStack_81c,local_820);
                          auVar327 = ZEXT3264(local_500);
                          auVar326 = ZEXT1664(ZEXT816(0) << 0x40);
                          pGVar158 = (Geometry *)local_760._0_8_;
                        }
                        auVar220 = vpcmpeqd_avx(local_840,_DAT_01f7aa10);
                        auVar266 = vpcmpeqd_avx(auVar286,auVar286);
                        auVar248 = ZEXT1664(auVar266);
                        auVar286 = auVar220 ^ auVar266;
                        if (local_840 != (undefined1  [16])0x0) {
                          auVar220 = auVar220 ^ auVar266;
                          auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])local_790.hit);
                          *(undefined1 (*) [16])(local_790.ray + 0xc0) = auVar266;
                          auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                              (local_790.hit + 0x10));
                          *(undefined1 (*) [16])(local_790.ray + 0xd0) = auVar266;
                          auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                              (local_790.hit + 0x20));
                          *(undefined1 (*) [16])(local_790.ray + 0xe0) = auVar266;
                          auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                              (local_790.hit + 0x30));
                          *(undefined1 (*) [16])(local_790.ray + 0xf0) = auVar266;
                          auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                              (local_790.hit + 0x40));
                          *(undefined1 (*) [16])(local_790.ray + 0x100) = auVar266;
                          auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                              (local_790.hit + 0x50));
                          *(undefined1 (*) [16])(local_790.ray + 0x110) = auVar266;
                          auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                              (local_790.hit + 0x60));
                          *(undefined1 (*) [16])(local_790.ray + 0x120) = auVar266;
                          auVar266 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                              (local_790.hit + 0x70));
                          *(undefined1 (*) [16])(local_790.ray + 0x130) = auVar266;
                          auVar220 = vmaskmovps_avx(auVar220,*(undefined1 (*) [16])
                                                              (local_790.hit + 0x80));
                          *(undefined1 (*) [16])(local_790.ray + 0x140) = auVar220;
                        }
                      }
                      auVar191._8_8_ = 0x100000001;
                      auVar191._0_8_ = 0x100000001;
                      if ((auVar191 & auVar286) == (undefined1  [16])0x0) {
                        *(int *)(ray + k * 4 + 0x80) = local_880._0_4_;
                        auVar286 = _local_880;
                      }
                      else {
                        auVar286 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      }
                      *(undefined4 *)(local_5a0 + uVar152 * 4) = 0;
                      _local_880 = auVar286;
                      auVar286 = vshufps_avx(auVar286,auVar286,0);
                      auVar177._16_16_ = auVar286;
                      auVar177._0_16_ = auVar286;
                      auVar178 = vcmpps_avx(auVar327._0_32_,auVar177,2);
                      auVar164 = vandps_avx(auVar178,local_5a0);
                      auVar180 = ZEXT3264(auVar164);
                      local_5a0 = local_5a0 & auVar178;
                      if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_5a0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_5a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_5a0 >> 0x7f,0) == '\0') &&
                            (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_5a0 >> 0xbf,0) == '\0') &&
                          (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_5a0[0x1f]) break;
                      auVar202._8_4_ = 0x7f800000;
                      auVar202._0_8_ = 0x7f8000007f800000;
                      auVar202._12_4_ = 0x7f800000;
                      auVar202._16_4_ = 0x7f800000;
                      auVar202._20_4_ = 0x7f800000;
                      auVar202._24_4_ = 0x7f800000;
                      auVar202._28_4_ = 0x7f800000;
                      auVar178 = vblendvps_avx(auVar202,auVar327._0_32_,auVar164);
                      auVar345 = vshufps_avx(auVar178,auVar178,0xb1);
                      auVar345 = vminps_avx(auVar178,auVar345);
                      auVar172 = vshufpd_avx(auVar345,auVar345,5);
                      auVar345 = vminps_avx(auVar345,auVar172);
                      auVar172 = vperm2f128_avx(auVar345,auVar345,1);
                      auVar345 = vminps_avx(auVar345,auVar172);
                      auVar345 = vcmpps_avx(auVar178,auVar345,0);
                      auVar172 = auVar164 & auVar345;
                      auVar178 = auVar164;
                      if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar172 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar172 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar172 >> 0x7f,0) != '\0') ||
                            (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar172 >> 0xbf,0) != '\0') ||
                          (auVar172 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar172[0x1f] < '\0') {
                        auVar178 = vandps_avx(auVar345,auVar164);
                      }
                      uVar151 = vmovmskps_avx(auVar178);
                      uVar38 = 0;
                      if (uVar151 != 0) {
                        for (; (uVar151 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                        }
                      }
                      uVar152 = (ulong)uVar38;
                      local_5a0 = auVar164;
                    }
                  }
                }
              }
            }
            fVar235 = (float)local_5c0._0_4_;
            fVar249 = (float)local_5c0._4_4_;
            fVar234 = fStack_5b8;
            fVar251 = fStack_5b4;
            fVar253 = fStack_5b0;
            fVar258 = fStack_5ac;
            fVar272 = fStack_5a8;
            fVar277 = (float)local_680._0_4_;
            fVar279 = (float)local_680._4_4_;
            fVar280 = fStack_678;
            fVar281 = fStack_674;
            fVar283 = fStack_670;
            fVar291 = fStack_66c;
            fVar293 = fStack_668;
            fVar316 = (float)local_7e0._0_4_;
            fVar228 = (float)local_7e0._4_4_;
            fVar230 = fStack_7d8;
            fVar232 = fStack_7d4;
            fVar255 = fStack_7d0;
            fVar260 = fStack_7cc;
            fVar275 = fStack_7c8;
          }
          lVar159 = lVar159 + 8;
          auVar326 = ZEXT3264(_local_640);
          fVar417 = (float)local_660._0_4_;
          fVar422 = (float)local_660._4_4_;
          fVar317 = fStack_658;
          fVar328 = fStack_654;
          fVar250 = fStack_650;
          fVar252 = fStack_64c;
          fVar257 = fStack_648;
          fVar211 = fStack_644;
        } while ((int)lVar159 < (int)uVar34);
      }
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar173._4_4_ = uVar12;
      auVar173._0_4_ = uVar12;
      auVar173._8_4_ = uVar12;
      auVar173._12_4_ = uVar12;
      auVar173._16_4_ = uVar12;
      auVar173._20_4_ = uVar12;
      auVar173._24_4_ = uVar12;
      auVar173._28_4_ = uVar12;
      auVar164 = vcmpps_avx(local_80,auVar173,2);
      uVar153 = vmovmskps_avx(auVar164);
      uVar150 = uVar150 & uVar150 + 0xff & uVar153;
    } while (uVar150 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }